

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# curveNi_mb_intersector.h
# Opt level: O2

void embree::avx::CurveNiMBIntersectorK<8,8>::
     intersect_h<embree::avx::SweepCurve1IntersectorK<embree::HermiteCurveT,8>,embree::avx::Intersect1KEpilog1<8,true>>
               (Precalculations *pre,RayHitK<8> *ray,size_t k,RayQueryContext *context,
               Primitive *prim)

{
  long lVar1;
  float *pfVar2;
  float *pfVar3;
  float *pfVar4;
  float *pfVar5;
  float *pfVar6;
  float *pfVar7;
  float *pfVar8;
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  Primitive PVar18;
  Geometry *pGVar19;
  __int_type_conflict _Var20;
  long lVar21;
  long lVar22;
  long lVar23;
  RTCFilterFunctionN p_Var24;
  RTCRayQueryContext *pRVar25;
  undefined1 auVar26 [32];
  undefined1 auVar27 [32];
  undefined1 auVar28 [32];
  undefined1 auVar29 [32];
  undefined1 auVar30 [32];
  undefined1 auVar31 [32];
  undefined1 auVar32 [16];
  float fVar33;
  float fVar34;
  float fVar35;
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  undefined1 auVar42 [32];
  undefined1 auVar43 [32];
  undefined1 auVar44 [32];
  undefined1 auVar45 [32];
  undefined1 auVar46 [32];
  undefined1 auVar47 [32];
  undefined1 auVar48 [32];
  undefined1 auVar49 [32];
  undefined1 auVar50 [32];
  undefined1 auVar51 [32];
  undefined1 auVar52 [32];
  undefined1 auVar53 [32];
  undefined1 auVar54 [32];
  undefined1 auVar55 [32];
  undefined1 auVar56 [32];
  undefined1 auVar57 [32];
  undefined1 auVar58 [32];
  undefined1 auVar59 [32];
  undefined1 auVar60 [32];
  undefined1 auVar61 [32];
  undefined1 auVar62 [32];
  undefined1 auVar63 [32];
  undefined1 auVar64 [32];
  undefined1 auVar65 [32];
  undefined1 auVar66 [32];
  undefined1 auVar67 [32];
  undefined1 auVar68 [32];
  undefined1 auVar69 [32];
  undefined1 auVar70 [32];
  undefined1 auVar71 [32];
  undefined1 auVar72 [32];
  undefined1 auVar73 [32];
  undefined1 auVar74 [32];
  undefined1 auVar75 [32];
  undefined1 auVar76 [32];
  undefined1 auVar77 [32];
  undefined1 auVar78 [32];
  undefined1 auVar79 [32];
  undefined1 auVar80 [32];
  undefined1 auVar81 [32];
  undefined1 auVar82 [32];
  undefined1 auVar83 [32];
  undefined1 auVar84 [32];
  undefined1 auVar85 [32];
  undefined1 auVar86 [32];
  undefined1 auVar87 [32];
  undefined1 auVar88 [32];
  undefined1 auVar89 [32];
  undefined1 auVar90 [32];
  undefined1 auVar91 [32];
  undefined1 auVar92 [32];
  undefined1 auVar93 [32];
  undefined1 auVar94 [32];
  undefined1 auVar95 [32];
  uint uVar96;
  ulong uVar97;
  ulong uVar98;
  ulong uVar99;
  uint uVar100;
  long lVar101;
  uint uVar102;
  long lVar103;
  undefined4 uVar104;
  undefined8 unaff_R13;
  uint uVar105;
  bool bVar106;
  float fVar107;
  float fVar140;
  float fVar142;
  __m128 a;
  undefined1 auVar113 [16];
  undefined1 auVar114 [16];
  float fVar109;
  undefined1 auVar115 [16];
  undefined1 auVar116 [16];
  undefined1 auVar117 [16];
  undefined1 auVar118 [16];
  undefined1 auVar119 [16];
  float fVar146;
  float fVar147;
  float fVar148;
  undefined1 auVar120 [32];
  undefined1 auVar110 [16];
  undefined1 auVar111 [16];
  undefined1 auVar112 [16];
  undefined1 auVar121 [32];
  undefined1 auVar122 [32];
  float fVar144;
  undefined1 auVar123 [32];
  float fVar108;
  undefined1 auVar124 [32];
  float fVar141;
  float fVar143;
  float fVar145;
  undefined1 auVar125 [32];
  undefined1 auVar126 [32];
  undefined1 auVar127 [32];
  undefined1 auVar128 [32];
  undefined1 auVar129 [32];
  undefined1 auVar130 [32];
  undefined1 auVar131 [32];
  undefined1 auVar132 [32];
  undefined1 auVar133 [32];
  undefined1 auVar134 [32];
  undefined1 auVar135 [32];
  undefined1 auVar136 [32];
  undefined1 auVar137 [32];
  undefined1 auVar138 [32];
  undefined1 auVar139 [32];
  undefined1 auVar150 [16];
  undefined1 auVar151 [16];
  undefined1 auVar152 [16];
  float fVar149;
  undefined1 auVar153 [16];
  undefined1 auVar154 [16];
  undefined1 auVar155 [16];
  undefined1 auVar156 [16];
  undefined1 auVar157 [16];
  undefined1 auVar158 [16];
  undefined1 auVar159 [16];
  undefined1 auVar160 [16];
  undefined1 auVar161 [16];
  undefined1 auVar162 [16];
  undefined1 auVar163 [16];
  float fVar178;
  float fVar179;
  undefined1 auVar164 [32];
  undefined1 auVar165 [32];
  undefined1 auVar166 [32];
  undefined1 auVar167 [32];
  float fVar180;
  undefined1 auVar168 [32];
  undefined1 auVar169 [32];
  undefined1 auVar170 [32];
  undefined1 auVar171 [32];
  undefined1 auVar172 [32];
  undefined1 auVar173 [32];
  undefined1 auVar174 [32];
  undefined1 auVar175 [32];
  undefined1 auVar176 [32];
  undefined1 auVar177 [32];
  undefined1 auVar182 [16];
  undefined1 auVar183 [16];
  undefined1 auVar184 [16];
  float fVar181;
  undefined1 auVar185 [16];
  undefined1 auVar186 [16];
  undefined1 auVar187 [16];
  float fVar201;
  float fVar204;
  float fVar208;
  float fVar210;
  float fVar212;
  undefined1 auVar189 [32];
  undefined1 auVar190 [32];
  undefined1 auVar191 [32];
  undefined1 auVar192 [32];
  float fVar206;
  undefined1 auVar193 [32];
  float fVar202;
  float fVar203;
  float fVar205;
  float fVar207;
  float fVar209;
  float fVar211;
  float fVar213;
  undefined1 auVar194 [32];
  undefined1 auVar195 [32];
  undefined1 auVar196 [32];
  undefined1 auVar188 [16];
  undefined1 auVar197 [32];
  undefined1 auVar198 [32];
  undefined1 auVar199 [32];
  undefined1 auVar200 [32];
  float fVar214;
  float fVar240;
  undefined1 auVar215 [16];
  undefined1 auVar216 [16];
  undefined1 auVar217 [16];
  undefined1 auVar218 [16];
  undefined1 auVar219 [16];
  undefined1 auVar220 [16];
  undefined1 auVar221 [16];
  undefined1 auVar222 [16];
  undefined1 auVar223 [16];
  undefined1 auVar224 [16];
  undefined1 auVar225 [16];
  undefined1 auVar226 [16];
  undefined1 auVar227 [16];
  undefined1 auVar228 [16];
  undefined1 auVar229 [16];
  undefined1 auVar230 [16];
  float fVar238;
  float fVar239;
  float fVar241;
  float fVar242;
  float fVar243;
  undefined1 auVar231 [32];
  float fVar244;
  undefined1 auVar232 [32];
  undefined1 auVar233 [32];
  undefined1 auVar234 [32];
  undefined1 auVar235 [32];
  undefined1 auVar236 [32];
  undefined1 auVar237 [32];
  float fVar245;
  float fVar267;
  undefined1 auVar246 [16];
  undefined1 auVar247 [16];
  undefined1 auVar248 [16];
  undefined1 auVar249 [16];
  undefined1 auVar250 [16];
  undefined1 auVar251 [16];
  undefined1 auVar252 [16];
  undefined1 auVar253 [16];
  undefined1 auVar254 [16];
  undefined1 auVar255 [16];
  undefined1 auVar256 [28];
  float fVar266;
  float fVar268;
  float fVar269;
  undefined1 auVar257 [32];
  undefined1 auVar258 [32];
  float fVar270;
  undefined1 auVar259 [32];
  float fVar271;
  undefined1 auVar260 [32];
  undefined1 auVar261 [32];
  undefined1 auVar262 [32];
  undefined1 auVar263 [32];
  undefined1 auVar264 [32];
  undefined1 auVar265 [32];
  float fVar272;
  undefined1 auVar273 [16];
  undefined1 auVar274 [16];
  undefined1 auVar275 [16];
  undefined1 auVar276 [16];
  undefined1 auVar277 [16];
  undefined1 auVar278 [28];
  float fVar290;
  float fVar292;
  float fVar296;
  float fVar298;
  undefined1 auVar279 [32];
  float fVar291;
  float fVar293;
  float fVar294;
  float fVar295;
  float fVar297;
  float fVar299;
  float fVar300;
  float fVar301;
  undefined1 auVar280 [32];
  float fVar302;
  undefined1 auVar281 [32];
  undefined1 auVar282 [32];
  undefined1 auVar283 [32];
  undefined1 auVar284 [32];
  undefined1 auVar285 [32];
  undefined1 auVar286 [32];
  undefined1 auVar287 [32];
  undefined1 auVar288 [32];
  undefined1 auVar289 [32];
  float fVar303;
  float fVar317;
  float fVar320;
  undefined1 auVar306 [16];
  float fVar304;
  float fVar305;
  undefined1 auVar307 [16];
  undefined1 auVar308 [16];
  undefined1 auVar309 [16];
  undefined1 auVar310 [28];
  float fVar326;
  float fVar329;
  undefined1 auVar311 [32];
  float fVar318;
  float fVar321;
  float fVar323;
  float fVar324;
  float fVar327;
  float fVar330;
  float fVar332;
  float fVar333;
  float fVar335;
  undefined1 auVar312 [32];
  float fVar319;
  float fVar322;
  float fVar325;
  float fVar328;
  float fVar331;
  float fVar334;
  undefined1 auVar313 [32];
  undefined1 auVar314 [32];
  undefined1 auVar315 [32];
  undefined1 auVar316 [64];
  undefined1 auVar336 [16];
  undefined1 auVar337 [32];
  undefined1 auVar338 [32];
  undefined1 auVar339 [32];
  undefined1 auVar340 [32];
  undefined1 auVar341 [32];
  undefined1 auVar342 [32];
  undefined1 auVar343 [32];
  undefined1 auVar344 [64];
  undefined1 auVar345 [16];
  float fVar355;
  float fVar356;
  undefined1 auVar346 [32];
  undefined1 auVar347 [32];
  undefined1 auVar348 [32];
  undefined1 auVar349 [32];
  undefined1 auVar350 [32];
  undefined1 auVar351 [32];
  undefined1 auVar352 [32];
  undefined1 auVar353 [32];
  undefined1 auVar354 [32];
  undefined1 auVar357 [16];
  undefined1 auVar358 [32];
  undefined1 auVar359 [32];
  undefined1 auVar360 [32];
  undefined1 auVar361 [32];
  undefined1 auVar362 [32];
  undefined1 auVar363 [32];
  float fVar364;
  float fVar374;
  float fVar375;
  float fVar376;
  float fVar377;
  float fVar378;
  float fVar379;
  undefined1 auVar365 [32];
  undefined1 auVar366 [32];
  undefined1 auVar367 [32];
  undefined1 auVar368 [32];
  undefined1 auVar369 [32];
  undefined1 auVar370 [32];
  undefined1 auVar371 [32];
  undefined1 auVar372 [32];
  undefined1 auVar373 [64];
  float fVar380;
  float fVar388;
  float fVar389;
  float fVar390;
  float fVar392;
  float fVar393;
  float fVar394;
  undefined1 auVar381 [32];
  undefined1 auVar382 [32];
  undefined1 auVar383 [32];
  undefined1 auVar384 [32];
  float fVar391;
  undefined1 auVar385 [32];
  undefined1 auVar386 [32];
  undefined1 auVar387 [32];
  undefined1 auVar396 [16];
  float fVar395;
  float fVar406;
  float fVar407;
  float fVar409;
  float fVar410;
  float fVar411;
  undefined1 auVar397 [32];
  undefined1 auVar398 [32];
  undefined1 auVar399 [32];
  undefined1 auVar400 [32];
  undefined1 auVar401 [32];
  float fVar408;
  float fVar412;
  undefined1 auVar402 [32];
  undefined1 auVar403 [32];
  undefined1 auVar404 [32];
  undefined1 auVar405 [64];
  undefined1 auVar415 [16];
  float fVar413;
  float fVar414;
  float fVar420;
  float fVar422;
  float fVar426;
  float fVar428;
  float fVar430;
  undefined1 auVar416 [32];
  undefined1 auVar417 [32];
  undefined1 auVar418 [32];
  float fVar421;
  float fVar423;
  float fVar424;
  float fVar425;
  float fVar427;
  float fVar429;
  float fVar431;
  float fVar432;
  undefined1 auVar419 [32];
  undefined1 auVar433 [16];
  undefined1 auVar434 [32];
  undefined1 auVar435 [32];
  undefined1 auVar436 [32];
  undefined1 auVar437 [32];
  undefined1 auVar438 [28];
  RTCFilterFunctionNArguments args;
  BBox<embree::vfloat_impl<8>_> tp0;
  BBox<embree::vfloat_impl<8>_> tp1;
  StackEntry stack [3];
  uint local_d24;
  float local_cf0;
  float fStack_cec;
  float fStack_ce8;
  float fStack_ce4;
  undefined1 local_cd0 [8];
  float fStack_cc8;
  float fStack_cc4;
  undefined1 local_c00 [16];
  undefined1 local_bf0 [16];
  RTCFilterFunctionNArguments local_bd0;
  undefined1 local_ba0 [8];
  float fStack_b98;
  float fStack_b94;
  float fStack_b90;
  float fStack_b8c;
  float fStack_b88;
  undefined1 local_b80 [8];
  float fStack_b78;
  float fStack_b74;
  float fStack_b70;
  float fStack_b6c;
  float fStack_b68;
  undefined1 local_b60 [32];
  undefined1 local_b40 [32];
  undefined1 local_b20 [32];
  undefined1 (*local_af8) [16];
  undefined1 (*local_af0) [16];
  undefined1 (*local_ae8) [32];
  undefined1 local_ae0 [8];
  float fStack_ad8;
  float fStack_ad4;
  float fStack_ad0;
  float fStack_acc;
  float fStack_ac8;
  float fStack_ac4;
  undefined1 local_ac0 [32];
  undefined1 local_aa0 [32];
  undefined1 local_a80 [16];
  undefined1 local_a70 [8];
  float fStack_a68;
  float fStack_a64;
  undefined1 local_a60 [32];
  undefined1 local_a40 [32];
  undefined1 local_a20 [32];
  undefined1 local_a00 [32];
  undefined1 local_9e0 [8];
  float fStack_9d8;
  float fStack_9d4;
  undefined1 auStack_9d0 [16];
  undefined1 local_9c0 [8];
  float fStack_9b8;
  float fStack_9b4;
  undefined1 auStack_9b0 [16];
  undefined1 local_9a0 [8];
  float fStack_998;
  float fStack_994;
  float fStack_990;
  float fStack_98c;
  float fStack_988;
  float fStack_984;
  undefined1 local_980 [32];
  undefined1 local_960 [16];
  Primitive *local_948;
  ulong local_940;
  undefined1 auStack_938 [24];
  undefined1 local_920 [8];
  float fStack_918;
  float fStack_914;
  float fStack_910;
  float fStack_90c;
  float fStack_908;
  float fStack_904;
  undefined1 local_900 [32];
  undefined1 local_8e0 [32];
  undefined1 local_8c0 [8];
  float fStack_8b8;
  float fStack_8b4;
  float fStack_8b0;
  float fStack_8ac;
  float fStack_8a8;
  float fStack_8a4;
  undefined1 local_8a0 [8];
  float fStack_898;
  float fStack_894;
  float fStack_890;
  float fStack_88c;
  float fStack_888;
  float fStack_884;
  undefined1 local_880 [32];
  undefined1 local_860 [32];
  undefined1 local_840 [16];
  undefined1 auStack_830 [16];
  undefined1 local_820 [32];
  undefined1 local_800 [8];
  float fStack_7f8;
  float fStack_7f4;
  float fStack_7f0;
  float fStack_7ec;
  float fStack_7e8;
  float fStack_7e4;
  undefined1 local_7e0 [32];
  undefined1 local_7c0 [32];
  undefined1 local_7a0 [32];
  undefined1 local_780 [32];
  undefined1 local_750 [16];
  RTCHitN local_740 [16];
  undefined1 auStack_730 [16];
  undefined1 local_720 [16];
  undefined1 auStack_710 [16];
  undefined1 local_700 [16];
  undefined1 auStack_6f0 [16];
  undefined1 local_6e0 [16];
  undefined1 auStack_6d0 [16];
  undefined1 local_6c0 [32];
  undefined8 local_6a0;
  undefined8 uStack_698;
  undefined8 uStack_690;
  undefined8 uStack_688;
  undefined1 local_680 [32];
  uint local_660;
  uint uStack_65c;
  uint uStack_658;
  uint uStack_654;
  uint uStack_650;
  uint uStack_64c;
  uint uStack_648;
  uint uStack_644;
  uint local_640;
  uint uStack_63c;
  uint uStack_638;
  uint uStack_634;
  uint uStack_630;
  uint uStack_62c;
  uint uStack_628;
  uint uStack_624;
  float local_620;
  float fStack_61c;
  float fStack_618;
  float fStack_614;
  float fStack_610;
  float fStack_60c;
  float fStack_608;
  float fStack_604;
  float local_600;
  float fStack_5fc;
  float fStack_5f8;
  float fStack_5f4;
  float fStack_5f0;
  float fStack_5ec;
  float fStack_5e8;
  float fStack_5e4;
  undefined1 local_5e0 [32];
  undefined1 local_5c0 [32];
  undefined1 local_5a0 [32];
  undefined1 local_580 [32];
  float local_560;
  float fStack_55c;
  float fStack_558;
  float fStack_554;
  float fStack_550;
  float fStack_54c;
  float fStack_548;
  float fStack_544;
  undefined1 local_540 [32];
  undefined1 local_520 [32];
  undefined1 local_500 [32];
  undefined1 local_4e0 [32];
  undefined1 local_4c0 [8];
  float fStack_4b8;
  float fStack_4b4;
  float fStack_4b0;
  float fStack_4ac;
  float fStack_4a8;
  float fStack_4a4;
  undefined1 local_4a0 [32];
  undefined1 local_480 [8];
  float fStack_478;
  float fStack_474;
  float fStack_470;
  float fStack_46c;
  float fStack_468;
  float fStack_464;
  undefined1 local_460 [32];
  undefined1 local_440 [32];
  float local_420;
  float fStack_41c;
  float fStack_418;
  float fStack_414;
  float fStack_410;
  float fStack_40c;
  float fStack_408;
  float fStack_404;
  float local_400;
  float fStack_3fc;
  float fStack_3f8;
  float fStack_3f4;
  float fStack_3f0;
  float fStack_3ec;
  float fStack_3e8;
  float fStack_3e4;
  undefined1 local_3e0 [32];
  undefined1 local_3c0 [32];
  undefined1 local_3a0 [32];
  undefined1 local_380 [32];
  undefined1 local_360 [32];
  undefined1 local_340 [32];
  undefined1 local_320 [32];
  undefined1 local_300 [32];
  undefined1 local_2e0 [32];
  undefined1 local_2c0 [32];
  undefined1 local_2a0 [8];
  float fStack_298;
  float fStack_294;
  float fStack_290;
  float fStack_28c;
  float fStack_288;
  undefined1 local_280 [8];
  float fStack_278;
  float fStack_274;
  float fStack_270;
  float fStack_26c;
  float fStack_268;
  undefined1 local_260 [8];
  float fStack_258;
  float fStack_254;
  float fStack_250;
  float fStack_24c;
  float fStack_248;
  undefined1 local_240 [8];
  float fStack_238;
  float fStack_234;
  float fStack_230;
  float fStack_22c;
  float fStack_228;
  undefined1 local_220 [8];
  float fStack_218;
  float fStack_214;
  float fStack_210;
  float fStack_20c;
  float fStack_208;
  float fStack_204;
  undefined1 local_200 [8];
  float fStack_1f8;
  float fStack_1f4;
  float fStack_1f0;
  float fStack_1ec;
  float fStack_1e8;
  float fStack_1e4;
  undefined1 local_1e0 [8];
  float fStack_1d8;
  float fStack_1d4;
  float fStack_1d0;
  float fStack_1cc;
  float fStack_1c8;
  float local_1c0 [4];
  float fStack_1b0;
  float fStack_1ac;
  float fStack_1a8;
  float fStack_1a4;
  float local_1a0 [4];
  float fStack_190;
  float fStack_18c;
  float fStack_188;
  float fStack_184;
  undefined1 auStack_180 [32];
  undefined1 auStack_160 [32];
  ulong uStack_140;
  uint auStack_138 [66];
  
  PVar18 = prim[1];
  uVar97 = (ulong)(byte)PVar18;
  auVar36 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar97 * 4 + 6)));
  auVar37 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar97 * 4 + 10)));
  auVar38 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar97 * 5 + 6)));
  auVar222 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar97 * 5 + 10)));
  auVar307 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar97 * 6 + 6)));
  lVar101 = uVar97 * 0x25;
  auVar39 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar97 * 6 + 10)));
  auVar114 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar97 * 0xf + 6)));
  auVar184 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar97 * 0xf + 10)));
  auVar219 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + (ulong)(byte)PVar18 * 0x10 + 6)));
  auVar40 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + (ulong)(byte)PVar18 * 0x10 + 10)));
  fVar214 = *(float *)(prim + lVar101 + 0x12);
  auVar152 = vinsertps_avx(ZEXT416(*(uint *)(ray + k * 4)),ZEXT416(*(uint *)(ray + k * 4 + 0x20)),
                           0x10);
  auVar152 = vinsertps_avx(auVar152,ZEXT416(*(uint *)(ray + k * 4 + 0x40)),0x20);
  auVar32 = vinsertps_avx(ZEXT416(*(uint *)(ray + k * 4 + 0x80)),
                          ZEXT416(*(uint *)(ray + k * 4 + 0xa0)),0x10);
  auVar32 = vinsertps_avx(auVar32,ZEXT416(*(uint *)(ray + k * 4 + 0xc0)),0x20);
  auVar152 = vsubps_avx(auVar152,*(undefined1 (*) [16])(prim + lVar101 + 6));
  local_cd0._4_4_ = fVar214 * auVar152._4_4_;
  local_cd0._0_4_ = fVar214 * auVar152._0_4_;
  fStack_cc8 = fVar214 * auVar152._8_4_;
  fStack_cc4 = fVar214 * auVar152._12_4_;
  auVar357._0_4_ = fVar214 * auVar32._0_4_;
  auVar357._4_4_ = fVar214 * auVar32._4_4_;
  auVar357._8_4_ = fVar214 * auVar32._8_4_;
  auVar357._12_4_ = fVar214 * auVar32._12_4_;
  auVar152 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar97 * 0x11 + 6)));
  auVar32 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar97 * 0x11 + 10)));
  auVar41 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar97 * 0x1a + 6)));
  auVar119 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar97 * 0x1a + 10)));
  auStack_9b0 = auVar37;
  _local_9c0 = auVar36;
  auVar189._16_16_ = auVar222;
  auVar189._0_16_ = auVar38;
  auVar36 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar97 * 0x1b + 6)));
  auVar37 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar97 * 0x1b + 10)));
  auVar231._16_16_ = auVar39;
  auVar231._0_16_ = auVar307;
  auVar38 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar97 * 0x1c + 6)));
  auVar365._16_16_ = auVar184;
  auVar365._0_16_ = auVar114;
  auVar222 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar97 * 0x1c + 10)));
  auVar189 = vcvtdq2ps_avx(auVar189);
  auVar130 = vcvtdq2ps_avx(auVar231);
  auVar257._16_16_ = auVar40;
  auVar257._0_16_ = auVar219;
  _local_9e0 = vcvtdq2ps_avx(auVar257);
  auVar258._16_16_ = auVar32;
  auVar258._0_16_ = auVar152;
  auVar26 = vcvtdq2ps_avx(auVar258);
  auVar397._16_16_ = auVar119;
  auVar397._0_16_ = auVar41;
  auVar337._16_16_ = auVar37;
  auVar337._0_16_ = auVar36;
  auVar346._16_16_ = auVar222;
  auVar346._0_16_ = auVar38;
  auVar152 = vshufps_avx(auVar357,auVar357,0x55);
  auVar32 = vshufps_avx(auVar357,auVar357,0xaa);
  fVar214 = auVar32._0_4_;
  fVar302 = auVar32._4_4_;
  fVar238 = auVar32._8_4_;
  fVar109 = auVar32._12_4_;
  fVar241 = auVar152._0_4_;
  fVar242 = auVar152._4_4_;
  fVar243 = auVar152._8_4_;
  fVar245 = auVar152._12_4_;
  auVar27 = vcvtdq2ps_avx(_local_9c0);
  auVar28 = vcvtdq2ps_avx(auVar365);
  auVar29 = vcvtdq2ps_avx(auVar397);
  auVar30 = vcvtdq2ps_avx(auVar337);
  auVar31 = vcvtdq2ps_avx(auVar346);
  auVar152 = vshufps_avx(auVar357,auVar357,0);
  fVar239 = auVar152._0_4_;
  fVar203 = auVar152._4_4_;
  fVar240 = auVar152._8_4_;
  fVar201 = auVar152._12_4_;
  auVar416._0_4_ = fVar239 * auVar27._0_4_ + fVar241 * auVar189._0_4_ + fVar214 * auVar130._0_4_;
  auVar416._4_4_ = fVar203 * auVar27._4_4_ + fVar242 * auVar189._4_4_ + fVar302 * auVar130._4_4_;
  auVar416._8_4_ = fVar240 * auVar27._8_4_ + fVar243 * auVar189._8_4_ + fVar238 * auVar130._8_4_;
  auVar416._12_4_ = fVar201 * auVar27._12_4_ + fVar245 * auVar189._12_4_ + fVar109 * auVar130._12_4_
  ;
  auVar416._16_4_ = fVar239 * auVar27._16_4_ + fVar241 * auVar189._16_4_ + fVar214 * auVar130._16_4_
  ;
  auVar416._20_4_ = fVar203 * auVar27._20_4_ + fVar242 * auVar189._20_4_ + fVar302 * auVar130._20_4_
  ;
  auVar416._24_4_ = fVar240 * auVar27._24_4_ + fVar243 * auVar189._24_4_ + fVar238 * auVar130._24_4_
  ;
  auVar416._28_4_ = 0;
  auVar398._0_4_ = fVar239 * auVar28._0_4_ + fVar241 * local_9e0._0_4_ + fVar214 * auVar26._0_4_;
  auVar398._4_4_ = fVar203 * auVar28._4_4_ + fVar242 * local_9e0._4_4_ + fVar302 * auVar26._4_4_;
  auVar398._8_4_ = fVar240 * auVar28._8_4_ + fVar243 * local_9e0._8_4_ + fVar238 * auVar26._8_4_;
  auVar398._12_4_ = fVar201 * auVar28._12_4_ + fVar245 * local_9e0._12_4_ + fVar109 * auVar26._12_4_
  ;
  auVar398._16_4_ = fVar239 * auVar28._16_4_ + fVar241 * local_9e0._16_4_ + fVar214 * auVar26._16_4_
  ;
  auVar398._20_4_ = fVar203 * auVar28._20_4_ + fVar242 * local_9e0._20_4_ + fVar302 * auVar26._20_4_
  ;
  auVar398._24_4_ = fVar240 * auVar28._24_4_ + fVar243 * local_9e0._24_4_ + fVar238 * auVar26._24_4_
  ;
  auVar398._28_4_ = 0;
  auVar366._0_4_ = fVar239 * auVar29._0_4_ + fVar241 * auVar30._0_4_ + fVar214 * auVar31._0_4_;
  auVar366._4_4_ = fVar203 * auVar29._4_4_ + fVar242 * auVar30._4_4_ + fVar302 * auVar31._4_4_;
  auVar366._8_4_ = fVar240 * auVar29._8_4_ + fVar243 * auVar30._8_4_ + fVar238 * auVar31._8_4_;
  auVar366._12_4_ = fVar201 * auVar29._12_4_ + fVar245 * auVar30._12_4_ + fVar109 * auVar31._12_4_;
  auVar366._16_4_ = fVar239 * auVar29._16_4_ + fVar241 * auVar30._16_4_ + fVar214 * auVar31._16_4_;
  auVar366._20_4_ = fVar203 * auVar29._20_4_ + fVar242 * auVar30._20_4_ + fVar302 * auVar31._20_4_;
  auVar366._24_4_ = fVar240 * auVar29._24_4_ + fVar243 * auVar30._24_4_ + fVar238 * auVar31._24_4_;
  auVar366._28_4_ = fVar109 + 0.0 + 0.0;
  auVar152 = vshufps_avx(_local_cd0,_local_cd0,0x55);
  auVar32 = vshufps_avx(_local_cd0,_local_cd0,0xaa);
  fVar241 = auVar32._0_4_;
  fVar242 = auVar32._4_4_;
  fVar243 = auVar32._8_4_;
  fVar245 = auVar32._12_4_;
  fVar214 = auVar152._0_4_;
  fVar238 = auVar152._4_4_;
  fVar239 = auVar152._8_4_;
  fVar240 = auVar152._12_4_;
  fVar244 = auVar130._28_4_ + 0.0;
  auVar152._8_8_ = 0;
  auVar152._0_8_ = *(ulong *)(prim + uVar97 * 7 + 6);
  auVar152 = vpmovsxwd_avx(auVar152);
  auVar32._8_8_ = 0;
  auVar32._0_8_ = *(ulong *)(prim + uVar97 * 7 + 0xe);
  auVar32 = vpmovsxwd_avx(auVar32);
  auVar36 = vshufps_avx(_local_cd0,_local_cd0,0);
  fVar302 = auVar36._0_4_;
  fVar109 = auVar36._4_4_;
  fVar203 = auVar36._8_4_;
  fVar201 = auVar36._12_4_;
  auVar190._0_4_ = auVar27._0_4_ * fVar302 + auVar189._0_4_ * fVar214 + fVar241 * auVar130._0_4_;
  auVar190._4_4_ = auVar27._4_4_ * fVar109 + auVar189._4_4_ * fVar238 + fVar242 * auVar130._4_4_;
  auVar190._8_4_ = auVar27._8_4_ * fVar203 + auVar189._8_4_ * fVar239 + fVar243 * auVar130._8_4_;
  auVar190._12_4_ = auVar27._12_4_ * fVar201 + auVar189._12_4_ * fVar240 + fVar245 * auVar130._12_4_
  ;
  auVar190._16_4_ = auVar27._16_4_ * fVar302 + auVar189._16_4_ * fVar214 + fVar241 * auVar130._16_4_
  ;
  auVar190._20_4_ = auVar27._20_4_ * fVar109 + auVar189._20_4_ * fVar238 + fVar242 * auVar130._20_4_
  ;
  auVar190._24_4_ = auVar27._24_4_ * fVar203 + auVar189._24_4_ * fVar239 + fVar243 * auVar130._24_4_
  ;
  auVar190._28_4_ = fVar245 + fVar244;
  auVar164._0_4_ = fVar302 * auVar28._0_4_ + fVar214 * local_9e0._0_4_ + fVar241 * auVar26._0_4_;
  auVar164._4_4_ = fVar109 * auVar28._4_4_ + fVar238 * local_9e0._4_4_ + fVar242 * auVar26._4_4_;
  auVar164._8_4_ = fVar203 * auVar28._8_4_ + fVar239 * local_9e0._8_4_ + fVar243 * auVar26._8_4_;
  auVar164._12_4_ = fVar201 * auVar28._12_4_ + fVar240 * local_9e0._12_4_ + fVar245 * auVar26._12_4_
  ;
  auVar164._16_4_ = fVar302 * auVar28._16_4_ + fVar214 * local_9e0._16_4_ + fVar241 * auVar26._16_4_
  ;
  auVar164._20_4_ = fVar109 * auVar28._20_4_ + fVar238 * local_9e0._20_4_ + fVar242 * auVar26._20_4_
  ;
  auVar164._24_4_ = fVar203 * auVar28._24_4_ + fVar239 * local_9e0._24_4_ + fVar243 * auVar26._24_4_
  ;
  auVar164._28_4_ = auVar28._28_4_ + auVar26._28_4_ + 0.0;
  auVar279._8_4_ = 0x7fffffff;
  auVar279._0_8_ = 0x7fffffff7fffffff;
  auVar279._12_4_ = 0x7fffffff;
  auVar279._16_4_ = 0x7fffffff;
  auVar279._20_4_ = 0x7fffffff;
  auVar279._24_4_ = 0x7fffffff;
  auVar279._28_4_ = 0x7fffffff;
  auVar120._0_4_ = fVar302 * auVar29._0_4_ + auVar30._0_4_ * fVar214 + fVar241 * auVar31._0_4_;
  auVar120._4_4_ = fVar109 * auVar29._4_4_ + auVar30._4_4_ * fVar238 + fVar242 * auVar31._4_4_;
  auVar120._8_4_ = fVar203 * auVar29._8_4_ + auVar30._8_4_ * fVar239 + fVar243 * auVar31._8_4_;
  auVar120._12_4_ = fVar201 * auVar29._12_4_ + auVar30._12_4_ * fVar240 + fVar245 * auVar31._12_4_;
  auVar120._16_4_ = fVar302 * auVar29._16_4_ + auVar30._16_4_ * fVar214 + fVar241 * auVar31._16_4_;
  auVar120._20_4_ = fVar109 * auVar29._20_4_ + auVar30._20_4_ * fVar238 + fVar242 * auVar31._20_4_;
  auVar120._24_4_ = fVar203 * auVar29._24_4_ + auVar30._24_4_ * fVar239 + fVar243 * auVar31._24_4_;
  auVar120._28_4_ = fVar244 + fVar240 + fVar245;
  auVar189 = vandps_avx(auVar416,auVar279);
  auVar347._8_4_ = 0x219392ef;
  auVar347._0_8_ = 0x219392ef219392ef;
  auVar347._12_4_ = 0x219392ef;
  auVar347._16_4_ = 0x219392ef;
  auVar347._20_4_ = 0x219392ef;
  auVar347._24_4_ = 0x219392ef;
  auVar347._28_4_ = 0x219392ef;
  auVar189 = vcmpps_avx(auVar189,auVar347,1);
  auVar130 = vblendvps_avx(auVar416,auVar347,auVar189);
  auVar189 = vandps_avx(auVar398,auVar279);
  auVar189 = vcmpps_avx(auVar189,auVar347,1);
  auVar26 = vblendvps_avx(auVar398,auVar347,auVar189);
  auVar189 = vandps_avx(auVar366,auVar279);
  auVar189 = vcmpps_avx(auVar189,auVar347,1);
  auVar27 = vrcpps_avx(auVar130);
  auVar189 = vblendvps_avx(auVar366,auVar347,auVar189);
  auVar367._8_4_ = 0x3f800000;
  auVar367._0_8_ = 0x3f8000003f800000;
  auVar367._12_4_ = 0x3f800000;
  auVar367._16_4_ = 0x3f800000;
  auVar367._20_4_ = 0x3f800000;
  auVar367._24_4_ = 0x3f800000;
  auVar367._28_4_ = 0x3f800000;
  fVar214 = auVar27._0_4_;
  fVar238 = auVar27._4_4_;
  auVar28._4_4_ = auVar130._4_4_ * fVar238;
  auVar28._0_4_ = auVar130._0_4_ * fVar214;
  fVar239 = auVar27._8_4_;
  auVar28._8_4_ = auVar130._8_4_ * fVar239;
  fVar240 = auVar27._12_4_;
  auVar28._12_4_ = auVar130._12_4_ * fVar240;
  fVar241 = auVar27._16_4_;
  auVar28._16_4_ = auVar130._16_4_ * fVar241;
  fVar242 = auVar27._20_4_;
  auVar28._20_4_ = auVar130._20_4_ * fVar242;
  fVar243 = auVar27._24_4_;
  auVar28._24_4_ = auVar130._24_4_ * fVar243;
  auVar28._28_4_ = auVar130._28_4_;
  auVar29 = vsubps_avx(auVar367,auVar28);
  fVar214 = fVar214 + fVar214 * auVar29._0_4_;
  fVar238 = fVar238 + fVar238 * auVar29._4_4_;
  fVar239 = fVar239 + fVar239 * auVar29._8_4_;
  fVar240 = fVar240 + fVar240 * auVar29._12_4_;
  fVar241 = fVar241 + fVar241 * auVar29._16_4_;
  fVar242 = fVar242 + fVar242 * auVar29._20_4_;
  fVar243 = fVar243 + fVar243 * auVar29._24_4_;
  auVar28 = vrcpps_avx(auVar26);
  fVar245 = auVar28._0_4_;
  fVar244 = auVar28._4_4_;
  auVar130._4_4_ = fVar244 * auVar26._4_4_;
  auVar130._0_4_ = fVar245 * auVar26._0_4_;
  fVar266 = auVar28._8_4_;
  auVar130._8_4_ = fVar266 * auVar26._8_4_;
  fVar267 = auVar28._12_4_;
  auVar130._12_4_ = fVar267 * auVar26._12_4_;
  fVar268 = auVar28._16_4_;
  auVar130._16_4_ = fVar268 * auVar26._16_4_;
  fVar269 = auVar28._20_4_;
  auVar130._20_4_ = fVar269 * auVar26._20_4_;
  fVar270 = auVar28._24_4_;
  auVar130._24_4_ = fVar270 * auVar26._24_4_;
  auVar130._28_4_ = auVar26._28_4_;
  auVar26 = vsubps_avx(auVar367,auVar130);
  auVar130 = vrcpps_avx(auVar189);
  fVar245 = fVar245 + fVar245 * auVar26._0_4_;
  fVar244 = fVar244 + fVar244 * auVar26._4_4_;
  fVar266 = fVar266 + fVar266 * auVar26._8_4_;
  fVar267 = fVar267 + fVar267 * auVar26._12_4_;
  fVar268 = fVar268 + fVar268 * auVar26._16_4_;
  fVar269 = fVar269 + fVar269 * auVar26._20_4_;
  fVar270 = fVar270 + fVar270 * auVar26._24_4_;
  fVar272 = auVar130._0_4_;
  fVar290 = auVar130._4_4_;
  auVar30._4_4_ = fVar290 * auVar189._4_4_;
  auVar30._0_4_ = fVar272 * auVar189._0_4_;
  fVar292 = auVar130._8_4_;
  auVar30._8_4_ = fVar292 * auVar189._8_4_;
  fVar294 = auVar130._12_4_;
  auVar30._12_4_ = fVar294 * auVar189._12_4_;
  fVar296 = auVar130._16_4_;
  auVar30._16_4_ = fVar296 * auVar189._16_4_;
  fVar298 = auVar130._20_4_;
  auVar30._20_4_ = fVar298 * auVar189._20_4_;
  fVar300 = auVar130._24_4_;
  auVar30._24_4_ = fVar300 * auVar189._24_4_;
  auVar30._28_4_ = auVar189._28_4_;
  auVar189 = vsubps_avx(auVar367,auVar30);
  fVar272 = fVar272 + fVar272 * auVar189._0_4_;
  fVar290 = fVar290 + fVar290 * auVar189._4_4_;
  fVar292 = fVar292 + fVar292 * auVar189._8_4_;
  fVar294 = fVar294 + fVar294 * auVar189._12_4_;
  fVar296 = fVar296 + fVar296 * auVar189._16_4_;
  fVar298 = fVar298 + fVar298 * auVar189._20_4_;
  fVar300 = fVar300 + fVar300 * auVar189._24_4_;
  auVar38 = vpermilps_avx(ZEXT416((uint)((*(float *)(ray + k * 4 + 0xe0) -
                                         *(float *)(prim + lVar101 + 0x16)) *
                                        *(float *)(prim + lVar101 + 0x1a))),0);
  auVar338._16_16_ = auVar32;
  auVar338._0_16_ = auVar152;
  auVar189 = vcvtdq2ps_avx(auVar338);
  auVar36._8_8_ = 0;
  auVar36._0_8_ = *(ulong *)(prim + uVar97 * 0xb + 6);
  auVar152 = vpmovsxwd_avx(auVar36);
  auVar37._8_8_ = 0;
  auVar37._0_8_ = *(ulong *)(prim + uVar97 * 0xb + 0xe);
  auVar32 = vpmovsxwd_avx(auVar37);
  auVar348._16_16_ = auVar32;
  auVar348._0_16_ = auVar152;
  auVar130 = vcvtdq2ps_avx(auVar348);
  auVar130 = vsubps_avx(auVar130,auVar189);
  fVar302 = auVar38._0_4_;
  fVar109 = auVar38._4_4_;
  fVar203 = auVar38._8_4_;
  fVar201 = auVar38._12_4_;
  auVar38._8_8_ = 0;
  auVar38._0_8_ = *(ulong *)(prim + uVar97 * 9 + 6);
  auVar152 = vpmovsxwd_avx(auVar38);
  auVar339._0_4_ = auVar130._0_4_ * fVar302 + auVar189._0_4_;
  auVar339._4_4_ = auVar130._4_4_ * fVar109 + auVar189._4_4_;
  auVar339._8_4_ = auVar130._8_4_ * fVar203 + auVar189._8_4_;
  auVar339._12_4_ = auVar130._12_4_ * fVar201 + auVar189._12_4_;
  auVar339._16_4_ = auVar130._16_4_ * fVar302 + auVar189._16_4_;
  auVar339._20_4_ = auVar130._20_4_ * fVar109 + auVar189._20_4_;
  auVar339._24_4_ = auVar130._24_4_ * fVar203 + auVar189._24_4_;
  auVar339._28_4_ = auVar130._28_4_ + auVar189._28_4_;
  auVar222._8_8_ = 0;
  auVar222._0_8_ = *(ulong *)(prim + uVar97 * 9 + 0xe);
  auVar32 = vpmovsxwd_avx(auVar222);
  auVar349._16_16_ = auVar32;
  auVar349._0_16_ = auVar152;
  auVar307._8_8_ = 0;
  auVar307._0_8_ = *(ulong *)(prim + uVar97 * 0xd + 6);
  auVar152 = vpmovsxwd_avx(auVar307);
  auVar39._8_8_ = 0;
  auVar39._0_8_ = *(ulong *)(prim + uVar97 * 0xd + 0xe);
  auVar32 = vpmovsxwd_avx(auVar39);
  auVar189 = vcvtdq2ps_avx(auVar349);
  auVar358._16_16_ = auVar32;
  auVar358._0_16_ = auVar152;
  auVar130 = vcvtdq2ps_avx(auVar358);
  auVar130 = vsubps_avx(auVar130,auVar189);
  auVar350._0_4_ = auVar189._0_4_ + auVar130._0_4_ * fVar302;
  auVar350._4_4_ = auVar189._4_4_ + auVar130._4_4_ * fVar109;
  auVar350._8_4_ = auVar189._8_4_ + auVar130._8_4_ * fVar203;
  auVar350._12_4_ = auVar189._12_4_ + auVar130._12_4_ * fVar201;
  auVar350._16_4_ = auVar189._16_4_ + auVar130._16_4_ * fVar302;
  auVar350._20_4_ = auVar189._20_4_ + auVar130._20_4_ * fVar109;
  auVar350._24_4_ = auVar189._24_4_ + auVar130._24_4_ * fVar203;
  auVar350._28_4_ = auVar189._28_4_ + auVar130._28_4_;
  auVar114._8_8_ = 0;
  auVar114._0_8_ = *(ulong *)(prim + uVar97 * 0x12 + 6);
  auVar152 = vpmovsxwd_avx(auVar114);
  auVar184._8_8_ = 0;
  auVar184._0_8_ = *(ulong *)(prim + uVar97 * 0x12 + 0xe);
  auVar32 = vpmovsxwd_avx(auVar184);
  auVar359._16_16_ = auVar32;
  auVar359._0_16_ = auVar152;
  auVar189 = vcvtdq2ps_avx(auVar359);
  auVar219._8_8_ = 0;
  auVar219._0_8_ = *(ulong *)(prim + uVar97 * 0x16 + 6);
  auVar152 = vpmovsxwd_avx(auVar219);
  auVar40._8_8_ = 0;
  auVar40._0_8_ = *(ulong *)(prim + uVar97 * 0x16 + 0xe);
  auVar32 = vpmovsxwd_avx(auVar40);
  auVar368._16_16_ = auVar32;
  auVar368._0_16_ = auVar152;
  auVar130 = vcvtdq2ps_avx(auVar368);
  auVar130 = vsubps_avx(auVar130,auVar189);
  auVar41._8_8_ = 0;
  auVar41._0_8_ = *(ulong *)(prim + uVar97 * 0x14 + 6);
  auVar152 = vpmovsxwd_avx(auVar41);
  auVar119._8_8_ = 0;
  auVar119._0_8_ = *(ulong *)(prim + uVar97 * 0x14 + 0xe);
  auVar32 = vpmovsxwd_avx(auVar119);
  auVar360._0_4_ = auVar189._0_4_ + auVar130._0_4_ * fVar302;
  auVar360._4_4_ = auVar189._4_4_ + auVar130._4_4_ * fVar109;
  auVar360._8_4_ = auVar189._8_4_ + auVar130._8_4_ * fVar203;
  auVar360._12_4_ = auVar189._12_4_ + auVar130._12_4_ * fVar201;
  auVar360._16_4_ = auVar189._16_4_ + auVar130._16_4_ * fVar302;
  auVar360._20_4_ = auVar189._20_4_ + auVar130._20_4_ * fVar109;
  auVar360._24_4_ = auVar189._24_4_ + auVar130._24_4_ * fVar203;
  auVar360._28_4_ = auVar189._28_4_ + auVar130._28_4_;
  auVar369._16_16_ = auVar32;
  auVar369._0_16_ = auVar152;
  auVar116._8_8_ = 0;
  auVar116._0_8_ = *(ulong *)(prim + uVar97 * 0x18 + 6);
  auVar152 = vpmovsxwd_avx(auVar116);
  auVar189 = vcvtdq2ps_avx(auVar369);
  auVar9._8_8_ = 0;
  auVar9._0_8_ = *(ulong *)(prim + uVar97 * 0x18 + 0xe);
  auVar32 = vpmovsxwd_avx(auVar9);
  auVar381._16_16_ = auVar32;
  auVar381._0_16_ = auVar152;
  auVar130 = vcvtdq2ps_avx(auVar381);
  auVar130 = vsubps_avx(auVar130,auVar189);
  auVar370._0_4_ = auVar189._0_4_ + auVar130._0_4_ * fVar302;
  auVar370._4_4_ = auVar189._4_4_ + auVar130._4_4_ * fVar109;
  auVar370._8_4_ = auVar189._8_4_ + auVar130._8_4_ * fVar203;
  auVar370._12_4_ = auVar189._12_4_ + auVar130._12_4_ * fVar201;
  auVar370._16_4_ = auVar189._16_4_ + auVar130._16_4_ * fVar302;
  auVar370._20_4_ = auVar189._20_4_ + auVar130._20_4_ * fVar109;
  auVar370._24_4_ = auVar189._24_4_ + auVar130._24_4_ * fVar203;
  auVar370._28_4_ = auVar189._28_4_ + auVar130._28_4_;
  auVar10._8_8_ = 0;
  auVar10._0_8_ = *(ulong *)(prim + uVar97 * 0x1d + 6);
  auVar152 = vpmovsxwd_avx(auVar10);
  auVar11._8_8_ = 0;
  auVar11._0_8_ = *(ulong *)(prim + uVar97 * 0x1d + 0xe);
  auVar32 = vpmovsxwd_avx(auVar11);
  auVar382._16_16_ = auVar32;
  auVar382._0_16_ = auVar152;
  auVar12._8_8_ = 0;
  auVar12._0_8_ = *(ulong *)(prim + uVar97 * 0x21 + 6);
  auVar152 = vpmovsxwd_avx(auVar12);
  auVar13._8_8_ = 0;
  auVar13._0_8_ = *(ulong *)(prim + uVar97 * 0x21 + 0xe);
  auVar32 = vpmovsxwd_avx(auVar13);
  auVar399._16_16_ = auVar32;
  auVar399._0_16_ = auVar152;
  auVar189 = vcvtdq2ps_avx(auVar382);
  auVar130 = vcvtdq2ps_avx(auVar399);
  auVar130 = vsubps_avx(auVar130,auVar189);
  auVar383._0_4_ = auVar189._0_4_ + auVar130._0_4_ * fVar302;
  auVar383._4_4_ = auVar189._4_4_ + auVar130._4_4_ * fVar109;
  auVar383._8_4_ = auVar189._8_4_ + auVar130._8_4_ * fVar203;
  auVar383._12_4_ = auVar189._12_4_ + auVar130._12_4_ * fVar201;
  auVar383._16_4_ = auVar189._16_4_ + auVar130._16_4_ * fVar302;
  auVar383._20_4_ = auVar189._20_4_ + auVar130._20_4_ * fVar109;
  auVar383._24_4_ = auVar189._24_4_ + auVar130._24_4_ * fVar203;
  auVar383._28_4_ = auVar189._28_4_ + auVar130._28_4_;
  auVar14._8_8_ = 0;
  auVar14._0_8_ = *(ulong *)(prim + uVar97 * 0x1f + 6);
  auVar152 = vpmovsxwd_avx(auVar14);
  auVar15._8_8_ = 0;
  auVar15._0_8_ = *(ulong *)(prim + uVar97 * 0x1f + 0xe);
  auVar32 = vpmovsxwd_avx(auVar15);
  auVar16._8_8_ = 0;
  auVar16._0_8_ = *(ulong *)(prim + uVar97 * 0x23 + 6);
  auVar36 = vpmovsxwd_avx(auVar16);
  auVar400._16_16_ = auVar32;
  auVar400._0_16_ = auVar152;
  auVar17._8_8_ = 0;
  auVar17._0_8_ = *(ulong *)(prim + uVar97 * 0x23 + 0xe);
  auVar152 = vpmovsxwd_avx(auVar17);
  auVar417._16_16_ = auVar152;
  auVar417._0_16_ = auVar36;
  auVar189 = vcvtdq2ps_avx(auVar400);
  auVar130 = vcvtdq2ps_avx(auVar417);
  auVar130 = vsubps_avx(auVar130,auVar189);
  auVar401._0_4_ = auVar189._0_4_ + auVar130._0_4_ * fVar302;
  auVar401._4_4_ = auVar189._4_4_ + auVar130._4_4_ * fVar109;
  auVar401._8_4_ = auVar189._8_4_ + auVar130._8_4_ * fVar203;
  auVar401._12_4_ = auVar189._12_4_ + auVar130._12_4_ * fVar201;
  auVar401._16_4_ = auVar189._16_4_ + auVar130._16_4_ * fVar302;
  auVar401._20_4_ = auVar189._20_4_ + auVar130._20_4_ * fVar109;
  auVar401._24_4_ = auVar189._24_4_ + auVar130._24_4_ * fVar203;
  auVar401._28_4_ = auVar189._28_4_ + fVar201;
  auVar189 = vsubps_avx(auVar339,auVar190);
  auVar306._0_4_ = fVar214 * auVar189._0_4_;
  auVar306._4_4_ = fVar238 * auVar189._4_4_;
  auVar306._8_4_ = fVar239 * auVar189._8_4_;
  auVar306._12_4_ = fVar240 * auVar189._12_4_;
  auVar31._16_4_ = fVar241 * auVar189._16_4_;
  auVar31._0_16_ = auVar306;
  auVar31._20_4_ = fVar242 * auVar189._20_4_;
  auVar31._24_4_ = fVar243 * auVar189._24_4_;
  auVar31._28_4_ = auVar189._28_4_;
  auVar189 = vsubps_avx(auVar350,auVar190);
  auVar215._0_4_ = fVar214 * auVar189._0_4_;
  auVar215._4_4_ = fVar238 * auVar189._4_4_;
  auVar215._8_4_ = fVar239 * auVar189._8_4_;
  auVar215._12_4_ = fVar240 * auVar189._12_4_;
  auVar260._16_4_ = fVar241 * auVar189._16_4_;
  auVar260._0_16_ = auVar215;
  auVar260._20_4_ = fVar242 * auVar189._20_4_;
  auVar260._24_4_ = fVar243 * auVar189._24_4_;
  auVar260._28_4_ = auVar27._28_4_ + auVar29._28_4_;
  auVar189 = vsubps_avx(auVar360,auVar164);
  auVar182._0_4_ = fVar245 * auVar189._0_4_;
  auVar182._4_4_ = fVar244 * auVar189._4_4_;
  auVar182._8_4_ = fVar266 * auVar189._8_4_;
  auVar182._12_4_ = fVar267 * auVar189._12_4_;
  auVar27._16_4_ = fVar268 * auVar189._16_4_;
  auVar27._0_16_ = auVar182;
  auVar27._20_4_ = fVar269 * auVar189._20_4_;
  auVar27._24_4_ = fVar270 * auVar189._24_4_;
  auVar27._28_4_ = auVar189._28_4_;
  auVar189 = vsubps_avx(auVar370,auVar164);
  auVar246._0_4_ = fVar245 * auVar189._0_4_;
  auVar246._4_4_ = fVar244 * auVar189._4_4_;
  auVar246._8_4_ = fVar266 * auVar189._8_4_;
  auVar246._12_4_ = fVar267 * auVar189._12_4_;
  auVar29._16_4_ = fVar268 * auVar189._16_4_;
  auVar29._0_16_ = auVar246;
  auVar29._20_4_ = fVar269 * auVar189._20_4_;
  auVar29._24_4_ = fVar270 * auVar189._24_4_;
  auVar29._28_4_ = auVar28._28_4_ + auVar26._28_4_;
  auVar189 = vsubps_avx(auVar383,auVar120);
  auVar150._0_4_ = fVar272 * auVar189._0_4_;
  auVar150._4_4_ = fVar290 * auVar189._4_4_;
  auVar150._8_4_ = fVar292 * auVar189._8_4_;
  auVar150._12_4_ = fVar294 * auVar189._12_4_;
  auVar26._16_4_ = fVar296 * auVar189._16_4_;
  auVar26._0_16_ = auVar150;
  auVar26._20_4_ = fVar298 * auVar189._20_4_;
  auVar26._24_4_ = fVar300 * auVar189._24_4_;
  auVar26._28_4_ = auVar189._28_4_;
  auVar189 = vsubps_avx(auVar401,auVar120);
  auVar110._0_4_ = fVar272 * auVar189._0_4_;
  auVar110._4_4_ = fVar290 * auVar189._4_4_;
  auVar110._8_4_ = fVar292 * auVar189._8_4_;
  auVar110._12_4_ = fVar294 * auVar189._12_4_;
  auVar42._16_4_ = fVar296 * auVar189._16_4_;
  auVar42._0_16_ = auVar110;
  auVar42._20_4_ = fVar298 * auVar189._20_4_;
  auVar42._24_4_ = fVar300 * auVar189._24_4_;
  auVar42._28_4_ = auVar189._28_4_;
  auVar152 = vpminsd_avx(auVar31._16_16_,auVar260._16_16_);
  auVar32 = vpminsd_avx(auVar306,auVar215);
  auVar351._16_16_ = auVar152;
  auVar351._0_16_ = auVar32;
  auVar152 = vpminsd_avx(auVar27._16_16_,auVar29._16_16_);
  auVar32 = vpminsd_avx(auVar182,auVar246);
  auVar361._16_16_ = auVar152;
  auVar361._0_16_ = auVar32;
  auVar189 = vmaxps_avx(auVar351,auVar361);
  auVar152 = vpminsd_avx(auVar26._16_16_,auVar42._16_16_);
  auVar32 = vpminsd_avx(auVar150,auVar110);
  auVar418._16_16_ = auVar152;
  auVar418._0_16_ = auVar32;
  uVar104 = *(undefined4 *)(ray + k * 4 + 0x60);
  auVar434._4_4_ = uVar104;
  auVar434._0_4_ = uVar104;
  auVar434._8_4_ = uVar104;
  auVar434._12_4_ = uVar104;
  auVar434._16_4_ = uVar104;
  auVar434._20_4_ = uVar104;
  auVar434._24_4_ = uVar104;
  auVar434._28_4_ = uVar104;
  auVar130 = vmaxps_avx(auVar418,auVar434);
  auVar189 = vmaxps_avx(auVar189,auVar130);
  local_3e0._4_4_ = auVar189._4_4_ * 0.99999964;
  local_3e0._0_4_ = auVar189._0_4_ * 0.99999964;
  local_3e0._8_4_ = auVar189._8_4_ * 0.99999964;
  local_3e0._12_4_ = auVar189._12_4_ * 0.99999964;
  local_3e0._16_4_ = auVar189._16_4_ * 0.99999964;
  local_3e0._20_4_ = auVar189._20_4_ * 0.99999964;
  local_3e0._24_4_ = auVar189._24_4_ * 0.99999964;
  local_3e0._28_4_ = auVar189._28_4_;
  auVar152 = vpmaxsd_avx(auVar31._16_16_,auVar260._16_16_);
  auVar32 = vpmaxsd_avx(auVar306,auVar215);
  auVar232._16_16_ = auVar152;
  auVar232._0_16_ = auVar32;
  auVar152 = vpmaxsd_avx(auVar27._16_16_,auVar29._16_16_);
  auVar32 = vpmaxsd_avx(auVar182,auVar246);
  auVar191._16_16_ = auVar152;
  auVar191._0_16_ = auVar32;
  auVar189 = vminps_avx(auVar232,auVar191);
  auVar152 = vpmaxsd_avx(auVar26._16_16_,auVar42._16_16_);
  auVar32 = vpmaxsd_avx(auVar150,auVar110);
  uVar104 = *(undefined4 *)(ray + k * 4 + 0x100);
  auVar165._4_4_ = uVar104;
  auVar165._0_4_ = uVar104;
  auVar165._8_4_ = uVar104;
  auVar165._12_4_ = uVar104;
  auVar165._16_4_ = uVar104;
  auVar165._20_4_ = uVar104;
  auVar165._24_4_ = uVar104;
  auVar165._28_4_ = uVar104;
  auVar121._16_16_ = auVar152;
  auVar121._0_16_ = auVar32;
  auVar130 = vminps_avx(auVar121,auVar165);
  auVar189 = vminps_avx(auVar189,auVar130);
  auVar43._4_4_ = auVar189._4_4_ * 1.0000004;
  auVar43._0_4_ = auVar189._0_4_ * 1.0000004;
  auVar43._8_4_ = auVar189._8_4_ * 1.0000004;
  auVar43._12_4_ = auVar189._12_4_ * 1.0000004;
  auVar43._16_4_ = auVar189._16_4_ * 1.0000004;
  auVar43._20_4_ = auVar189._20_4_ * 1.0000004;
  auVar43._24_4_ = auVar189._24_4_ * 1.0000004;
  auVar43._28_4_ = auVar189._28_4_;
  auVar189 = vcmpps_avx(local_3e0,auVar43,2);
  auVar152 = vpshufd_avx(ZEXT116((byte)PVar18),0);
  auVar166._16_16_ = auVar152;
  auVar166._0_16_ = auVar152;
  auVar130 = vcvtdq2ps_avx(auVar166);
  auVar130 = vcmpps_avx(_DAT_01f7b060,auVar130,1);
  auVar189 = vandps_avx(auVar189,auVar130);
  auVar167._16_16_ = mm_lookupmask_ps._240_16_;
  auVar167._0_16_ = mm_lookupmask_ps._240_16_;
  uVar104 = vmovmskps_avx(auVar189);
  uVar97 = CONCAT44((int)((ulong)unaff_R13 >> 0x20),uVar104);
  local_520 = vblendps_avx(auVar167,ZEXT832(0) << 0x20,0x80);
  local_ae8 = (undefined1 (*) [32])&local_660;
  uVar102 = 1 << ((byte)k & 0x1f);
  local_af0 = (undefined1 (*) [16])(mm_lookupmask_ps + ((uVar102 & 0xf) << 4));
  local_af8 = (undefined1 (*) [16])(mm_lookupmask_ps + (long)((int)uVar102 >> 4) * 0x10);
  local_948 = prim;
LAB_00b06b92:
  if (uVar97 == 0) {
    return;
  }
  lVar101 = 0;
  if (uVar97 != 0) {
    for (; (uVar97 >> lVar101 & 1) == 0; lVar101 = lVar101 + 1) {
    }
  }
  uVar102 = *(uint *)(local_948 + 2);
  local_940 = (ulong)*(uint *)(local_948 + lVar101 * 4 + 6);
  pGVar19 = (context->scene->geometries).items[uVar102].ptr;
  uVar98 = (ulong)*(uint *)(*(long *)&pGVar19->field_0x58 +
                           local_940 *
                           pGVar19[1].super_RefCount.refCounter.super___atomic_base<unsigned_long>.
                           _M_i);
  fVar214 = (pGVar19->time_range).lower;
  fVar214 = pGVar19->fnumTimeSegments *
            ((*(float *)(ray + k * 4 + 0xe0) - fVar214) / ((pGVar19->time_range).upper - fVar214));
  auVar152 = vroundss_avx(ZEXT416((uint)fVar214),ZEXT416((uint)fVar214),9);
  auVar152 = vminss_avx(auVar152,ZEXT416((uint)(pGVar19->fnumTimeSegments + -1.0)));
  auVar152 = vmaxss_avx(ZEXT816(0) << 0x20,auVar152);
  fVar214 = fVar214 - auVar152._0_4_;
  _Var20 = pGVar19[4].super_RefCount.refCounter.super___atomic_base<unsigned_long>._M_i;
  lVar103 = (long)(int)auVar152._0_4_ * 0x38;
  lVar21 = *(long *)(_Var20 + 0x10 + lVar103);
  lVar22 = *(long *)(_Var20 + 0x38 + lVar103);
  lVar23 = *(long *)(_Var20 + 0x48 + lVar103);
  auVar152 = vshufps_avx(ZEXT416((uint)fVar214),ZEXT416((uint)fVar214),0);
  pfVar2 = (float *)(lVar22 + lVar23 * uVar98);
  fVar201 = auVar152._0_4_;
  fVar241 = auVar152._4_4_;
  fVar242 = auVar152._8_4_;
  fVar243 = auVar152._12_4_;
  lVar1 = uVar98 + 1;
  pfVar3 = (float *)(lVar22 + lVar23 * lVar1);
  p_Var24 = pGVar19[4].occlusionFilterN;
  auVar152 = vshufps_avx(ZEXT416((uint)(1.0 - fVar214)),ZEXT416((uint)(1.0 - fVar214)),0);
  pfVar4 = (float *)(*(long *)(_Var20 + lVar103) + lVar21 * uVar98);
  fVar109 = auVar152._0_4_;
  fVar239 = auVar152._4_4_;
  fVar203 = auVar152._8_4_;
  fVar240 = auVar152._12_4_;
  pfVar5 = (float *)(*(long *)(_Var20 + lVar103) + lVar21 * lVar1);
  pfVar6 = (float *)(*(long *)(p_Var24 + lVar103 + 0x38) +
                    uVar98 * *(long *)(p_Var24 + lVar103 + 0x48));
  pfVar7 = (float *)(*(long *)(p_Var24 + lVar103 + 0x38) +
                    *(long *)(p_Var24 + lVar103 + 0x48) * lVar1);
  pfVar8 = (float *)(*(long *)(p_Var24 + lVar103) + *(long *)(p_Var24 + lVar103 + 0x10) * uVar98);
  auVar151._0_4_ = fVar109 * *pfVar4 + fVar201 * *pfVar2;
  auVar151._4_4_ = fVar239 * pfVar4[1] + fVar241 * pfVar2[1];
  auVar151._8_4_ = fVar203 * pfVar4[2] + fVar242 * pfVar2[2];
  auVar151._12_4_ = fVar240 * pfVar4[3] + fVar243 * pfVar2[3];
  pfVar2 = (float *)(*(long *)(p_Var24 + lVar103) + *(long *)(p_Var24 + lVar103 + 0x10) * lVar1);
  auVar183._0_4_ = fVar109 * *pfVar5 + fVar201 * *pfVar3;
  auVar183._4_4_ = fVar239 * pfVar5[1] + fVar241 * pfVar3[1];
  auVar183._8_4_ = fVar203 * pfVar5[2] + fVar242 * pfVar3[2];
  auVar183._12_4_ = fVar240 * pfVar5[3] + fVar243 * pfVar3[3];
  auVar152 = vinsertps_avx(ZEXT416(*(uint *)(ray + k * 4)),ZEXT416(*(uint *)(ray + k * 4 + 0x20)),
                           0x1c);
  auVar32 = vinsertps_avx(auVar152,ZEXT416(*(uint *)(ray + k * 4 + 0x40)),0x28);
  fVar214 = *(float *)(ray + k * 4 + 0x80);
  auVar396._4_4_ = fVar214;
  auVar396._0_4_ = fVar214;
  auVar396._8_4_ = fVar214;
  auVar396._12_4_ = fVar214;
  fStack_ad0 = fVar214;
  _local_ae0 = auVar396;
  fStack_acc = fVar214;
  fStack_ac8 = fVar214;
  fStack_ac4 = fVar214;
  fVar302 = *(float *)(ray + k * 4 + 0xa0);
  auVar415._4_4_ = fVar302;
  auVar415._0_4_ = fVar302;
  auVar415._8_4_ = fVar302;
  auVar415._12_4_ = fVar302;
  fStack_7f0 = fVar302;
  _local_800 = auVar415;
  fStack_7ec = fVar302;
  fStack_7e8 = fVar302;
  fStack_7e4 = fVar302;
  auVar152 = vunpcklps_avx(auVar396,auVar415);
  fVar238 = *(float *)(ray + k * 4 + 0xc0);
  auVar433._4_4_ = fVar238;
  auVar433._0_4_ = fVar238;
  auVar433._8_4_ = fVar238;
  auVar433._12_4_ = fVar238;
  fStack_990 = fVar238;
  _local_9a0 = auVar433;
  fStack_98c = fVar238;
  fStack_988 = fVar238;
  fStack_984 = fVar238;
  _local_a70 = vinsertps_avx(auVar152,auVar433,0x28);
  auVar247._0_4_ = auVar151._0_4_ + (fVar109 * *pfVar8 + fVar201 * *pfVar6) * 0.33333334;
  auVar247._4_4_ = auVar151._4_4_ + (fVar239 * pfVar8[1] + fVar241 * pfVar6[1]) * 0.33333334;
  auVar247._8_4_ = auVar151._8_4_ + (fVar203 * pfVar8[2] + fVar242 * pfVar6[2]) * 0.33333334;
  auVar247._12_4_ = auVar151._12_4_ + (fVar240 * pfVar8[3] + fVar243 * pfVar6[3]) * 0.33333334;
  auVar111._0_4_ = (fVar109 * *pfVar2 + fVar201 * *pfVar7) * 0.33333334;
  auVar111._4_4_ = (fVar239 * pfVar2[1] + fVar241 * pfVar7[1]) * 0.33333334;
  auVar111._8_4_ = (fVar203 * pfVar2[2] + fVar242 * pfVar7[2]) * 0.33333334;
  auVar111._12_4_ = (fVar240 * pfVar2[3] + fVar243 * pfVar7[3]) * 0.33333334;
  auVar37 = vsubps_avx(auVar183,auVar111);
  auVar112._0_4_ = (auVar183._0_4_ + auVar151._0_4_ + auVar247._0_4_ + auVar37._0_4_) * 0.25;
  auVar112._4_4_ = (auVar183._4_4_ + auVar151._4_4_ + auVar247._4_4_ + auVar37._4_4_) * 0.25;
  auVar112._8_4_ = (auVar183._8_4_ + auVar151._8_4_ + auVar247._8_4_ + auVar37._8_4_) * 0.25;
  auVar112._12_4_ = (auVar183._12_4_ + auVar151._12_4_ + auVar247._12_4_ + auVar37._12_4_) * 0.25;
  auVar152 = vsubps_avx(auVar112,auVar32);
  auVar152 = vdpps_avx(auVar152,_local_a70,0x7f);
  local_a80 = vdpps_avx(_local_a70,_local_a70,0x7f);
  auVar36 = vrcpss_avx(local_a80,local_a80);
  fVar109 = auVar152._0_4_ * auVar36._0_4_ * (2.0 - local_a80._0_4_ * auVar36._0_4_);
  auVar36 = vshufps_avx(ZEXT416((uint)fVar109),ZEXT416((uint)fVar109),0);
  auVar216._0_4_ = auVar32._0_4_ + local_a70._0_4_ * auVar36._0_4_;
  auVar216._4_4_ = auVar32._4_4_ + local_a70._4_4_ * auVar36._4_4_;
  auVar216._8_4_ = auVar32._8_4_ + local_a70._8_4_ * auVar36._8_4_;
  auVar216._12_4_ = auVar32._12_4_ + local_a70._12_4_ * auVar36._12_4_;
  auVar152 = vblendps_avx(auVar216,_DAT_01f45a50,8);
  auVar38 = vsubps_avx(auVar151,auVar152);
  auVar37 = vsubps_avx(auVar37,auVar152);
  auVar222 = vsubps_avx(auVar247,auVar152);
  auVar307 = vsubps_avx(auVar183,auVar152);
  auVar152 = vshufps_avx(auVar38,auVar38,0);
  local_360._16_16_ = auVar152;
  local_360._0_16_ = auVar152;
  auVar152 = vshufps_avx(auVar38,auVar38,0x55);
  register0x00001250 = auVar152;
  _local_1e0 = auVar152;
  auVar32 = vshufps_avx(auVar38,auVar38,0xaa);
  auVar152 = vshufps_avx(auVar38,auVar38,0xff);
  local_8e0._16_16_ = auVar152;
  local_8e0._0_16_ = auVar152;
  auVar405 = ZEXT3264(local_8e0);
  auVar152 = vshufps_avx(auVar222,auVar222,0);
  auVar311._16_16_ = auVar152;
  auVar311._0_16_ = auVar152;
  auVar152 = vshufps_avx(auVar222,auVar222,0x55);
  local_aa0._16_16_ = auVar152;
  local_aa0._0_16_ = auVar152;
  auVar152 = vshufps_avx(auVar222,auVar222,0xaa);
  local_b60._16_16_ = auVar152;
  local_b60._0_16_ = auVar152;
  _local_9c0 = auVar222;
  auVar152 = vshufps_avx(auVar222,auVar222,0xff);
  local_a20._16_16_ = auVar152;
  local_a20._0_16_ = auVar152;
  auVar152 = vshufps_avx(auVar37,auVar37,0);
  local_380._16_16_ = auVar152;
  local_380._0_16_ = auVar152;
  auVar152 = vshufps_avx(auVar37,auVar37,0x55);
  local_3a0._16_16_ = auVar152;
  local_3a0._0_16_ = auVar152;
  auVar152 = vshufps_avx(auVar37,auVar37,0xaa);
  register0x00001290 = auVar152;
  _local_200 = auVar152;
  auVar152 = vshufps_avx(auVar37,auVar37,0xff);
  auVar316 = ZEXT3264(local_a20);
  register0x00001290 = auVar152;
  _local_220 = auVar152;
  auVar152 = vshufps_avx(auVar307,auVar307,0);
  register0x00001290 = auVar152;
  _local_240 = auVar152;
  auVar152 = vshufps_avx(auVar307,auVar307,0x55);
  register0x00001290 = auVar152;
  _local_260 = auVar152;
  auVar152 = vshufps_avx(auVar307,auVar307,0xaa);
  register0x00001290 = auVar152;
  _local_280 = auVar152;
  _local_9e0 = auVar307;
  auVar152 = vshufps_avx(auVar307,auVar307,0xff);
  register0x00001290 = auVar152;
  _local_2a0 = auVar152;
  auVar152 = ZEXT416((uint)(fVar214 * fVar214 + fVar302 * fVar302 + fVar238 * fVar238));
  auVar152 = vshufps_avx(auVar152,auVar152,0);
  local_2c0._16_16_ = auVar152;
  local_2c0._0_16_ = auVar152;
  fVar214 = *(float *)(ray + k * 4 + 0x60);
  local_960 = ZEXT416((uint)fVar109);
  auVar344 = ZEXT3264(local_b60);
  auVar152 = vshufps_avx(ZEXT416((uint)(fVar214 - fVar109)),ZEXT416((uint)(fVar214 - fVar109)),0);
  local_3c0._16_16_ = auVar152;
  local_3c0._0_16_ = auVar152;
  auVar152 = vpshufd_avx(ZEXT416(uVar102),0);
  local_5c0._16_16_ = auVar152;
  local_5c0._0_16_ = auVar152;
  auVar152 = vpshufd_avx(ZEXT416(*(uint *)(local_948 + lVar101 * 4 + 6)),0);
  local_5e0._16_16_ = auVar152;
  local_5e0._0_16_ = auVar152;
  register0x00001210 = auVar36;
  _local_920 = auVar36;
  uVar98 = 0;
  local_d24 = 1;
  auVar122._8_4_ = 0x7fffffff;
  auVar122._0_8_ = 0x7fffffff7fffffff;
  auVar122._12_4_ = 0x7fffffff;
  auVar122._16_4_ = 0x7fffffff;
  auVar122._20_4_ = 0x7fffffff;
  auVar122._24_4_ = 0x7fffffff;
  auVar122._28_4_ = 0x7fffffff;
  local_5a0 = vandps_avx(local_2c0,auVar122);
  auVar152 = vsqrtss_avx(local_a80,local_a80);
  auVar36 = vsqrtss_avx(local_a80,local_a80);
  auVar373 = ZEXT3264(local_aa0);
  local_750 = ZEXT816(0x3f80000000000000);
  local_580 = auVar311;
  do {
    auVar233._8_4_ = 0x3f800000;
    auVar233._0_8_ = 0x3f8000003f800000;
    auVar233._12_4_ = 0x3f800000;
    auVar233._16_4_ = 0x3f800000;
    auVar233._20_4_ = 0x3f800000;
    auVar233._24_4_ = 0x3f800000;
    auVar233._28_4_ = 0x3f800000;
    auVar222 = vmovshdup_avx(local_750);
    auVar39 = vsubps_avx(auVar222,local_750);
    auVar222 = vshufps_avx(local_750,local_750,0);
    local_860._16_16_ = auVar222;
    local_860._0_16_ = auVar222;
    auVar307 = vshufps_avx(auVar39,auVar39,0);
    local_880._16_16_ = auVar307;
    local_880._0_16_ = auVar307;
    fVar149 = auVar307._0_4_;
    fVar178 = auVar307._4_4_;
    fVar179 = auVar307._8_4_;
    fVar180 = auVar307._12_4_;
    fVar107 = auVar222._0_4_;
    auVar168._0_4_ = fVar107 + fVar149 * 0.0;
    fVar140 = auVar222._4_4_;
    auVar168._4_4_ = fVar140 + fVar178 * 0.14285715;
    fVar142 = auVar222._8_4_;
    auVar168._8_4_ = fVar142 + fVar179 * 0.2857143;
    fVar144 = auVar222._12_4_;
    auVar168._12_4_ = fVar144 + fVar180 * 0.42857146;
    auVar168._16_4_ = fVar107 + fVar149 * 0.5714286;
    auVar168._20_4_ = fVar140 + fVar178 * 0.71428573;
    auVar168._24_4_ = fVar142 + fVar179 * 0.8571429;
    auVar168._28_4_ = fVar144 + fVar180;
    auVar189 = vsubps_avx(auVar233,auVar168);
    fVar241 = auVar311._28_4_;
    fVar302 = auVar189._0_4_;
    fVar238 = auVar189._4_4_;
    fVar109 = auVar189._8_4_;
    fVar239 = auVar189._12_4_;
    fVar203 = auVar189._16_4_;
    fVar240 = auVar189._20_4_;
    fVar201 = auVar189._24_4_;
    fVar390 = auVar32._12_4_;
    fVar269 = auVar316._28_4_ + fVar241 + auVar344._28_4_ + 1.0 + 1.0;
    fVar303 = local_380._0_4_ * auVar168._0_4_ + auVar311._0_4_ * fVar302;
    fVar317 = local_380._4_4_ * auVar168._4_4_ + auVar311._4_4_ * fVar238;
    fVar320 = local_380._8_4_ * auVar168._8_4_ + auVar311._8_4_ * fVar109;
    fVar323 = local_380._12_4_ * auVar168._12_4_ + auVar311._12_4_ * fVar239;
    fVar326 = local_380._16_4_ * auVar168._16_4_ + auVar311._16_4_ * fVar203;
    fVar329 = local_380._20_4_ * auVar168._20_4_ + auVar311._20_4_ * fVar240;
    fVar332 = local_380._24_4_ * auVar168._24_4_ + auVar311._24_4_ * fVar201;
    fVar242 = local_3a0._0_4_ * auVar168._0_4_ + auVar373._0_4_ * fVar302;
    fVar243 = local_3a0._4_4_ * auVar168._4_4_ + auVar373._4_4_ * fVar238;
    fVar245 = local_3a0._8_4_ * auVar168._8_4_ + auVar373._8_4_ * fVar109;
    fVar244 = local_3a0._12_4_ * auVar168._12_4_ + auVar373._12_4_ * fVar239;
    fVar266 = local_3a0._16_4_ * auVar168._16_4_ + auVar373._16_4_ * fVar203;
    fVar267 = local_3a0._20_4_ * auVar168._20_4_ + auVar373._20_4_ * fVar240;
    fVar268 = local_3a0._24_4_ * auVar168._24_4_ + auVar373._24_4_ * fVar201;
    fVar270 = (float)local_200._0_4_ * auVar168._0_4_ + auVar344._0_4_ * fVar302;
    fVar272 = (float)local_200._4_4_ * auVar168._4_4_ + auVar344._4_4_ * fVar238;
    fVar290 = fStack_1f8 * auVar168._8_4_ + auVar344._8_4_ * fVar109;
    fVar292 = fStack_1f4 * auVar168._12_4_ + auVar344._12_4_ * fVar239;
    fVar294 = fStack_1f0 * auVar168._16_4_ + auVar344._16_4_ * fVar203;
    fVar296 = fStack_1ec * auVar168._20_4_ + auVar344._20_4_ * fVar240;
    fVar298 = fStack_1e8 * auVar168._24_4_ + auVar344._24_4_ * fVar201;
    fVar300 = (float)local_220._0_4_ * auVar168._0_4_ + auVar316._0_4_ * fVar302;
    fVar291 = (float)local_220._4_4_ * auVar168._4_4_ + auVar316._4_4_ * fVar238;
    fVar293 = fStack_218 * auVar168._8_4_ + auVar316._8_4_ * fVar109;
    fVar295 = fStack_214 * auVar168._12_4_ + auVar316._12_4_ * fVar239;
    fVar297 = fStack_210 * auVar168._16_4_ + auVar316._16_4_ * fVar203;
    fVar299 = fStack_20c * auVar168._20_4_ + auVar316._20_4_ * fVar240;
    fVar301 = fStack_208 * auVar168._24_4_ + auVar316._24_4_ * fVar201;
    fVar432 = fVar390 + fVar241;
    fVar412 = auVar405._28_4_ + fVar390;
    auVar352._0_4_ =
         fVar302 * (auVar311._0_4_ * auVar168._0_4_ + local_360._0_4_ * fVar302) +
         auVar168._0_4_ * fVar303;
    auVar352._4_4_ =
         fVar238 * (auVar311._4_4_ * auVar168._4_4_ + local_360._4_4_ * fVar238) +
         auVar168._4_4_ * fVar317;
    auVar352._8_4_ =
         fVar109 * (auVar311._8_4_ * auVar168._8_4_ + local_360._8_4_ * fVar109) +
         auVar168._8_4_ * fVar320;
    auVar352._12_4_ =
         fVar239 * (auVar311._12_4_ * auVar168._12_4_ + local_360._12_4_ * fVar239) +
         auVar168._12_4_ * fVar323;
    auVar352._16_4_ =
         fVar203 * (auVar311._16_4_ * auVar168._16_4_ + local_360._16_4_ * fVar203) +
         auVar168._16_4_ * fVar326;
    auVar352._20_4_ =
         fVar240 * (auVar311._20_4_ * auVar168._20_4_ + local_360._20_4_ * fVar240) +
         auVar168._20_4_ * fVar329;
    auVar352._24_4_ =
         fVar201 * (auVar311._24_4_ * auVar168._24_4_ + local_360._24_4_ * fVar201) +
         auVar168._24_4_ * fVar332;
    auVar352._28_4_ = local_380._28_4_ + fVar390;
    auVar371._0_4_ =
         fVar302 * (auVar373._0_4_ * auVar168._0_4_ + fVar302 * (float)local_1e0._0_4_) +
         auVar168._0_4_ * fVar242;
    auVar371._4_4_ =
         fVar238 * (auVar373._4_4_ * auVar168._4_4_ + fVar238 * (float)local_1e0._4_4_) +
         auVar168._4_4_ * fVar243;
    auVar371._8_4_ =
         fVar109 * (auVar373._8_4_ * auVar168._8_4_ + fVar109 * fStack_1d8) +
         auVar168._8_4_ * fVar245;
    auVar371._12_4_ =
         fVar239 * (auVar373._12_4_ * auVar168._12_4_ + fVar239 * fStack_1d4) +
         auVar168._12_4_ * fVar244;
    auVar371._16_4_ =
         fVar203 * (auVar373._16_4_ * auVar168._16_4_ + fVar203 * fStack_1d0) +
         auVar168._16_4_ * fVar266;
    auVar371._20_4_ =
         fVar240 * (auVar373._20_4_ * auVar168._20_4_ + fVar240 * fStack_1cc) +
         auVar168._20_4_ * fVar267;
    auVar371._24_4_ =
         fVar201 * (auVar373._24_4_ * auVar168._24_4_ + fVar201 * fStack_1c8) +
         auVar168._24_4_ * fVar268;
    auVar371._28_4_ = local_3a0._28_4_ + fVar390;
    auVar384._0_4_ =
         fVar302 * (auVar344._0_4_ * auVar168._0_4_ + auVar32._0_4_ * fVar302) +
         auVar168._0_4_ * fVar270;
    auVar384._4_4_ =
         fVar238 * (auVar344._4_4_ * auVar168._4_4_ + auVar32._4_4_ * fVar238) +
         auVar168._4_4_ * fVar272;
    auVar384._8_4_ =
         fVar109 * (auVar344._8_4_ * auVar168._8_4_ + auVar32._8_4_ * fVar109) +
         auVar168._8_4_ * fVar290;
    auVar384._12_4_ =
         fVar239 * (auVar344._12_4_ * auVar168._12_4_ + fVar390 * fVar239) +
         auVar168._12_4_ * fVar292;
    auVar384._16_4_ =
         fVar203 * (auVar344._16_4_ * auVar168._16_4_ + auVar32._0_4_ * fVar203) +
         auVar168._16_4_ * fVar294;
    auVar384._20_4_ =
         fVar240 * (auVar344._20_4_ * auVar168._20_4_ + auVar32._4_4_ * fVar240) +
         auVar168._20_4_ * fVar296;
    auVar384._24_4_ =
         fVar201 * (auVar344._24_4_ * auVar168._24_4_ + auVar32._8_4_ * fVar201) +
         auVar168._24_4_ * fVar298;
    auVar384._28_4_ = fStack_1e4 + fVar390;
    auVar340._0_4_ =
         auVar168._0_4_ * fVar300 +
         fVar302 * (auVar316._0_4_ * auVar168._0_4_ + auVar405._0_4_ * fVar302);
    auVar340._4_4_ =
         auVar168._4_4_ * fVar291 +
         fVar238 * (auVar316._4_4_ * auVar168._4_4_ + auVar405._4_4_ * fVar238);
    auVar340._8_4_ =
         auVar168._8_4_ * fVar293 +
         fVar109 * (auVar316._8_4_ * auVar168._8_4_ + auVar405._8_4_ * fVar109);
    auVar340._12_4_ =
         auVar168._12_4_ * fVar295 +
         fVar239 * (auVar316._12_4_ * auVar168._12_4_ + auVar405._12_4_ * fVar239);
    auVar340._16_4_ =
         auVar168._16_4_ * fVar297 +
         fVar203 * (auVar316._16_4_ * auVar168._16_4_ + auVar405._16_4_ * fVar203);
    auVar340._20_4_ =
         auVar168._20_4_ * fVar299 +
         fVar240 * (auVar316._20_4_ * auVar168._20_4_ + auVar405._20_4_ * fVar240);
    auVar340._24_4_ =
         auVar168._24_4_ * fVar301 +
         fVar201 * (auVar316._24_4_ * auVar168._24_4_ + auVar405._24_4_ * fVar201);
    auVar340._28_4_ = fStack_1e4 + fStack_204;
    auVar123._0_4_ =
         (auVar168._0_4_ * (float)local_240._0_4_ + local_380._0_4_ * fVar302) * auVar168._0_4_ +
         fVar302 * fVar303;
    auVar123._4_4_ =
         (auVar168._4_4_ * (float)local_240._4_4_ + local_380._4_4_ * fVar238) * auVar168._4_4_ +
         fVar238 * fVar317;
    auVar123._8_4_ =
         (auVar168._8_4_ * fStack_238 + local_380._8_4_ * fVar109) * auVar168._8_4_ +
         fVar109 * fVar320;
    auVar123._12_4_ =
         (auVar168._12_4_ * fStack_234 + local_380._12_4_ * fVar239) * auVar168._12_4_ +
         fVar239 * fVar323;
    auVar123._16_4_ =
         (auVar168._16_4_ * fStack_230 + local_380._16_4_ * fVar203) * auVar168._16_4_ +
         fVar203 * fVar326;
    auVar123._20_4_ =
         (auVar168._20_4_ * fStack_22c + local_380._20_4_ * fVar240) * auVar168._20_4_ +
         fVar240 * fVar329;
    auVar123._24_4_ =
         (auVar168._24_4_ * fStack_228 + local_380._24_4_ * fVar201) * auVar168._24_4_ +
         fVar201 * fVar332;
    auVar123._28_4_ = fStack_1e4 + fVar269 + auVar316._28_4_;
    auVar234._0_4_ =
         (auVar168._0_4_ * (float)local_260._0_4_ + local_3a0._0_4_ * fVar302) * auVar168._0_4_ +
         fVar302 * fVar242;
    auVar234._4_4_ =
         (auVar168._4_4_ * (float)local_260._4_4_ + local_3a0._4_4_ * fVar238) * auVar168._4_4_ +
         fVar238 * fVar243;
    auVar234._8_4_ =
         (auVar168._8_4_ * fStack_258 + local_3a0._8_4_ * fVar109) * auVar168._8_4_ +
         fVar109 * fVar245;
    auVar234._12_4_ =
         (auVar168._12_4_ * fStack_254 + local_3a0._12_4_ * fVar239) * auVar168._12_4_ +
         fVar239 * fVar244;
    auVar234._16_4_ =
         (auVar168._16_4_ * fStack_250 + local_3a0._16_4_ * fVar203) * auVar168._16_4_ +
         fVar203 * fVar266;
    auVar234._20_4_ =
         (auVar168._20_4_ * fStack_24c + local_3a0._20_4_ * fVar240) * auVar168._20_4_ +
         fVar240 * fVar267;
    auVar234._24_4_ =
         (auVar168._24_4_ * fStack_248 + local_3a0._24_4_ * fVar201) * auVar168._24_4_ +
         fVar201 * fVar268;
    auVar234._28_4_ = fStack_1e4 + fVar269 + 1.0;
    auVar259._0_4_ =
         (auVar168._0_4_ * (float)local_280._0_4_ + (float)local_200._0_4_ * fVar302) *
         auVar168._0_4_ + fVar302 * fVar270;
    auVar259._4_4_ =
         (auVar168._4_4_ * (float)local_280._4_4_ + (float)local_200._4_4_ * fVar238) *
         auVar168._4_4_ + fVar238 * fVar272;
    auVar259._8_4_ =
         (auVar168._8_4_ * fStack_278 + fStack_1f8 * fVar109) * auVar168._8_4_ + fVar109 * fVar290;
    auVar259._12_4_ =
         (auVar168._12_4_ * fStack_274 + fStack_1f4 * fVar239) * auVar168._12_4_ + fVar239 * fVar292
    ;
    auVar259._16_4_ =
         (auVar168._16_4_ * fStack_270 + fStack_1f0 * fVar203) * auVar168._16_4_ + fVar203 * fVar294
    ;
    auVar259._20_4_ =
         (auVar168._20_4_ * fStack_26c + fStack_1ec * fVar240) * auVar168._20_4_ + fVar240 * fVar296
    ;
    auVar259._24_4_ =
         (auVar168._24_4_ * fStack_268 + fStack_1e8 * fVar201) * auVar168._24_4_ + fVar201 * fVar298
    ;
    auVar259._28_4_ = fVar412 + fVar241 + 1.0;
    auVar280._0_4_ =
         (auVar168._0_4_ * (float)local_2a0._0_4_ + (float)local_220._0_4_ * fVar302) *
         auVar168._0_4_ + fVar302 * fVar300;
    auVar280._4_4_ =
         (auVar168._4_4_ * (float)local_2a0._4_4_ + (float)local_220._4_4_ * fVar238) *
         auVar168._4_4_ + fVar238 * fVar291;
    auVar280._8_4_ =
         (auVar168._8_4_ * fStack_298 + fStack_218 * fVar109) * auVar168._8_4_ + fVar109 * fVar293;
    auVar280._12_4_ =
         (auVar168._12_4_ * fStack_294 + fStack_214 * fVar239) * auVar168._12_4_ + fVar239 * fVar295
    ;
    auVar280._16_4_ =
         (auVar168._16_4_ * fStack_290 + fStack_210 * fVar203) * auVar168._16_4_ + fVar203 * fVar297
    ;
    auVar280._20_4_ =
         (auVar168._20_4_ * fStack_28c + fStack_20c * fVar240) * auVar168._20_4_ + fVar240 * fVar299
    ;
    auVar280._24_4_ =
         (auVar168._24_4_ * fStack_288 + fStack_208 * fVar201) * auVar168._24_4_ + fVar201 * fVar301
    ;
    auVar280._28_4_ = fVar432 + fVar390 + fVar241;
    fVar304 = auVar352._0_4_ * fVar302 + auVar168._0_4_ * auVar123._0_4_;
    fVar318 = auVar352._4_4_ * fVar238 + auVar168._4_4_ * auVar123._4_4_;
    fVar321 = auVar352._8_4_ * fVar109 + auVar168._8_4_ * auVar123._8_4_;
    fVar324 = auVar352._12_4_ * fVar239 + auVar168._12_4_ * auVar123._12_4_;
    fVar327 = auVar352._16_4_ * fVar203 + auVar168._16_4_ * auVar123._16_4_;
    fVar330 = auVar352._20_4_ * fVar240 + auVar168._20_4_ * auVar123._20_4_;
    fVar333 = auVar352._24_4_ * fVar201 + auVar168._24_4_ * auVar123._24_4_;
    fVar335 = fVar432 + fStack_1e4;
    auVar435._0_4_ = auVar371._0_4_ * fVar302 + auVar168._0_4_ * auVar234._0_4_;
    auVar435._4_4_ = auVar371._4_4_ * fVar238 + auVar168._4_4_ * auVar234._4_4_;
    auVar435._8_4_ = auVar371._8_4_ * fVar109 + auVar168._8_4_ * auVar234._8_4_;
    auVar435._12_4_ = auVar371._12_4_ * fVar239 + auVar168._12_4_ * auVar234._12_4_;
    auVar435._16_4_ = auVar371._16_4_ * fVar203 + auVar168._16_4_ * auVar234._16_4_;
    auVar435._20_4_ = auVar371._20_4_ * fVar240 + auVar168._20_4_ * auVar234._20_4_;
    auVar435._24_4_ = auVar371._24_4_ * fVar201 + auVar168._24_4_ * auVar234._24_4_;
    auVar435._28_4_ = fStack_1e4 + fVar412;
    local_2e0._0_4_ = auVar384._0_4_ * fVar302 + auVar168._0_4_ * auVar259._0_4_;
    local_2e0._4_4_ = auVar384._4_4_ * fVar238 + auVar168._4_4_ * auVar259._4_4_;
    local_2e0._8_4_ = auVar384._8_4_ * fVar109 + auVar168._8_4_ * auVar259._8_4_;
    local_2e0._12_4_ = auVar384._12_4_ * fVar239 + auVar168._12_4_ * auVar259._12_4_;
    local_2e0._16_4_ = auVar384._16_4_ * fVar203 + auVar168._16_4_ * auVar259._16_4_;
    local_2e0._20_4_ = auVar384._20_4_ * fVar240 + auVar168._20_4_ * auVar259._20_4_;
    local_2e0._24_4_ = auVar384._24_4_ * fVar201 + auVar168._24_4_ * auVar259._24_4_;
    local_2e0._28_4_ = fVar412 + fStack_1e4;
    local_b80._0_4_ = auVar39._0_4_;
    auVar312._0_4_ = fVar302 * auVar340._0_4_ + auVar168._0_4_ * auVar280._0_4_;
    auVar312._4_4_ = fVar238 * auVar340._4_4_ + auVar168._4_4_ * auVar280._4_4_;
    auVar312._8_4_ = fVar109 * auVar340._8_4_ + auVar168._8_4_ * auVar280._8_4_;
    auVar312._12_4_ = fVar239 * auVar340._12_4_ + auVar168._12_4_ * auVar280._12_4_;
    auVar312._16_4_ = fVar203 * auVar340._16_4_ + auVar168._16_4_ * auVar280._16_4_;
    auVar312._20_4_ = fVar240 * auVar340._20_4_ + auVar168._20_4_ * auVar280._20_4_;
    auVar312._24_4_ = fVar201 * auVar340._24_4_ + auVar168._24_4_ * auVar280._24_4_;
    auVar312._28_4_ = auVar189._28_4_ + auVar168._28_4_;
    auVar189 = vsubps_avx(auVar123,auVar352);
    auVar260 = vsubps_avx(auVar234,auVar371);
    auVar130 = vsubps_avx(auVar259,auVar384);
    auVar26 = vsubps_avx(auVar280,auVar340);
    auVar222 = vshufps_avx(ZEXT416((uint)((float)local_b80._0_4_ * 0.04761905)),
                           ZEXT416((uint)((float)local_b80._0_4_ * 0.04761905)),0);
    fVar272 = auVar222._0_4_;
    fVar395 = fVar272 * auVar189._0_4_ * 3.0;
    fVar290 = auVar222._4_4_;
    fVar406 = fVar290 * auVar189._4_4_ * 3.0;
    auVar44._4_4_ = fVar406;
    auVar44._0_4_ = fVar395;
    fVar300 = auVar222._8_4_;
    fVar407 = fVar300 * auVar189._8_4_ * 3.0;
    auVar44._8_4_ = fVar407;
    fVar266 = auVar222._12_4_;
    fVar408 = fVar266 * auVar189._12_4_ * 3.0;
    auVar44._12_4_ = fVar408;
    fVar409 = fVar272 * auVar189._16_4_ * 3.0;
    auVar44._16_4_ = fVar409;
    fVar410 = fVar290 * auVar189._20_4_ * 3.0;
    auVar44._20_4_ = fVar410;
    fVar411 = fVar300 * auVar189._24_4_ * 3.0;
    auVar44._24_4_ = fVar411;
    auVar44._28_4_ = fVar412;
    fVar380 = fVar272 * auVar260._0_4_ * 3.0;
    fVar388 = fVar290 * auVar260._4_4_ * 3.0;
    local_a00._4_4_ = fVar388;
    local_a00._0_4_ = fVar380;
    fVar389 = fVar300 * auVar260._8_4_ * 3.0;
    local_a00._8_4_ = fVar389;
    fVar391 = fVar266 * auVar260._12_4_ * 3.0;
    local_a00._12_4_ = fVar391;
    fVar392 = fVar272 * auVar260._16_4_ * 3.0;
    local_a00._16_4_ = fVar392;
    fVar393 = fVar290 * auVar260._20_4_ * 3.0;
    local_a00._20_4_ = fVar393;
    fVar394 = fVar300 * auVar260._24_4_ * 3.0;
    local_a00._24_4_ = fVar394;
    local_a00._28_4_ = auVar384._28_4_;
    fVar413 = fVar272 * auVar130._0_4_ * 3.0;
    fVar420 = fVar290 * auVar130._4_4_ * 3.0;
    auVar45._4_4_ = fVar420;
    auVar45._0_4_ = fVar413;
    fVar422 = fVar300 * auVar130._8_4_ * 3.0;
    auVar45._8_4_ = fVar422;
    fVar424 = fVar266 * auVar130._12_4_ * 3.0;
    auVar45._12_4_ = fVar424;
    fVar426 = fVar272 * auVar130._16_4_ * 3.0;
    auVar45._16_4_ = fVar426;
    fVar428 = fVar290 * auVar130._20_4_ * 3.0;
    auVar45._20_4_ = fVar428;
    fVar430 = fVar300 * auVar130._24_4_ * 3.0;
    auVar45._24_4_ = fVar430;
    auVar45._28_4_ = fVar432;
    fVar240 = fVar272 * auVar26._0_4_ * 3.0;
    fVar201 = fVar290 * auVar26._4_4_ * 3.0;
    auVar46._4_4_ = fVar201;
    auVar46._0_4_ = fVar240;
    fVar244 = fVar300 * auVar26._8_4_ * 3.0;
    auVar46._8_4_ = fVar244;
    fVar266 = fVar266 * auVar26._12_4_ * 3.0;
    auVar46._12_4_ = fVar266;
    fVar272 = fVar272 * auVar26._16_4_ * 3.0;
    auVar46._16_4_ = fVar272;
    fVar290 = fVar290 * auVar26._20_4_ * 3.0;
    auVar46._20_4_ = fVar290;
    fVar300 = fVar300 * auVar26._24_4_ * 3.0;
    auVar46._24_4_ = fVar300;
    auVar46._28_4_ = auVar260._28_4_;
    auVar189 = vperm2f128_avx(auVar435,auVar435,1);
    auVar189 = vshufps_avx(auVar189,auVar435,0x30);
    auVar27 = vshufps_avx(auVar435,auVar189,0x29);
    auVar189 = vperm2f128_avx(local_2e0,local_2e0,1);
    auVar189 = vshufps_avx(auVar189,local_2e0,0x30);
    auVar28 = vshufps_avx(local_2e0,auVar189,0x29);
    auVar130 = vsubps_avx(auVar312,auVar46);
    auVar189 = vperm2f128_avx(auVar130,auVar130,1);
    auVar189 = vshufps_avx(auVar189,auVar130,0x30);
    auVar29 = vshufps_avx(auVar130,auVar189,0x29);
    auVar42 = vsubps_avx(auVar27,auVar435);
    local_300 = vsubps_avx(auVar28,local_2e0);
    fVar238 = auVar42._0_4_;
    fVar241 = auVar42._4_4_;
    auVar47._4_4_ = fVar420 * fVar241;
    auVar47._0_4_ = fVar413 * fVar238;
    fVar267 = auVar42._8_4_;
    auVar47._8_4_ = fVar422 * fVar267;
    fVar292 = auVar42._12_4_;
    auVar47._12_4_ = fVar424 * fVar292;
    fVar293 = auVar42._16_4_;
    auVar47._16_4_ = fVar426 * fVar293;
    fVar317 = auVar42._20_4_;
    auVar47._20_4_ = fVar428 * fVar317;
    fVar390 = auVar42._24_4_;
    auVar47._24_4_ = fVar430 * fVar390;
    auVar47._28_4_ = auVar130._28_4_;
    fVar109 = local_300._0_4_;
    fVar242 = local_300._4_4_;
    auVar48._4_4_ = fVar388 * fVar242;
    auVar48._0_4_ = fVar380 * fVar109;
    fVar268 = local_300._8_4_;
    auVar48._8_4_ = fVar389 * fVar268;
    fVar294 = local_300._12_4_;
    auVar48._12_4_ = fVar391 * fVar294;
    fVar295 = local_300._16_4_;
    auVar48._16_4_ = fVar392 * fVar295;
    fVar320 = local_300._20_4_;
    auVar48._20_4_ = fVar393 * fVar320;
    fVar33 = local_300._24_4_;
    auVar48._24_4_ = fVar394 * fVar33;
    auVar48._28_4_ = auVar189._28_4_;
    auVar31 = vsubps_avx(auVar48,auVar47);
    auVar92._4_4_ = fVar318;
    auVar92._0_4_ = fVar304;
    auVar92._8_4_ = fVar321;
    auVar92._12_4_ = fVar324;
    auVar92._16_4_ = fVar327;
    auVar92._20_4_ = fVar330;
    auVar92._24_4_ = fVar333;
    auVar92._28_4_ = fVar335;
    auVar189 = vperm2f128_avx(auVar92,auVar92,1);
    auVar189 = vshufps_avx(auVar189,auVar92,0x30);
    auVar30 = vshufps_avx(auVar92,auVar189,0x29);
    local_540 = vsubps_avx(auVar30,auVar92);
    auVar49._4_4_ = fVar406 * fVar242;
    auVar49._0_4_ = fVar395 * fVar109;
    auVar49._8_4_ = fVar407 * fVar268;
    auVar49._12_4_ = fVar408 * fVar294;
    auVar49._16_4_ = fVar409 * fVar295;
    auVar49._20_4_ = fVar410 * fVar320;
    auVar49._24_4_ = fVar411 * fVar33;
    auVar49._28_4_ = auVar30._28_4_;
    fVar239 = local_540._0_4_;
    fVar243 = local_540._4_4_;
    auVar50._4_4_ = fVar420 * fVar243;
    auVar50._0_4_ = fVar413 * fVar239;
    fVar269 = local_540._8_4_;
    auVar50._8_4_ = fVar422 * fVar269;
    fVar296 = local_540._12_4_;
    auVar50._12_4_ = fVar424 * fVar296;
    fVar297 = local_540._16_4_;
    auVar50._16_4_ = fVar426 * fVar297;
    fVar323 = local_540._20_4_;
    auVar50._20_4_ = fVar428 * fVar323;
    fVar34 = local_540._24_4_;
    auVar50._24_4_ = fVar430 * fVar34;
    auVar50._28_4_ = auVar352._28_4_;
    auVar43 = vsubps_avx(auVar50,auVar49);
    auVar51._4_4_ = fVar388 * fVar243;
    auVar51._0_4_ = fVar380 * fVar239;
    auVar51._8_4_ = fVar389 * fVar269;
    auVar51._12_4_ = fVar391 * fVar296;
    auVar51._16_4_ = fVar392 * fVar297;
    auVar51._20_4_ = fVar393 * fVar323;
    auVar51._24_4_ = fVar394 * fVar34;
    auVar51._28_4_ = auVar352._28_4_;
    auVar52._4_4_ = fVar406 * fVar241;
    auVar52._0_4_ = fVar395 * fVar238;
    auVar52._8_4_ = fVar407 * fVar267;
    auVar52._12_4_ = fVar408 * fVar292;
    auVar52._16_4_ = fVar409 * fVar293;
    auVar52._20_4_ = fVar410 * fVar317;
    auVar52._24_4_ = fVar411 * fVar390;
    auVar52._28_4_ = auVar371._28_4_;
    auVar120 = vsubps_avx(auVar52,auVar51);
    fVar302 = auVar120._28_4_;
    auVar235._0_4_ = fVar239 * fVar239 + fVar238 * fVar238 + fVar109 * fVar109;
    auVar235._4_4_ = fVar243 * fVar243 + fVar241 * fVar241 + fVar242 * fVar242;
    auVar235._8_4_ = fVar269 * fVar269 + fVar267 * fVar267 + fVar268 * fVar268;
    auVar235._12_4_ = fVar296 * fVar296 + fVar292 * fVar292 + fVar294 * fVar294;
    auVar235._16_4_ = fVar297 * fVar297 + fVar293 * fVar293 + fVar295 * fVar295;
    auVar235._20_4_ = fVar323 * fVar323 + fVar317 * fVar317 + fVar320 * fVar320;
    auVar235._24_4_ = fVar34 * fVar34 + fVar390 * fVar390 + fVar33 * fVar33;
    auVar235._28_4_ = fVar302 + fVar302 + auVar31._28_4_;
    auVar189 = vrcpps_avx(auVar235);
    fVar291 = auVar189._0_4_;
    fVar301 = auVar189._4_4_;
    auVar53._4_4_ = fVar301 * auVar235._4_4_;
    auVar53._0_4_ = fVar291 * auVar235._0_4_;
    fVar303 = auVar189._8_4_;
    auVar53._8_4_ = fVar303 * auVar235._8_4_;
    fVar329 = auVar189._12_4_;
    auVar53._12_4_ = fVar329 * auVar235._12_4_;
    fVar332 = auVar189._16_4_;
    auVar53._16_4_ = fVar332 * auVar235._16_4_;
    fVar355 = auVar189._20_4_;
    auVar53._20_4_ = fVar355 * auVar235._20_4_;
    fVar356 = auVar189._24_4_;
    auVar53._24_4_ = fVar356 * auVar235._24_4_;
    auVar53._28_4_ = auVar371._28_4_;
    auVar124._8_4_ = 0x3f800000;
    auVar124._0_8_ = 0x3f8000003f800000;
    auVar124._12_4_ = 0x3f800000;
    auVar124._16_4_ = 0x3f800000;
    auVar124._20_4_ = 0x3f800000;
    auVar124._24_4_ = 0x3f800000;
    auVar124._28_4_ = 0x3f800000;
    auVar121 = vsubps_avx(auVar124,auVar53);
    fVar291 = fVar291 + fVar291 * auVar121._0_4_;
    fVar301 = fVar301 + fVar301 * auVar121._4_4_;
    fVar303 = fVar303 + fVar303 * auVar121._8_4_;
    fVar329 = fVar329 + fVar329 * auVar121._12_4_;
    fVar332 = fVar332 + fVar332 * auVar121._16_4_;
    fVar355 = fVar355 + fVar355 * auVar121._20_4_;
    fVar356 = fVar356 + fVar356 * auVar121._24_4_;
    auVar130 = vperm2f128_avx(local_a00,local_a00,1);
    auVar130 = vshufps_avx(auVar130,local_a00,0x30);
    auVar130 = vshufps_avx(local_a00,auVar130,0x29);
    auVar26 = vperm2f128_avx(auVar45,auVar45,1);
    auVar26 = vshufps_avx(auVar26,auVar45,0x30);
    local_980 = vshufps_avx(auVar45,auVar26,0x29);
    fVar108 = local_980._0_4_;
    fVar141 = local_980._4_4_;
    auVar54._4_4_ = fVar141 * fVar241;
    auVar54._0_4_ = fVar108 * fVar238;
    fVar143 = local_980._8_4_;
    auVar54._8_4_ = fVar143 * fVar267;
    fVar145 = local_980._12_4_;
    auVar54._12_4_ = fVar145 * fVar292;
    fVar146 = local_980._16_4_;
    auVar54._16_4_ = fVar146 * fVar293;
    fVar147 = local_980._20_4_;
    auVar54._20_4_ = fVar147 * fVar317;
    fVar148 = local_980._24_4_;
    auVar54._24_4_ = fVar148 * fVar390;
    auVar54._28_4_ = auVar26._28_4_;
    fVar203 = auVar130._0_4_;
    fVar245 = auVar130._4_4_;
    auVar55._4_4_ = fVar242 * fVar245;
    auVar55._0_4_ = fVar109 * fVar203;
    fVar270 = auVar130._8_4_;
    auVar55._8_4_ = fVar268 * fVar270;
    fVar298 = auVar130._12_4_;
    auVar55._12_4_ = fVar294 * fVar298;
    fVar299 = auVar130._16_4_;
    auVar55._16_4_ = fVar295 * fVar299;
    fVar326 = auVar130._20_4_;
    auVar55._20_4_ = fVar320 * fVar326;
    fVar35 = auVar130._24_4_;
    auVar55._24_4_ = fVar33 * fVar35;
    auVar55._28_4_ = auVar384._28_4_;
    auVar26 = vsubps_avx(auVar55,auVar54);
    auVar130 = vperm2f128_avx(auVar44,auVar44,1);
    auVar130 = vshufps_avx(auVar130,auVar44,0x30);
    local_b40 = vshufps_avx(auVar44,auVar130,0x29);
    fVar414 = local_b40._0_4_;
    fVar421 = local_b40._4_4_;
    auVar56._4_4_ = fVar421 * fVar242;
    auVar56._0_4_ = fVar414 * fVar109;
    fVar423 = local_b40._8_4_;
    auVar56._8_4_ = fVar423 * fVar268;
    fVar425 = local_b40._12_4_;
    auVar56._12_4_ = fVar425 * fVar294;
    fVar427 = local_b40._16_4_;
    auVar56._16_4_ = fVar427 * fVar295;
    fVar429 = local_b40._20_4_;
    auVar56._20_4_ = fVar429 * fVar320;
    fVar431 = local_b40._24_4_;
    auVar56._24_4_ = fVar431 * fVar33;
    auVar56._28_4_ = auVar130._28_4_;
    auVar57._4_4_ = fVar243 * fVar141;
    auVar57._0_4_ = fVar239 * fVar108;
    auVar57._8_4_ = fVar269 * fVar143;
    auVar57._12_4_ = fVar296 * fVar145;
    auVar57._16_4_ = fVar297 * fVar146;
    auVar57._20_4_ = fVar323 * fVar147;
    auVar57._24_4_ = fVar34 * fVar148;
    auVar57._28_4_ = fVar412;
    auVar130 = vsubps_avx(auVar57,auVar56);
    auVar58._4_4_ = fVar243 * fVar245;
    auVar58._0_4_ = fVar239 * fVar203;
    auVar58._8_4_ = fVar269 * fVar270;
    auVar58._12_4_ = fVar296 * fVar298;
    auVar58._16_4_ = fVar297 * fVar299;
    auVar58._20_4_ = fVar323 * fVar326;
    auVar58._24_4_ = fVar34 * fVar35;
    auVar58._28_4_ = fVar412;
    auVar59._4_4_ = fVar421 * fVar241;
    auVar59._0_4_ = fVar414 * fVar238;
    auVar59._8_4_ = fVar423 * fVar267;
    auVar59._12_4_ = fVar425 * fVar292;
    auVar59._16_4_ = fVar427 * fVar293;
    auVar59._20_4_ = fVar429 * fVar317;
    fVar412 = local_b40._28_4_;
    auVar59._24_4_ = fVar431 * fVar390;
    auVar59._28_4_ = fVar412;
    auVar164 = vsubps_avx(auVar59,auVar58);
    auVar60._4_4_ =
         fVar301 * (auVar31._4_4_ * auVar31._4_4_ +
                   auVar120._4_4_ * auVar120._4_4_ + auVar43._4_4_ * auVar43._4_4_);
    auVar60._0_4_ =
         fVar291 * (auVar31._0_4_ * auVar31._0_4_ +
                   auVar120._0_4_ * auVar120._0_4_ + auVar43._0_4_ * auVar43._0_4_);
    auVar60._8_4_ =
         fVar303 * (auVar31._8_4_ * auVar31._8_4_ +
                   auVar120._8_4_ * auVar120._8_4_ + auVar43._8_4_ * auVar43._8_4_);
    auVar60._12_4_ =
         fVar329 * (auVar31._12_4_ * auVar31._12_4_ +
                   auVar120._12_4_ * auVar120._12_4_ + auVar43._12_4_ * auVar43._12_4_);
    auVar60._16_4_ =
         fVar332 * (auVar31._16_4_ * auVar31._16_4_ +
                   auVar120._16_4_ * auVar120._16_4_ + auVar43._16_4_ * auVar43._16_4_);
    auVar60._20_4_ =
         fVar355 * (auVar31._20_4_ * auVar31._20_4_ +
                   auVar120._20_4_ * auVar120._20_4_ + auVar43._20_4_ * auVar43._20_4_);
    auVar60._24_4_ =
         fVar356 * (auVar31._24_4_ * auVar31._24_4_ +
                   auVar120._24_4_ * auVar120._24_4_ + auVar43._24_4_ * auVar43._24_4_);
    auVar60._28_4_ = auVar31._28_4_ + fVar302 + auVar43._28_4_;
    auVar61._4_4_ =
         (auVar26._4_4_ * auVar26._4_4_ +
         auVar130._4_4_ * auVar130._4_4_ + auVar164._4_4_ * auVar164._4_4_) * fVar301;
    auVar61._0_4_ =
         (auVar26._0_4_ * auVar26._0_4_ +
         auVar130._0_4_ * auVar130._0_4_ + auVar164._0_4_ * auVar164._0_4_) * fVar291;
    auVar61._8_4_ =
         (auVar26._8_4_ * auVar26._8_4_ +
         auVar130._8_4_ * auVar130._8_4_ + auVar164._8_4_ * auVar164._8_4_) * fVar303;
    auVar61._12_4_ =
         (auVar26._12_4_ * auVar26._12_4_ +
         auVar130._12_4_ * auVar130._12_4_ + auVar164._12_4_ * auVar164._12_4_) * fVar329;
    auVar61._16_4_ =
         (auVar26._16_4_ * auVar26._16_4_ +
         auVar130._16_4_ * auVar130._16_4_ + auVar164._16_4_ * auVar164._16_4_) * fVar332;
    auVar61._20_4_ =
         (auVar26._20_4_ * auVar26._20_4_ +
         auVar130._20_4_ * auVar130._20_4_ + auVar164._20_4_ * auVar164._20_4_) * fVar355;
    auVar61._24_4_ =
         (auVar26._24_4_ * auVar26._24_4_ +
         auVar130._24_4_ * auVar130._24_4_ + auVar164._24_4_ * auVar164._24_4_) * fVar356;
    auVar61._28_4_ = auVar189._28_4_ + auVar121._28_4_;
    auVar189 = vmaxps_avx(auVar60,auVar61);
    auVar130 = vperm2f128_avx(auVar312,auVar312,1);
    auVar130 = vshufps_avx(auVar130,auVar312,0x30);
    auVar31 = vshufps_avx(auVar312,auVar130,0x29);
    auVar192._0_4_ = auVar312._0_4_ + fVar240;
    auVar192._4_4_ = auVar312._4_4_ + fVar201;
    auVar192._8_4_ = auVar312._8_4_ + fVar244;
    auVar192._12_4_ = auVar312._12_4_ + fVar266;
    auVar192._16_4_ = auVar312._16_4_ + fVar272;
    auVar192._20_4_ = auVar312._20_4_ + fVar290;
    auVar192._24_4_ = auVar312._24_4_ + fVar300;
    auVar192._28_4_ = auVar312._28_4_ + auVar260._28_4_;
    auVar130 = vmaxps_avx(auVar312,auVar192);
    auVar26 = vmaxps_avx(auVar29,auVar31);
    auVar130 = vmaxps_avx(auVar130,auVar26);
    auVar26 = vrsqrtps_avx(auVar235);
    fVar302 = auVar26._0_4_;
    fVar240 = auVar26._4_4_;
    fVar201 = auVar26._8_4_;
    fVar244 = auVar26._12_4_;
    fVar266 = auVar26._16_4_;
    fVar272 = auVar26._20_4_;
    fVar290 = auVar26._24_4_;
    local_600 = fVar302 * 1.5 + fVar302 * fVar302 * fVar302 * auVar235._0_4_ * -0.5;
    fStack_5fc = fVar240 * 1.5 + fVar240 * fVar240 * fVar240 * auVar235._4_4_ * -0.5;
    fStack_5f8 = fVar201 * 1.5 + fVar201 * fVar201 * fVar201 * auVar235._8_4_ * -0.5;
    fStack_5f4 = fVar244 * 1.5 + fVar244 * fVar244 * fVar244 * auVar235._12_4_ * -0.5;
    fStack_5f0 = fVar266 * 1.5 + fVar266 * fVar266 * fVar266 * auVar235._16_4_ * -0.5;
    fStack_5ec = fVar272 * 1.5 + fVar272 * fVar272 * fVar272 * auVar235._20_4_ * -0.5;
    fStack_5e8 = fVar290 * 1.5 + fVar290 * fVar290 * fVar290 * auVar235._24_4_ * -0.5;
    fVar271 = 0.0;
    auVar260 = ZEXT1232(ZEXT412(0)) << 0x20;
    local_ac0 = vsubps_avx(auVar260,auVar435);
    auVar260 = vsubps_avx(auVar260,local_2e0);
    fVar364 = auVar260._0_4_;
    fVar374 = auVar260._4_4_;
    fVar375 = auVar260._8_4_;
    fVar376 = auVar260._12_4_;
    fVar377 = auVar260._16_4_;
    fVar378 = auVar260._20_4_;
    fVar379 = auVar260._24_4_;
    fVar240 = local_ac0._0_4_;
    fVar244 = local_ac0._4_4_;
    fVar272 = local_ac0._8_4_;
    fVar300 = local_ac0._12_4_;
    fVar301 = local_ac0._16_4_;
    fVar329 = local_ac0._20_4_;
    fVar355 = local_ac0._24_4_;
    auVar93._4_4_ = fVar318;
    auVar93._0_4_ = fVar304;
    auVar93._8_4_ = fVar321;
    auVar93._12_4_ = fVar324;
    auVar93._16_4_ = fVar327;
    auVar93._20_4_ = fVar330;
    auVar93._24_4_ = fVar333;
    auVar93._28_4_ = fVar335;
    auVar165 = ZEXT1232(ZEXT412(0)) << 0x20;
    auVar260 = vsubps_avx(auVar165,auVar93);
    fVar201 = auVar260._0_4_;
    fVar266 = auVar260._4_4_;
    fVar290 = auVar260._8_4_;
    fVar291 = auVar260._12_4_;
    fVar303 = auVar260._16_4_;
    fVar332 = auVar260._20_4_;
    fVar356 = auVar260._24_4_;
    auVar402._0_4_ =
         (float)local_ae0._0_4_ * fVar201 +
         (float)local_800._0_4_ * fVar240 + fVar364 * (float)local_9a0._0_4_;
    auVar402._4_4_ =
         (float)local_ae0._4_4_ * fVar266 +
         (float)local_800._4_4_ * fVar244 + fVar374 * (float)local_9a0._4_4_;
    auVar402._8_4_ = fStack_ad8 * fVar290 + fStack_7f8 * fVar272 + fVar375 * fStack_998;
    auVar402._12_4_ = fStack_ad4 * fVar291 + fStack_7f4 * fVar300 + fVar376 * fStack_994;
    auVar402._16_4_ = fStack_ad0 * fVar303 + fStack_7f0 * fVar301 + fVar377 * fStack_990;
    auVar402._20_4_ = fStack_acc * fVar332 + fStack_7ec * fVar329 + fVar378 * fStack_98c;
    auVar402._24_4_ = fStack_ac8 * fVar356 + fStack_7e8 * fVar355 + fVar379 * fStack_988;
    auVar402._28_4_ = fVar412 + auVar164._28_4_ + auVar235._28_4_;
    auVar419._0_4_ = fVar201 * fVar201 + fVar240 * fVar240 + fVar364 * fVar364;
    auVar419._4_4_ = fVar266 * fVar266 + fVar244 * fVar244 + fVar374 * fVar374;
    auVar419._8_4_ = fVar290 * fVar290 + fVar272 * fVar272 + fVar375 * fVar375;
    auVar419._12_4_ = fVar291 * fVar291 + fVar300 * fVar300 + fVar376 * fVar376;
    auVar419._16_4_ = fVar303 * fVar303 + fVar301 * fVar301 + fVar377 * fVar377;
    auVar419._20_4_ = fVar332 * fVar332 + fVar329 * fVar329 + fVar378 * fVar378;
    auVar419._24_4_ = fVar356 * fVar356 + fVar355 * fVar355 + fVar379 * fVar379;
    auVar419._28_4_ = local_2e0._28_4_ + local_2e0._28_4_ + fVar412;
    local_560 = (float)local_ae0._0_4_ * fVar239 * local_600 +
                local_600 * fVar238 * (float)local_800._0_4_ +
                fVar109 * local_600 * (float)local_9a0._0_4_;
    fStack_55c = (float)local_ae0._4_4_ * fVar243 * fStack_5fc +
                 fStack_5fc * fVar241 * (float)local_800._4_4_ +
                 fVar242 * fStack_5fc * (float)local_9a0._4_4_;
    fStack_558 = fStack_ad8 * fVar269 * fStack_5f8 +
                 fStack_5f8 * fVar267 * fStack_7f8 + fVar268 * fStack_5f8 * fStack_998;
    fStack_554 = fStack_ad4 * fVar296 * fStack_5f4 +
                 fStack_5f4 * fVar292 * fStack_7f4 + fVar294 * fStack_5f4 * fStack_994;
    fStack_550 = fStack_ad0 * fVar297 * fStack_5f0 +
                 fStack_5f0 * fVar293 * fStack_7f0 + fVar295 * fStack_5f0 * fStack_990;
    fStack_54c = fStack_acc * fVar323 * fStack_5ec +
                 fStack_5ec * fVar317 * fStack_7ec + fVar320 * fStack_5ec * fStack_98c;
    fStack_548 = fStack_ac8 * fVar34 * fStack_5e8 +
                 fStack_5e8 * fVar390 * fStack_7e8 + fVar33 * fStack_5e8 * fStack_988;
    fVar302 = fStack_ac4 + fStack_7e4 + fStack_984;
    local_620 = fVar201 * fVar239 * local_600 +
                local_600 * fVar238 * fVar240 + fVar364 * fVar109 * local_600;
    fStack_61c = fVar266 * fVar243 * fStack_5fc +
                 fStack_5fc * fVar241 * fVar244 + fVar374 * fVar242 * fStack_5fc;
    fStack_618 = fVar290 * fVar269 * fStack_5f8 +
                 fStack_5f8 * fVar267 * fVar272 + fVar375 * fVar268 * fStack_5f8;
    fStack_614 = fVar291 * fVar296 * fStack_5f4 +
                 fStack_5f4 * fVar292 * fVar300 + fVar376 * fVar294 * fStack_5f4;
    fStack_610 = fVar303 * fVar297 * fStack_5f0 +
                 fStack_5f0 * fVar293 * fVar301 + fVar377 * fVar295 * fStack_5f0;
    fStack_60c = fVar332 * fVar323 * fStack_5ec +
                 fStack_5ec * fVar317 * fVar329 + fVar378 * fVar320 * fStack_5ec;
    fStack_608 = fVar356 * fVar34 * fStack_5e8 +
                 fStack_5e8 * fVar390 * fVar355 + fVar379 * fVar33 * fStack_5e8;
    fStack_604 = fStack_7e4 + fVar302;
    auVar62._4_4_ = fStack_55c * fStack_61c;
    auVar62._0_4_ = local_560 * local_620;
    auVar62._8_4_ = fStack_558 * fStack_618;
    auVar62._12_4_ = fStack_554 * fStack_614;
    auVar62._16_4_ = fStack_550 * fStack_610;
    auVar62._20_4_ = fStack_54c * fStack_60c;
    auVar62._24_4_ = fStack_548 * fStack_608;
    auVar62._28_4_ = fVar302;
    auVar43 = vsubps_avx(auVar402,auVar62);
    auVar63._4_4_ = fStack_61c * fStack_61c;
    auVar63._0_4_ = local_620 * local_620;
    auVar63._8_4_ = fStack_618 * fStack_618;
    auVar63._12_4_ = fStack_614 * fStack_614;
    auVar63._16_4_ = fStack_610 * fStack_610;
    auVar63._20_4_ = fStack_60c * fStack_60c;
    auVar63._24_4_ = fStack_608 * fStack_608;
    auVar63._28_4_ = fStack_7e4;
    auVar120 = vsubps_avx(auVar419,auVar63);
    auVar260 = vsqrtps_avx(auVar189);
    fVar302 = (auVar260._0_4_ + auVar130._0_4_) * 1.0000002;
    fVar412 = (auVar260._4_4_ + auVar130._4_4_) * 1.0000002;
    fVar204 = (auVar260._8_4_ + auVar130._8_4_) * 1.0000002;
    fVar206 = (auVar260._12_4_ + auVar130._12_4_) * 1.0000002;
    fVar208 = (auVar260._16_4_ + auVar130._16_4_) * 1.0000002;
    fVar210 = (auVar260._20_4_ + auVar130._20_4_) * 1.0000002;
    fVar212 = (auVar260._24_4_ + auVar130._24_4_) * 1.0000002;
    auVar64._4_4_ = fVar412 * fVar412;
    auVar64._0_4_ = fVar302 * fVar302;
    auVar64._8_4_ = fVar204 * fVar204;
    auVar64._12_4_ = fVar206 * fVar206;
    auVar64._16_4_ = fVar208 * fVar208;
    auVar64._20_4_ = fVar210 * fVar210;
    auVar64._24_4_ = fVar212 * fVar212;
    auVar64._28_4_ = auVar260._28_4_ + auVar130._28_4_;
    local_a60._0_4_ = auVar43._0_4_ + auVar43._0_4_;
    local_a60._4_4_ = auVar43._4_4_ + auVar43._4_4_;
    local_a60._8_4_ = auVar43._8_4_ + auVar43._8_4_;
    local_a60._12_4_ = auVar43._12_4_ + auVar43._12_4_;
    local_a60._16_4_ = auVar43._16_4_ + auVar43._16_4_;
    local_a60._20_4_ = auVar43._20_4_ + auVar43._20_4_;
    local_a60._24_4_ = auVar43._24_4_ + auVar43._24_4_;
    fVar302 = auVar43._28_4_;
    local_a60._28_4_ = fVar302 + fVar302;
    auVar130 = vsubps_avx(auVar120,auVar64);
    auVar65._4_4_ = fStack_55c * fStack_55c;
    auVar65._0_4_ = local_560 * local_560;
    auVar65._8_4_ = fStack_558 * fStack_558;
    auVar65._12_4_ = fStack_554 * fStack_554;
    auVar65._16_4_ = fStack_550 * fStack_550;
    auVar65._20_4_ = fStack_54c * fStack_54c;
    auVar65._24_4_ = fStack_548 * fStack_548;
    auVar65._28_4_ = fVar302;
    auVar43 = vsubps_avx(local_2c0,auVar65);
    auVar66._4_4_ = local_a60._4_4_ * local_a60._4_4_;
    auVar66._0_4_ = (float)local_a60._0_4_ * (float)local_a60._0_4_;
    auVar66._8_4_ = local_a60._8_4_ * local_a60._8_4_;
    auVar66._12_4_ = local_a60._12_4_ * local_a60._12_4_;
    auVar66._16_4_ = local_a60._16_4_ * local_a60._16_4_;
    auVar66._20_4_ = local_a60._20_4_ * local_a60._20_4_;
    auVar66._24_4_ = local_a60._24_4_ * local_a60._24_4_;
    auVar66._28_4_ = local_2c0._28_4_;
    fVar302 = auVar43._0_4_;
    fVar412 = auVar43._4_4_;
    fVar204 = auVar43._8_4_;
    fVar206 = auVar43._12_4_;
    fVar208 = auVar43._16_4_;
    fVar210 = auVar43._20_4_;
    fVar212 = auVar43._24_4_;
    auVar67._4_4_ = auVar130._4_4_ * fVar412 * 4.0;
    auVar67._0_4_ = auVar130._0_4_ * fVar302 * 4.0;
    auVar67._8_4_ = auVar130._8_4_ * fVar204 * 4.0;
    auVar67._12_4_ = auVar130._12_4_ * fVar206 * 4.0;
    auVar67._16_4_ = auVar130._16_4_ * fVar208 * 4.0;
    auVar67._20_4_ = auVar130._20_4_ * fVar210 * 4.0;
    auVar67._24_4_ = auVar130._24_4_ * fVar212 * 4.0;
    auVar67._28_4_ = 0x40800000;
    auVar121 = vsubps_avx(auVar66,auVar67);
    auVar189 = vcmpps_avx(auVar121,auVar165,5);
    auVar373 = ZEXT3264(auVar189);
    auVar125._8_4_ = 0x7fffffff;
    auVar125._0_8_ = 0x7fffffff7fffffff;
    auVar125._12_4_ = 0x7fffffff;
    auVar125._16_4_ = 0x7fffffff;
    auVar125._20_4_ = 0x7fffffff;
    auVar125._24_4_ = 0x7fffffff;
    auVar125._28_4_ = 0x7fffffff;
    local_440 = vandps_avx(auVar65,auVar125);
    local_340._0_4_ = fVar302 + fVar302;
    local_340._4_4_ = fVar412 + fVar412;
    local_340._8_4_ = fVar204 + fVar204;
    local_340._12_4_ = fVar206 + fVar206;
    local_340._16_4_ = fVar208 + fVar208;
    local_340._20_4_ = fVar210 + fVar210;
    local_340._24_4_ = fVar212 + fVar212;
    local_340._28_4_ = auVar43._28_4_ + auVar43._28_4_;
    local_a40 = vandps_avx(auVar43,auVar125);
    uVar99 = CONCAT44(local_a60._4_4_,local_a60._0_4_);
    local_320._0_8_ = uVar99 ^ 0x8000000080000000;
    local_320._8_4_ = -local_a60._8_4_;
    local_320._12_4_ = -local_a60._12_4_;
    local_320._16_4_ = -local_a60._16_4_;
    local_320._20_4_ = -local_a60._20_4_;
    local_320._24_4_ = -local_a60._24_4_;
    local_320._28_4_ = -local_a60._28_4_;
    fStack_544 = fStack_ac4 + fStack_7e4 + fStack_984;
    if ((((((((auVar189 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
             (auVar189 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
            (auVar189 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
           SUB321(auVar189 >> 0x7f,0) == '\0') &&
          (auVar189 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
         SUB321(auVar189 >> 0xbf,0) == '\0') &&
        (auVar189 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) && -1 < auVar189[0x1f])
    {
      auVar436._8_4_ = 0x7f800000;
      auVar436._0_8_ = 0x7f8000007f800000;
      auVar436._12_4_ = 0x7f800000;
      auVar436._16_4_ = 0x7f800000;
      auVar436._20_4_ = 0x7f800000;
      auVar436._24_4_ = 0x7f800000;
      auVar436._28_4_ = 0x7f800000;
      auVar193._8_4_ = 0xff800000;
      auVar193._0_8_ = 0xff800000ff800000;
      auVar193._12_4_ = 0xff800000;
      auVar193._16_4_ = 0xff800000;
      auVar193._20_4_ = 0xff800000;
      auVar193._24_4_ = 0xff800000;
      auVar193._28_4_ = 0xff800000;
    }
    else {
      auVar164 = vsqrtps_avx(auVar121);
      auVar43 = vrcpps_avx(local_340);
      auVar189 = vcmpps_avx(auVar121,auVar165,5);
      fVar271 = auVar189._28_4_;
      fVar181 = auVar43._0_4_;
      fVar202 = auVar43._4_4_;
      auVar68._4_4_ = local_340._4_4_ * fVar202;
      auVar68._0_4_ = local_340._0_4_ * fVar181;
      fVar205 = auVar43._8_4_;
      auVar68._8_4_ = local_340._8_4_ * fVar205;
      fVar207 = auVar43._12_4_;
      auVar68._12_4_ = local_340._12_4_ * fVar207;
      fVar209 = auVar43._16_4_;
      auVar68._16_4_ = local_340._16_4_ * fVar209;
      fVar211 = auVar43._20_4_;
      auVar68._20_4_ = local_340._20_4_ * fVar211;
      fVar213 = auVar43._24_4_;
      auVar68._24_4_ = local_340._24_4_ * fVar213;
      auVar68._28_4_ = auVar121._28_4_;
      auVar126._8_4_ = 0x3f800000;
      auVar126._0_8_ = 0x3f8000003f800000;
      auVar126._12_4_ = 0x3f800000;
      auVar126._16_4_ = 0x3f800000;
      auVar126._20_4_ = 0x3f800000;
      auVar126._24_4_ = 0x3f800000;
      auVar126._28_4_ = 0x3f800000;
      auVar121 = vsubps_avx(auVar126,auVar68);
      fVar181 = fVar181 + fVar181 * auVar121._0_4_;
      fVar202 = fVar202 + fVar202 * auVar121._4_4_;
      fVar205 = fVar205 + fVar205 * auVar121._8_4_;
      fVar207 = fVar207 + fVar207 * auVar121._12_4_;
      fVar209 = fVar209 + fVar209 * auVar121._16_4_;
      fVar211 = fVar211 + fVar211 * auVar121._20_4_;
      fVar213 = fVar213 + fVar213 * auVar121._24_4_;
      auVar165 = vsubps_avx(local_320,auVar164);
      fVar305 = auVar165._0_4_ * fVar181;
      fVar319 = auVar165._4_4_ * fVar202;
      auVar69._4_4_ = fVar319;
      auVar69._0_4_ = fVar305;
      fVar322 = auVar165._8_4_ * fVar205;
      auVar69._8_4_ = fVar322;
      fVar325 = auVar165._12_4_ * fVar207;
      auVar69._12_4_ = fVar325;
      fVar328 = auVar165._16_4_ * fVar209;
      auVar69._16_4_ = fVar328;
      fVar331 = auVar165._20_4_ * fVar211;
      auVar69._20_4_ = fVar331;
      fVar334 = auVar165._24_4_ * fVar213;
      auVar69._24_4_ = fVar334;
      auVar69._28_4_ = auVar165._28_4_;
      auVar164 = vsubps_avx(auVar164,local_a60);
      fVar181 = auVar164._0_4_ * fVar181;
      fVar202 = auVar164._4_4_ * fVar202;
      auVar70._4_4_ = fVar202;
      auVar70._0_4_ = fVar181;
      fVar205 = auVar164._8_4_ * fVar205;
      auVar70._8_4_ = fVar205;
      fVar207 = auVar164._12_4_ * fVar207;
      auVar70._12_4_ = fVar207;
      fVar209 = auVar164._16_4_ * fVar209;
      auVar70._16_4_ = fVar209;
      fVar211 = auVar164._20_4_ * fVar211;
      auVar70._20_4_ = fVar211;
      fVar213 = auVar164._24_4_ * fVar213;
      auVar70._24_4_ = fVar213;
      auVar70._28_4_ = auVar43._28_4_ + auVar121._28_4_;
      fStack_404 = fStack_604 + auVar164._28_4_;
      local_420 = local_600 * (local_620 + local_560 * fVar305);
      fStack_41c = fStack_5fc * (fStack_61c + fStack_55c * fVar319);
      fStack_418 = fStack_5f8 * (fStack_618 + fStack_558 * fVar322);
      fStack_414 = fStack_5f4 * (fStack_614 + fStack_554 * fVar325);
      fStack_410 = fStack_5f0 * (fStack_610 + fStack_550 * fVar328);
      fStack_40c = fStack_5ec * (fStack_60c + fStack_54c * fVar331);
      fStack_408 = fStack_5e8 * (fStack_608 + fStack_548 * fVar334);
      local_400 = local_600 * (local_620 + local_560 * fVar181);
      fStack_3fc = fStack_5fc * (fStack_61c + fStack_55c * fVar202);
      fStack_3f8 = fStack_5f8 * (fStack_618 + fStack_558 * fVar205);
      fStack_3f4 = fStack_5f4 * (fStack_614 + fStack_554 * fVar207);
      fStack_3f0 = fStack_5f0 * (fStack_610 + fStack_550 * fVar209);
      fStack_3ec = fStack_5ec * (fStack_60c + fStack_54c * fVar211);
      fStack_3e8 = fStack_5e8 * (fStack_608 + fStack_548 * fVar213);
      fStack_3e4 = fStack_604 + fStack_404;
      auVar281._8_4_ = 0x7f800000;
      auVar281._0_8_ = 0x7f8000007f800000;
      auVar281._12_4_ = 0x7f800000;
      auVar281._16_4_ = 0x7f800000;
      auVar281._20_4_ = 0x7f800000;
      auVar281._24_4_ = 0x7f800000;
      auVar281._28_4_ = 0x7f800000;
      auVar436 = vblendvps_avx(auVar281,auVar69,auVar189);
      auVar282._8_4_ = 0xff800000;
      auVar282._0_8_ = 0xff800000ff800000;
      auVar282._12_4_ = 0xff800000;
      auVar282._16_4_ = 0xff800000;
      auVar282._20_4_ = 0xff800000;
      auVar282._24_4_ = 0xff800000;
      auVar282._28_4_ = 0xff800000;
      auVar193 = vblendvps_avx(auVar282,auVar70,auVar189);
      auVar43 = vmaxps_avx(local_5a0,local_440);
      auVar71._4_4_ = auVar43._4_4_ * 1.9073486e-06;
      auVar71._0_4_ = auVar43._0_4_ * 1.9073486e-06;
      auVar71._8_4_ = auVar43._8_4_ * 1.9073486e-06;
      auVar71._12_4_ = auVar43._12_4_ * 1.9073486e-06;
      auVar71._16_4_ = auVar43._16_4_ * 1.9073486e-06;
      auVar71._20_4_ = auVar43._20_4_ * 1.9073486e-06;
      auVar71._24_4_ = auVar43._24_4_ * 1.9073486e-06;
      auVar71._28_4_ = auVar43._28_4_;
      auVar43 = vcmpps_avx(local_a40,auVar71,1);
      auVar121 = auVar189 & auVar43;
      if ((((((((auVar121 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
               (auVar121 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
              (auVar121 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
             SUB321(auVar121 >> 0x7f,0) != '\0') ||
            (auVar121 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
           SUB321(auVar121 >> 0xbf,0) != '\0') ||
          (auVar121 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
          auVar121[0x1f] < '\0') {
        auVar43 = vandps_avx(auVar43,auVar189);
        auVar222 = vpackssdw_avx(auVar43._0_16_,auVar43._16_16_);
        auVar121 = vcmpps_avx(auVar130,_DAT_01f7b000,2);
        auVar363._8_4_ = 0xff800000;
        auVar363._0_8_ = 0xff800000ff800000;
        auVar363._12_4_ = 0xff800000;
        auVar363._16_4_ = 0xff800000;
        auVar363._20_4_ = 0xff800000;
        auVar363._24_4_ = 0xff800000;
        auVar363._28_4_ = 0xff800000;
        auVar404._8_4_ = 0x7f800000;
        auVar404._0_8_ = 0x7f8000007f800000;
        auVar404._12_4_ = 0x7f800000;
        auVar404._16_4_ = 0x7f800000;
        auVar404._20_4_ = 0x7f800000;
        auVar404._24_4_ = 0x7f800000;
        auVar404._28_4_ = 0x7f800000;
        auVar130 = vblendvps_avx(auVar404,auVar363,auVar121);
        auVar307 = vpmovsxwd_avx(auVar222);
        auVar222 = vpunpckhwd_avx(auVar222,auVar222);
        auVar315._16_16_ = auVar222;
        auVar315._0_16_ = auVar307;
        auVar436 = vblendvps_avx(auVar436,auVar130,auVar315);
        auVar130 = vblendvps_avx(auVar363,auVar404,auVar121);
        auVar193 = vblendvps_avx(auVar193,auVar130,auVar315);
        auVar289._0_8_ = auVar43._0_8_ ^ 0xffffffffffffffff;
        auVar289._8_4_ = auVar43._8_4_ ^ 0xffffffff;
        auVar289._12_4_ = auVar43._12_4_ ^ 0xffffffff;
        auVar289._16_4_ = auVar43._16_4_ ^ 0xffffffff;
        auVar289._20_4_ = auVar43._20_4_ ^ 0xffffffff;
        auVar289._24_4_ = auVar43._24_4_ ^ 0xffffffff;
        auVar289._28_4_ = auVar43._28_4_ ^ 0xffffffff;
        auVar130 = vorps_avx(auVar121,auVar289);
        auVar189 = vandps_avx(auVar189,auVar130);
        auVar373 = ZEXT3264(auVar189);
      }
    }
    auVar344 = ZEXT3264(local_b60);
    auVar189 = local_520 & auVar373._0_32_;
    auVar316 = ZEXT3264(local_a20);
    fVar181 = (float)local_920._0_4_;
    fVar202 = (float)local_920._4_4_;
    fVar205 = fStack_918;
    fVar207 = fStack_914;
    fVar209 = fStack_910;
    fVar211 = fStack_90c;
    fVar213 = fStack_908;
    fVar305 = fStack_904;
    if ((((((((auVar189 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
             (auVar189 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
            (auVar189 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
           SUB321(auVar189 >> 0x7f,0) == '\0') &&
          (auVar189 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
         SUB321(auVar189 >> 0xbf,0) == '\0') &&
        (auVar189 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) && -1 < auVar189[0x1f])
    {
      auVar405 = ZEXT3264(local_8e0);
      auVar373 = ZEXT3264(local_aa0);
    }
    else {
      fStack_5e4 = auVar26._28_4_ + auVar235._28_4_;
      auVar344 = ZEXT464((uint)*(float *)(ray + k * 4 + 0x100));
      auVar222 = ZEXT416((uint)(*(float *)(ray + k * 4 + 0x100) - (float)local_960._0_4_));
      auVar222 = vshufps_avx(auVar222,auVar222,0);
      auVar283._16_16_ = auVar222;
      auVar283._0_16_ = auVar222;
      auVar43 = vminps_avx(auVar283,auVar193);
      auVar127._0_4_ =
           (float)local_ae0._0_4_ * fVar395 +
           (float)local_800._0_4_ * fVar380 + fVar413 * (float)local_9a0._0_4_;
      auVar127._4_4_ =
           (float)local_ae0._4_4_ * fVar406 +
           (float)local_800._4_4_ * fVar388 + fVar420 * (float)local_9a0._4_4_;
      auVar127._8_4_ = fStack_ad8 * fVar407 + fStack_7f8 * fVar389 + fVar422 * fStack_998;
      auVar127._12_4_ = fStack_ad4 * fVar408 + fStack_7f4 * fVar391 + fVar424 * fStack_994;
      auVar127._16_4_ = fStack_ad0 * fVar409 + fStack_7f0 * fVar392 + fVar426 * fStack_990;
      auVar127._20_4_ = fStack_acc * fVar410 + fStack_7ec * fVar393 + fVar428 * fStack_98c;
      auVar127._24_4_ = fStack_ac8 * fVar411 + fStack_7e8 * fVar394 + fVar430 * fStack_988;
      auVar127._28_4_ = fVar432 + auVar384._28_4_ + fVar432;
      auVar26 = vrcpps_avx(auVar127);
      fVar432 = auVar26._0_4_;
      fVar319 = auVar26._4_4_;
      auVar72._4_4_ = auVar127._4_4_ * fVar319;
      auVar72._0_4_ = auVar127._0_4_ * fVar432;
      fVar322 = auVar26._8_4_;
      auVar72._8_4_ = auVar127._8_4_ * fVar322;
      fVar325 = auVar26._12_4_;
      auVar72._12_4_ = auVar127._12_4_ * fVar325;
      fVar328 = auVar26._16_4_;
      auVar72._16_4_ = auVar127._16_4_ * fVar328;
      fVar331 = auVar26._20_4_;
      auVar72._20_4_ = auVar127._20_4_ * fVar331;
      fVar334 = auVar26._24_4_;
      auVar72._24_4_ = auVar127._24_4_ * fVar334;
      auVar72._28_4_ = fVar271 + auVar222._12_4_;
      auVar372._8_4_ = 0x3f800000;
      auVar372._0_8_ = 0x3f8000003f800000;
      auVar372._12_4_ = 0x3f800000;
      auVar372._16_4_ = 0x3f800000;
      auVar372._20_4_ = 0x3f800000;
      auVar372._24_4_ = 0x3f800000;
      auVar372._28_4_ = 0x3f800000;
      auVar121 = vsubps_avx(auVar372,auVar72);
      auVar313._8_4_ = 0x7fffffff;
      auVar313._0_8_ = 0x7fffffff7fffffff;
      auVar313._12_4_ = 0x7fffffff;
      auVar313._16_4_ = 0x7fffffff;
      auVar313._20_4_ = 0x7fffffff;
      auVar313._24_4_ = 0x7fffffff;
      auVar313._28_4_ = 0x7fffffff;
      auVar189 = vandps_avx(auVar127,auVar313);
      auVar341._8_4_ = 0x219392ef;
      auVar341._0_8_ = 0x219392ef219392ef;
      auVar341._12_4_ = 0x219392ef;
      auVar341._16_4_ = 0x219392ef;
      auVar341._20_4_ = 0x219392ef;
      auVar341._24_4_ = 0x219392ef;
      auVar341._28_4_ = 0x219392ef;
      auVar130 = vcmpps_avx(auVar189,auVar341,1);
      auVar73._4_4_ =
           (fVar319 + fVar319 * auVar121._4_4_) *
           -(fVar266 * fVar406 + fVar388 * fVar244 + fVar374 * fVar420);
      auVar73._0_4_ =
           (fVar432 + fVar432 * auVar121._0_4_) *
           -(fVar201 * fVar395 + fVar380 * fVar240 + fVar364 * fVar413);
      auVar73._8_4_ =
           (fVar322 + fVar322 * auVar121._8_4_) *
           -(fVar290 * fVar407 + fVar389 * fVar272 + fVar375 * fVar422);
      auVar73._12_4_ =
           (fVar325 + fVar325 * auVar121._12_4_) *
           -(fVar291 * fVar408 + fVar391 * fVar300 + fVar376 * fVar424);
      auVar73._16_4_ =
           (fVar328 + fVar328 * auVar121._16_4_) *
           -(fVar303 * fVar409 + fVar392 * fVar301 + fVar377 * fVar426);
      auVar73._20_4_ =
           (fVar331 + fVar331 * auVar121._20_4_) *
           -(fVar332 * fVar410 + fVar393 * fVar329 + fVar378 * fVar428);
      auVar73._24_4_ =
           (fVar334 + fVar334 * auVar121._24_4_) *
           -(fVar356 * fVar411 + fVar394 * fVar355 + fVar379 * fVar430);
      auVar73._28_4_ = auVar26._28_4_ + auVar121._28_4_;
      auVar189 = vcmpps_avx(auVar127,ZEXT832(0) << 0x20,1);
      auVar189 = vorps_avx(auVar130,auVar189);
      auVar362._8_4_ = 0xff800000;
      auVar362._0_8_ = 0xff800000ff800000;
      auVar362._12_4_ = 0xff800000;
      auVar362._16_4_ = 0xff800000;
      auVar362._20_4_ = 0xff800000;
      auVar362._24_4_ = 0xff800000;
      auVar362._28_4_ = 0xff800000;
      auVar189 = vblendvps_avx(auVar73,auVar362,auVar189);
      auVar26 = vcmpps_avx(auVar127,ZEXT832(0) << 0x20,6);
      auVar130 = vorps_avx(auVar130,auVar26);
      auVar403._8_4_ = 0x7f800000;
      auVar403._0_8_ = 0x7f8000007f800000;
      auVar403._12_4_ = 0x7f800000;
      auVar403._16_4_ = 0x7f800000;
      auVar403._20_4_ = 0x7f800000;
      auVar403._24_4_ = 0x7f800000;
      auVar403._28_4_ = 0x7f800000;
      auVar130 = vblendvps_avx(auVar73,auVar403,auVar130);
      auVar26 = vmaxps_avx(local_3c0,auVar436);
      auVar26 = vmaxps_avx(auVar26,auVar189);
      auVar43 = vminps_avx(auVar43,auVar130);
      auVar121 = ZEXT832(0) << 0x20;
      auVar189 = vsubps_avx(auVar121,auVar27);
      auVar130 = vsubps_avx(auVar121,auVar28);
      auVar74._4_4_ = auVar130._4_4_ * -fVar141;
      auVar74._0_4_ = auVar130._0_4_ * -fVar108;
      auVar74._8_4_ = auVar130._8_4_ * -fVar143;
      auVar74._12_4_ = auVar130._12_4_ * -fVar145;
      auVar74._16_4_ = auVar130._16_4_ * -fVar146;
      auVar74._20_4_ = auVar130._20_4_ * -fVar147;
      auVar74._24_4_ = auVar130._24_4_ * -fVar148;
      auVar74._28_4_ = auVar130._28_4_;
      auVar75._4_4_ = fVar245 * auVar189._4_4_;
      auVar75._0_4_ = fVar203 * auVar189._0_4_;
      auVar75._8_4_ = fVar270 * auVar189._8_4_;
      auVar75._12_4_ = fVar298 * auVar189._12_4_;
      auVar75._16_4_ = fVar299 * auVar189._16_4_;
      auVar75._20_4_ = fVar326 * auVar189._20_4_;
      auVar75._24_4_ = fVar35 * auVar189._24_4_;
      auVar75._28_4_ = auVar189._28_4_;
      auVar189 = vsubps_avx(auVar74,auVar75);
      auVar130 = vsubps_avx(auVar121,auVar30);
      auVar76._4_4_ = fVar421 * auVar130._4_4_;
      auVar76._0_4_ = fVar414 * auVar130._0_4_;
      auVar76._8_4_ = fVar423 * auVar130._8_4_;
      auVar76._12_4_ = fVar425 * auVar130._12_4_;
      auVar76._16_4_ = fVar427 * auVar130._16_4_;
      auVar76._20_4_ = fVar429 * auVar130._20_4_;
      uVar104 = auVar130._28_4_;
      auVar76._24_4_ = fVar431 * auVar130._24_4_;
      auVar76._28_4_ = uVar104;
      auVar27 = vsubps_avx(auVar189,auVar76);
      auVar77._4_4_ = -fVar141 * (float)local_9a0._4_4_;
      auVar77._0_4_ = -fVar108 * (float)local_9a0._0_4_;
      auVar77._8_4_ = -fVar143 * fStack_998;
      auVar77._12_4_ = -fVar145 * fStack_994;
      auVar77._16_4_ = -fVar146 * fStack_990;
      auVar77._20_4_ = -fVar147 * fStack_98c;
      auVar77._24_4_ = -fVar148 * fStack_988;
      auVar77._28_4_ = local_980._28_4_ ^ 0x80000000;
      auVar78._4_4_ = (float)local_800._4_4_ * fVar245;
      auVar78._0_4_ = (float)local_800._0_4_ * fVar203;
      auVar78._8_4_ = fStack_7f8 * fVar270;
      auVar78._12_4_ = fStack_7f4 * fVar298;
      auVar78._16_4_ = fStack_7f0 * fVar299;
      auVar78._20_4_ = fStack_7ec * fVar326;
      auVar78._24_4_ = fStack_7e8 * fVar35;
      auVar78._28_4_ = uVar104;
      auVar385._8_4_ = 0x3f800000;
      auVar385._0_8_ = 0x3f8000003f800000;
      auVar385._12_4_ = 0x3f800000;
      auVar385._16_4_ = 0x3f800000;
      auVar385._20_4_ = 0x3f800000;
      auVar385._24_4_ = 0x3f800000;
      auVar385._28_4_ = 0x3f800000;
      auVar189 = vsubps_avx(auVar77,auVar78);
      auVar79._4_4_ = (float)local_ae0._4_4_ * fVar421;
      auVar79._0_4_ = (float)local_ae0._0_4_ * fVar414;
      auVar79._8_4_ = fStack_ad8 * fVar423;
      auVar79._12_4_ = fStack_ad4 * fVar425;
      auVar79._16_4_ = fStack_ad0 * fVar427;
      auVar79._20_4_ = fStack_acc * fVar429;
      auVar79._24_4_ = fStack_ac8 * fVar431;
      auVar79._28_4_ = uVar104;
      auVar28 = vsubps_avx(auVar189,auVar79);
      auVar189 = vrcpps_avx(auVar28);
      fVar203 = auVar189._0_4_;
      auVar284._0_4_ = auVar28._0_4_ * fVar203;
      fVar240 = auVar189._4_4_;
      auVar284._4_4_ = auVar28._4_4_ * fVar240;
      fVar201 = auVar189._8_4_;
      auVar284._8_4_ = auVar28._8_4_ * fVar201;
      fVar245 = auVar189._12_4_;
      auVar284._12_4_ = auVar28._12_4_ * fVar245;
      fVar244 = auVar189._16_4_;
      auVar284._16_4_ = auVar28._16_4_ * fVar244;
      fVar266 = auVar189._20_4_;
      auVar284._20_4_ = auVar28._20_4_ * fVar266;
      fVar270 = auVar189._24_4_;
      auVar284._24_4_ = auVar28._24_4_ * fVar270;
      auVar284._28_4_ = 0;
      auVar121 = vsubps_avx(auVar385,auVar284);
      auVar128._8_4_ = 0x7fffffff;
      auVar128._0_8_ = 0x7fffffff7fffffff;
      auVar128._12_4_ = 0x7fffffff;
      auVar128._16_4_ = 0x7fffffff;
      auVar128._20_4_ = 0x7fffffff;
      auVar128._24_4_ = 0x7fffffff;
      auVar128._28_4_ = 0x7fffffff;
      auVar189 = vandps_avx(auVar28,auVar128);
      auVar130 = vcmpps_avx(auVar189,auVar341,1);
      auVar80._4_4_ = (fVar240 + fVar240 * auVar121._4_4_) * -auVar27._4_4_;
      auVar80._0_4_ = (fVar203 + fVar203 * auVar121._0_4_) * -auVar27._0_4_;
      auVar80._8_4_ = (fVar201 + fVar201 * auVar121._8_4_) * -auVar27._8_4_;
      auVar80._12_4_ = (fVar245 + fVar245 * auVar121._12_4_) * -auVar27._12_4_;
      auVar80._16_4_ = (fVar244 + fVar244 * auVar121._16_4_) * -auVar27._16_4_;
      auVar80._20_4_ = (fVar266 + fVar266 * auVar121._20_4_) * -auVar27._20_4_;
      auVar80._24_4_ = (fVar270 + fVar270 * auVar121._24_4_) * -auVar27._24_4_;
      auVar80._28_4_ = auVar27._28_4_ ^ 0x80000000;
      auVar189 = vcmpps_avx(auVar28,ZEXT832(0) << 0x20,1);
      auVar189 = vorps_avx(auVar130,auVar189);
      auVar189 = vblendvps_avx(auVar80,auVar362,auVar189);
      local_820 = vmaxps_avx(auVar26,auVar189);
      auVar189 = vcmpps_avx(auVar28,ZEXT832(0) << 0x20,6);
      auVar189 = vorps_avx(auVar130,auVar189);
      auVar130 = vblendvps_avx(auVar80,auVar403,auVar189);
      auVar189 = vandps_avx(auVar373._0_32_,local_520);
      local_460 = vminps_avx(auVar43,auVar130);
      auVar130 = vcmpps_avx(local_820,local_460,2);
      auVar26 = auVar189 & auVar130;
      if ((((((((auVar26 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
               (auVar26 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
              (auVar26 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
             SUB321(auVar26 >> 0x7f,0) != '\0') ||
            (auVar26 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
           SUB321(auVar26 >> 0xbf,0) != '\0') ||
          (auVar26 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
          auVar26[0x1f] < '\0') {
        auVar26 = vminps_avx(auVar312,auVar192);
        auVar27 = vminps_avx(auVar29,auVar31);
        auVar26 = vminps_avx(auVar26,auVar27);
        auVar26 = vsubps_avx(auVar26,auVar260);
        auVar189 = vandps_avx(auVar130,auVar189);
        auVar94._4_4_ = fStack_41c;
        auVar94._0_4_ = local_420;
        auVar94._8_4_ = fStack_418;
        auVar94._12_4_ = fStack_414;
        auVar94._16_4_ = fStack_410;
        auVar94._20_4_ = fStack_40c;
        auVar94._24_4_ = fStack_408;
        auVar94._28_4_ = fStack_404;
        auVar130 = vminps_avx(auVar94,auVar385);
        auVar256 = SUB6428(ZEXT864(0),0) << 0x20;
        auVar130 = vmaxps_avx(auVar130,ZEXT832(0) << 0x20);
        local_1a0[0] = fVar107 + fVar149 * (auVar130._0_4_ + 0.0) * 0.125;
        local_1a0[1] = fVar140 + fVar178 * (auVar130._4_4_ + 1.0) * 0.125;
        local_1a0[2] = fVar142 + fVar179 * (auVar130._8_4_ + 2.0) * 0.125;
        local_1a0[3] = fVar144 + fVar180 * (auVar130._12_4_ + 3.0) * 0.125;
        fStack_190 = fVar107 + fVar149 * (auVar130._16_4_ + 4.0) * 0.125;
        fStack_18c = fVar140 + fVar178 * (auVar130._20_4_ + 5.0) * 0.125;
        fStack_188 = fVar142 + fVar179 * (auVar130._24_4_ + 6.0) * 0.125;
        fStack_184 = fVar144 + auVar130._28_4_ + 7.0;
        auVar95._4_4_ = fStack_3fc;
        auVar95._0_4_ = local_400;
        auVar95._8_4_ = fStack_3f8;
        auVar95._12_4_ = fStack_3f4;
        auVar95._16_4_ = fStack_3f0;
        auVar95._20_4_ = fStack_3ec;
        auVar95._24_4_ = fStack_3e8;
        auVar95._28_4_ = fStack_3e4;
        auVar130 = vminps_avx(auVar95,auVar385);
        auVar130 = vmaxps_avx(auVar130,ZEXT832(0) << 0x20);
        local_1c0[0] = fVar107 + fVar149 * (auVar130._0_4_ + 0.0) * 0.125;
        local_1c0[1] = fVar140 + fVar178 * (auVar130._4_4_ + 1.0) * 0.125;
        local_1c0[2] = fVar142 + fVar179 * (auVar130._8_4_ + 2.0) * 0.125;
        local_1c0[3] = fVar144 + fVar180 * (auVar130._12_4_ + 3.0) * 0.125;
        fStack_1b0 = fVar107 + fVar149 * (auVar130._16_4_ + 4.0) * 0.125;
        fStack_1ac = fVar140 + fVar178 * (auVar130._20_4_ + 5.0) * 0.125;
        fStack_1a8 = fVar142 + fVar179 * (auVar130._24_4_ + 6.0) * 0.125;
        fStack_1a4 = fVar144 + auVar130._28_4_ + 7.0;
        auVar81._4_4_ = auVar26._4_4_ * 0.99999976;
        auVar81._0_4_ = auVar26._0_4_ * 0.99999976;
        auVar81._8_4_ = auVar26._8_4_ * 0.99999976;
        auVar81._12_4_ = auVar26._12_4_ * 0.99999976;
        auVar81._16_4_ = auVar26._16_4_ * 0.99999976;
        auVar81._20_4_ = auVar26._20_4_ * 0.99999976;
        auVar81._24_4_ = auVar26._24_4_ * 0.99999976;
        auVar81._28_4_ = 0x3f7ffffc;
        auVar130 = vmaxps_avx(ZEXT832(0) << 0x20,auVar81);
        auVar82._4_4_ = auVar130._4_4_ * auVar130._4_4_;
        auVar82._0_4_ = auVar130._0_4_ * auVar130._0_4_;
        auVar82._8_4_ = auVar130._8_4_ * auVar130._8_4_;
        auVar82._12_4_ = auVar130._12_4_ * auVar130._12_4_;
        auVar82._16_4_ = auVar130._16_4_ * auVar130._16_4_;
        auVar82._20_4_ = auVar130._20_4_ * auVar130._20_4_;
        auVar82._24_4_ = auVar130._24_4_ * auVar130._24_4_;
        auVar82._28_4_ = auVar130._28_4_;
        local_b20 = vsubps_avx(auVar120,auVar82);
        auVar83._4_4_ = local_b20._4_4_ * fVar412 * 4.0;
        auVar83._0_4_ = local_b20._0_4_ * fVar302 * 4.0;
        auVar83._8_4_ = local_b20._8_4_ * fVar204 * 4.0;
        auVar83._12_4_ = local_b20._12_4_ * fVar206 * 4.0;
        auVar83._16_4_ = local_b20._16_4_ * fVar208 * 4.0;
        auVar83._20_4_ = local_b20._20_4_ * fVar210 * 4.0;
        auVar83._24_4_ = local_b20._24_4_ * fVar212 * 4.0;
        auVar83._28_4_ = auVar130._28_4_;
        auVar26 = vsubps_avx(auVar66,auVar83);
        auVar130 = vcmpps_avx(auVar26,ZEXT832(0) << 0x20,5);
        if ((((((((auVar130 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                 (auVar130 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                (auVar130 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
               SUB321(auVar130 >> 0x7f,0) == '\0') &&
              (auVar130 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
             SUB321(auVar130 >> 0xbf,0) == '\0') &&
            (auVar130 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
            -1 < auVar130[0x1f]) {
          auVar310 = ZEXT828(0) << 0x20;
          auVar278 = SUB6428(ZEXT864(0),0) << 0x20;
          auVar438 = ZEXT1628(ZEXT816(0) << 0x40);
          _local_ba0 = ZEXT832(0) << 0x20;
          auVar342._8_4_ = 0x7f800000;
          auVar342._0_8_ = 0x7f8000007f800000;
          auVar342._12_4_ = 0x7f800000;
          auVar342._16_4_ = 0x7f800000;
          auVar342._20_4_ = 0x7f800000;
          auVar342._24_4_ = 0x7f800000;
          auVar342._28_4_ = 0x7f800000;
          auVar386._8_4_ = 0xff800000;
          auVar386._0_8_ = 0xff800000ff800000;
          auVar386._12_4_ = 0xff800000;
          auVar386._16_4_ = 0xff800000;
          auVar386._20_4_ = 0xff800000;
          auVar386._24_4_ = 0xff800000;
          auVar386._28_4_ = 0xff800000;
          _local_b80 = _local_ba0;
          local_b20 = auVar30;
        }
        else {
          auVar27 = vrcpps_avx(local_340);
          fVar302 = auVar27._0_4_;
          auVar261._0_4_ = local_340._0_4_ * fVar302;
          fVar203 = auVar27._4_4_;
          auVar261._4_4_ = local_340._4_4_ * fVar203;
          fVar240 = auVar27._8_4_;
          auVar261._8_4_ = local_340._8_4_ * fVar240;
          fVar201 = auVar27._12_4_;
          auVar261._12_4_ = local_340._12_4_ * fVar201;
          fVar245 = auVar27._16_4_;
          auVar261._16_4_ = local_340._16_4_ * fVar245;
          fVar244 = auVar27._20_4_;
          auVar261._20_4_ = local_340._20_4_ * fVar244;
          fVar266 = auVar27._24_4_;
          auVar261._24_4_ = local_340._24_4_ * fVar266;
          auVar261._28_4_ = 0;
          auVar29 = vsubps_avx(auVar385,auVar261);
          auVar28 = vsqrtps_avx(auVar26);
          fVar302 = fVar302 + fVar302 * auVar29._0_4_;
          fVar203 = fVar203 + fVar203 * auVar29._4_4_;
          fVar240 = fVar240 + fVar240 * auVar29._8_4_;
          fVar201 = fVar201 + fVar201 * auVar29._12_4_;
          fVar245 = fVar245 + fVar245 * auVar29._16_4_;
          fVar244 = fVar244 + fVar244 * auVar29._20_4_;
          fVar266 = fVar266 + fVar266 * auVar29._24_4_;
          auVar30 = vsubps_avx(local_320,auVar28);
          auVar316._0_4_ = auVar30._0_4_ * fVar302;
          auVar316._4_4_ = auVar30._4_4_ * fVar203;
          auVar316._8_4_ = auVar30._8_4_ * fVar240;
          auVar316._12_4_ = auVar30._12_4_ * fVar201;
          auVar316._16_4_ = auVar30._16_4_ * fVar245;
          auVar316._20_4_ = auVar30._20_4_ * fVar244;
          auVar316._28_36_ = auVar373._28_36_;
          auVar316._24_4_ = auVar30._24_4_ * fVar266;
          auVar30 = vsubps_avx(auVar28,local_a60);
          fVar302 = auVar30._0_4_ * fVar302;
          fVar203 = auVar30._4_4_ * fVar203;
          auVar84._4_4_ = fVar203;
          auVar84._0_4_ = fVar302;
          fVar240 = auVar30._8_4_ * fVar240;
          auVar84._8_4_ = fVar240;
          fVar201 = auVar30._12_4_ * fVar201;
          auVar84._12_4_ = fVar201;
          fVar245 = auVar30._16_4_ * fVar245;
          auVar84._16_4_ = fVar245;
          fVar244 = auVar30._20_4_ * fVar244;
          auVar84._20_4_ = fVar244;
          fVar266 = auVar30._24_4_ * fVar266;
          auVar84._24_4_ = fVar266;
          auVar84._28_4_ = fVar180;
          fVar270 = (auVar316._0_4_ * local_560 + local_620) * local_600;
          fVar272 = (auVar316._4_4_ * fStack_55c + fStack_61c) * fStack_5fc;
          fVar290 = (auVar316._8_4_ * fStack_558 + fStack_618) * fStack_5f8;
          fVar298 = (auVar316._12_4_ * fStack_554 + fStack_614) * fStack_5f4;
          fVar300 = (auVar316._16_4_ * fStack_550 + fStack_610) * fStack_5f0;
          fVar291 = (auVar316._20_4_ * fStack_54c + fStack_60c) * fStack_5ec;
          fVar299 = (auVar316._24_4_ * fStack_548 + fStack_608) * fStack_5e8;
          auVar194._0_4_ = fVar304 + fVar270 * fVar239;
          auVar194._4_4_ = fVar318 + fVar272 * fVar243;
          auVar194._8_4_ = fVar321 + fVar290 * fVar269;
          auVar194._12_4_ = fVar324 + fVar298 * fVar296;
          auVar194._16_4_ = fVar327 + fVar300 * fVar297;
          auVar194._20_4_ = fVar330 + fVar291 * fVar323;
          auVar194._24_4_ = fVar333 + fVar299 * fVar34;
          auVar194._28_4_ = fVar335 + auVar27._28_4_ + auVar29._28_4_ + fStack_604;
          auVar85._4_4_ = auVar316._4_4_ * (float)local_ae0._4_4_;
          auVar85._0_4_ = auVar316._0_4_ * (float)local_ae0._0_4_;
          auVar85._8_4_ = auVar316._8_4_ * fStack_ad8;
          auVar85._12_4_ = auVar316._12_4_ * fStack_ad4;
          auVar85._16_4_ = auVar316._16_4_ * fStack_ad0;
          auVar85._20_4_ = auVar316._20_4_ * fStack_acc;
          auVar85._24_4_ = auVar316._24_4_ * fStack_ac8;
          auVar85._28_4_ = auVar28._28_4_;
          local_a00 = vsubps_avx(auVar85,auVar194);
          auVar285._0_4_ = auVar435._0_4_ + fVar270 * fVar238;
          auVar285._4_4_ = auVar435._4_4_ + fVar272 * fVar241;
          auVar285._8_4_ = auVar435._8_4_ + fVar290 * fVar267;
          auVar285._12_4_ = auVar435._12_4_ + fVar298 * fVar292;
          auVar285._16_4_ = auVar435._16_4_ + fVar300 * fVar293;
          auVar285._20_4_ = auVar435._20_4_ + fVar291 * fVar317;
          auVar285._24_4_ = auVar435._24_4_ + fVar299 * fVar390;
          auVar285._28_4_ = auVar435._28_4_ + auVar28._28_4_;
          auVar86._4_4_ = (float)local_800._4_4_ * auVar316._4_4_;
          auVar86._0_4_ = (float)local_800._0_4_ * auVar316._0_4_;
          auVar86._8_4_ = fStack_7f8 * auVar316._8_4_;
          auVar86._12_4_ = fStack_7f4 * auVar316._12_4_;
          auVar86._16_4_ = fStack_7f0 * auVar316._16_4_;
          auVar86._20_4_ = fStack_7ec * auVar316._20_4_;
          auVar86._24_4_ = fStack_7e8 * auVar316._24_4_;
          auVar86._28_4_ = 0x3e000000;
          _local_b80 = vsubps_avx(auVar86,auVar285);
          auVar262._0_4_ = local_2e0._0_4_ + fVar109 * fVar270;
          auVar262._4_4_ = local_2e0._4_4_ + fVar242 * fVar272;
          auVar262._8_4_ = local_2e0._8_4_ + fVar268 * fVar290;
          auVar262._12_4_ = local_2e0._12_4_ + fVar294 * fVar298;
          auVar262._16_4_ = local_2e0._16_4_ + fVar295 * fVar300;
          auVar262._20_4_ = local_2e0._20_4_ + fVar320 * fVar291;
          auVar262._24_4_ = local_2e0._24_4_ + fVar33 * fVar299;
          auVar262._28_4_ = local_2e0._28_4_ + auVar30._28_4_;
          auVar87._4_4_ = auVar316._4_4_ * (float)local_9a0._4_4_;
          auVar87._0_4_ = auVar316._0_4_ * (float)local_9a0._0_4_;
          auVar87._8_4_ = auVar316._8_4_ * fStack_998;
          auVar87._12_4_ = auVar316._12_4_ * fStack_994;
          auVar87._16_4_ = auVar316._16_4_ * fStack_990;
          auVar87._20_4_ = auVar316._20_4_ * fStack_98c;
          auVar87._24_4_ = auVar316._24_4_ * fStack_988;
          auVar87._28_4_ = auVar285._28_4_;
          _local_ba0 = vsubps_avx(auVar87,auVar262);
          fVar270 = (fVar302 * local_560 + local_620) * local_600;
          fVar272 = (fVar203 * fStack_55c + fStack_61c) * fStack_5fc;
          fVar290 = (fVar240 * fStack_558 + fStack_618) * fStack_5f8;
          fVar298 = (fVar201 * fStack_554 + fStack_614) * fStack_5f4;
          fVar300 = (fVar245 * fStack_550 + fStack_610) * fStack_5f0;
          fVar291 = (fVar244 * fStack_54c + fStack_60c) * fStack_5ec;
          fVar299 = (fVar266 * fStack_548 + fStack_608) * fStack_5e8;
          auVar263._0_4_ = fVar304 + fVar270 * fVar239;
          auVar263._4_4_ = fVar318 + fVar272 * fVar243;
          auVar263._8_4_ = fVar321 + fVar290 * fVar269;
          auVar263._12_4_ = fVar324 + fVar298 * fVar296;
          auVar263._16_4_ = fVar327 + fVar300 * fVar297;
          auVar263._20_4_ = fVar330 + fVar291 * fVar323;
          auVar263._24_4_ = fVar333 + fVar299 * fVar34;
          auVar263._28_4_ = fVar335 + local_ba0._28_4_ + fStack_604;
          auVar88._4_4_ = fVar203 * (float)local_ae0._4_4_;
          auVar88._0_4_ = fVar302 * (float)local_ae0._0_4_;
          auVar88._8_4_ = fVar240 * fStack_ad8;
          auVar88._12_4_ = fVar201 * fStack_ad4;
          auVar88._16_4_ = fVar245 * fStack_ad0;
          auVar88._20_4_ = fVar244 * fStack_acc;
          auVar88._24_4_ = fVar266 * fStack_ac8;
          auVar88._28_4_ = 0x3e000000;
          auVar27 = vsubps_avx(auVar88,auVar263);
          auVar256 = auVar27._0_28_;
          auVar314._0_4_ = auVar435._0_4_ + fVar270 * fVar238;
          auVar314._4_4_ = auVar435._4_4_ + fVar272 * fVar241;
          auVar314._8_4_ = auVar435._8_4_ + fVar290 * fVar267;
          auVar314._12_4_ = auVar435._12_4_ + fVar298 * fVar292;
          auVar314._16_4_ = auVar435._16_4_ + fVar300 * fVar293;
          auVar314._20_4_ = auVar435._20_4_ + fVar291 * fVar317;
          auVar314._24_4_ = auVar435._24_4_ + fVar299 * fVar390;
          auVar314._28_4_ = auVar435._28_4_ + 0.125;
          auVar89._4_4_ = (float)local_800._4_4_ * fVar203;
          auVar89._0_4_ = (float)local_800._0_4_ * fVar302;
          auVar89._8_4_ = fStack_7f8 * fVar240;
          auVar89._12_4_ = fStack_7f4 * fVar201;
          auVar89._16_4_ = fStack_7f0 * fVar245;
          auVar89._20_4_ = fStack_7ec * fVar244;
          auVar89._24_4_ = fStack_7e8 * fVar266;
          auVar89._28_4_ = fStack_ac4;
          auVar27 = vsubps_avx(auVar89,auVar314);
          auVar310 = auVar27._0_28_;
          auVar286._0_4_ = local_2e0._0_4_ + fVar109 * fVar270;
          auVar286._4_4_ = local_2e0._4_4_ + fVar242 * fVar272;
          auVar286._8_4_ = local_2e0._8_4_ + fVar268 * fVar290;
          auVar286._12_4_ = local_2e0._12_4_ + fVar294 * fVar298;
          auVar286._16_4_ = local_2e0._16_4_ + fVar295 * fVar300;
          auVar286._20_4_ = local_2e0._20_4_ + fVar320 * fVar291;
          auVar286._24_4_ = local_2e0._24_4_ + fVar33 * fVar299;
          auVar286._28_4_ = local_2e0._28_4_ + auVar285._28_4_;
          auVar90._4_4_ = fVar203 * (float)local_9a0._4_4_;
          auVar90._0_4_ = fVar302 * (float)local_9a0._0_4_;
          auVar90._8_4_ = fVar240 * fStack_998;
          auVar90._12_4_ = fVar201 * fStack_994;
          auVar90._16_4_ = fVar245 * fStack_990;
          auVar90._20_4_ = fVar244 * fStack_98c;
          auVar90._24_4_ = fVar266 * fStack_988;
          auVar90._28_4_ = fStack_ac4;
          auVar27 = vsubps_avx(auVar90,auVar286);
          auVar278 = auVar27._0_28_;
          auVar26 = vcmpps_avx(auVar26,ZEXT832(0) << 0x20,5);
          auVar343._8_4_ = 0x7f800000;
          auVar343._0_8_ = 0x7f8000007f800000;
          auVar343._12_4_ = 0x7f800000;
          auVar343._16_4_ = 0x7f800000;
          auVar343._20_4_ = 0x7f800000;
          auVar343._24_4_ = 0x7f800000;
          auVar343._28_4_ = 0x7f800000;
          auVar342 = vblendvps_avx(auVar343,auVar316._0_32_,auVar26);
          auVar27 = vmaxps_avx(local_5a0,local_440);
          auVar91._4_4_ = auVar27._4_4_ * 1.9073486e-06;
          auVar91._0_4_ = auVar27._0_4_ * 1.9073486e-06;
          auVar91._8_4_ = auVar27._8_4_ * 1.9073486e-06;
          auVar91._12_4_ = auVar27._12_4_ * 1.9073486e-06;
          auVar91._16_4_ = auVar27._16_4_ * 1.9073486e-06;
          auVar91._20_4_ = auVar27._20_4_ * 1.9073486e-06;
          auVar91._24_4_ = auVar27._24_4_ * 1.9073486e-06;
          auVar91._28_4_ = auVar27._28_4_;
          auVar27 = vcmpps_avx(local_a40,auVar91,1);
          auVar387._8_4_ = 0xff800000;
          auVar387._0_8_ = 0xff800000ff800000;
          auVar387._12_4_ = 0xff800000;
          auVar387._16_4_ = 0xff800000;
          auVar387._20_4_ = 0xff800000;
          auVar387._24_4_ = 0xff800000;
          auVar387._28_4_ = 0xff800000;
          auVar386 = vblendvps_avx(auVar387,auVar84,auVar26);
          auVar28 = auVar26 & auVar27;
          if ((((((((auVar28 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                   (auVar28 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                  (auVar28 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                 SUB321(auVar28 >> 0x7f,0) != '\0') ||
                (auVar28 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
               SUB321(auVar28 >> 0xbf,0) != '\0') ||
              (auVar28 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
              auVar28[0x1f] < '\0') {
            auVar130 = vandps_avx(auVar27,auVar26);
            auVar222 = vpackssdw_avx(auVar130._0_16_,auVar130._16_16_);
            auVar28 = vcmpps_avx(local_b20,_DAT_01f7b000,2);
            auVar177._8_4_ = 0xff800000;
            auVar177._0_8_ = 0xff800000ff800000;
            auVar177._12_4_ = 0xff800000;
            auVar177._16_4_ = 0xff800000;
            auVar177._20_4_ = 0xff800000;
            auVar177._24_4_ = 0xff800000;
            auVar177._28_4_ = 0xff800000;
            auVar200._8_4_ = 0x7f800000;
            auVar200._0_8_ = 0x7f8000007f800000;
            auVar200._12_4_ = 0x7f800000;
            auVar200._16_4_ = 0x7f800000;
            auVar200._20_4_ = 0x7f800000;
            auVar200._24_4_ = 0x7f800000;
            auVar200._28_4_ = 0x7f800000;
            auVar27 = vblendvps_avx(auVar200,auVar177,auVar28);
            auVar307 = vpmovsxwd_avx(auVar222);
            auVar222 = vpunpckhwd_avx(auVar222,auVar222);
            auVar437._16_16_ = auVar222;
            auVar437._0_16_ = auVar307;
            auVar342 = vblendvps_avx(auVar342,auVar27,auVar437);
            auVar27 = vblendvps_avx(auVar177,auVar200,auVar28);
            auVar386 = vblendvps_avx(auVar386,auVar27,auVar437);
            auVar237._0_8_ = auVar130._0_8_ ^ 0xffffffffffffffff;
            auVar237._8_4_ = auVar130._8_4_ ^ 0xffffffff;
            auVar237._12_4_ = auVar130._12_4_ ^ 0xffffffff;
            auVar237._16_4_ = auVar130._16_4_ ^ 0xffffffff;
            auVar237._20_4_ = auVar130._20_4_ ^ 0xffffffff;
            auVar237._24_4_ = auVar130._24_4_ ^ 0xffffffff;
            auVar237._28_4_ = auVar130._28_4_ ^ 0xffffffff;
            auVar130 = vorps_avx(auVar28,auVar237);
            auVar130 = vandps_avx(auVar26,auVar130);
          }
          auVar438 = local_a00._0_28_;
        }
        _local_4c0 = local_820;
        local_4a0 = vminps_avx(local_460,auVar342);
        _local_8a0 = vmaxps_avx(local_820,auVar386);
        _local_480 = _local_8a0;
        auVar26 = vcmpps_avx(local_820,local_4a0,2);
        local_780 = vandps_avx(auVar189,auVar26);
        auVar26 = vcmpps_avx(_local_8a0,local_460,2);
        local_900 = vandps_avx(auVar189,auVar26);
        auVar189 = vorps_avx(local_900,local_780);
        if ((((((((auVar189 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                 (auVar189 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                (auVar189 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
               SUB321(auVar189 >> 0x7f,0) != '\0') ||
              (auVar189 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
             SUB321(auVar189 >> 0xbf,0) != '\0') ||
            (auVar189 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
            auVar189[0x1f] < '\0') {
          auStack_938 = auVar31._8_24_;
          auVar169._0_8_ = auVar130._0_8_ ^ 0xffffffffffffffff;
          auVar169._8_4_ = auVar130._8_4_ ^ 0xffffffff;
          auVar169._12_4_ = auVar130._12_4_ ^ 0xffffffff;
          auVar169._16_4_ = auVar130._16_4_ ^ 0xffffffff;
          auVar169._20_4_ = auVar130._20_4_ ^ 0xffffffff;
          auVar169._24_4_ = auVar130._24_4_ ^ 0xffffffff;
          fVar302 = auVar130._28_4_;
          auVar169._28_4_ = (uint)fVar302 ^ 0xffffffff;
          auVar131._0_4_ =
               (float)local_ae0._0_4_ * auVar256._0_4_ +
               (float)local_800._0_4_ * auVar310._0_4_ + (float)local_9a0._0_4_ * auVar278._0_4_;
          auVar131._4_4_ =
               (float)local_ae0._4_4_ * auVar256._4_4_ +
               (float)local_800._4_4_ * auVar310._4_4_ + (float)local_9a0._4_4_ * auVar278._4_4_;
          auVar131._8_4_ =
               fStack_ad8 * auVar256._8_4_ +
               fStack_7f8 * auVar310._8_4_ + fStack_998 * auVar278._8_4_;
          auVar131._12_4_ =
               fStack_ad4 * auVar256._12_4_ +
               fStack_7f4 * auVar310._12_4_ + fStack_994 * auVar278._12_4_;
          auVar131._16_4_ =
               fStack_ad0 * auVar256._16_4_ +
               fStack_7f0 * auVar310._16_4_ + fStack_990 * auVar278._16_4_;
          auVar131._20_4_ =
               fStack_acc * auVar256._20_4_ +
               fStack_7ec * auVar310._20_4_ + fStack_98c * auVar278._20_4_;
          auVar131._24_4_ =
               fStack_ac8 * auVar256._24_4_ +
               fStack_7e8 * auVar310._24_4_ + fStack_988 * auVar278._24_4_;
          auVar131._28_4_ = fVar302 + local_900._28_4_ + auVar189._28_4_;
          auVar264._8_4_ = 0x7fffffff;
          auVar264._0_8_ = 0x7fffffff7fffffff;
          auVar264._12_4_ = 0x7fffffff;
          auVar264._16_4_ = 0x7fffffff;
          auVar264._20_4_ = 0x7fffffff;
          auVar264._24_4_ = 0x7fffffff;
          auVar264._28_4_ = 0x7fffffff;
          auVar189 = vandps_avx(auVar131,auVar264);
          auVar287._8_4_ = 0x3e99999a;
          auVar287._0_8_ = 0x3e99999a3e99999a;
          auVar287._12_4_ = 0x3e99999a;
          auVar287._16_4_ = 0x3e99999a;
          auVar287._20_4_ = 0x3e99999a;
          auVar287._24_4_ = 0x3e99999a;
          auVar287._28_4_ = 0x3e99999a;
          auVar189 = vcmpps_avx(auVar189,auVar287,1);
          local_7c0 = vorps_avx(auVar189,auVar169);
          auVar132._0_4_ =
               auVar438._0_4_ * (float)local_ae0._0_4_ +
               (float)local_800._0_4_ * (float)local_b80._0_4_ +
               (float)local_9a0._0_4_ * (float)local_ba0._0_4_;
          auVar132._4_4_ =
               auVar438._4_4_ * (float)local_ae0._4_4_ +
               (float)local_800._4_4_ * (float)local_b80._4_4_ +
               (float)local_9a0._4_4_ * (float)local_ba0._4_4_;
          auVar132._8_4_ =
               auVar438._8_4_ * fStack_ad8 + fStack_7f8 * fStack_b78 + fStack_998 * fStack_b98;
          auVar132._12_4_ =
               auVar438._12_4_ * fStack_ad4 + fStack_7f4 * fStack_b74 + fStack_994 * fStack_b94;
          auVar132._16_4_ =
               auVar438._16_4_ * fStack_ad0 + fStack_7f0 * fStack_b70 + fStack_990 * fStack_b90;
          auVar132._20_4_ =
               auVar438._20_4_ * fStack_acc + fStack_7ec * fStack_b6c + fStack_98c * fStack_b8c;
          auVar132._24_4_ =
               auVar438._24_4_ * fStack_ac8 + fStack_7e8 * fStack_b68 + fStack_988 * fStack_b88;
          auVar132._28_4_ = local_7c0._28_4_ + local_780._28_4_ + fVar302;
          auVar189 = vandps_avx(auVar132,auVar264);
          auVar189 = vcmpps_avx(auVar189,auVar287,1);
          auVar189 = vorps_avx(auVar189,auVar169);
          auVar170._8_4_ = 3;
          auVar170._0_8_ = 0x300000003;
          auVar170._12_4_ = 3;
          auVar170._16_4_ = 3;
          auVar170._20_4_ = 3;
          auVar170._24_4_ = 3;
          auVar170._28_4_ = 3;
          auVar196._8_4_ = 2;
          auVar196._0_8_ = 0x200000002;
          auVar196._12_4_ = 2;
          auVar196._16_4_ = 2;
          auVar196._20_4_ = 2;
          auVar196._24_4_ = 2;
          auVar196._28_4_ = 2;
          auVar189 = vblendvps_avx(auVar196,auVar170,auVar189);
          local_7e0 = ZEXT432(local_d24);
          local_840 = vpshufd_avx(ZEXT416(local_d24),0);
          auVar222 = vpcmpgtd_avx(auVar189._16_16_,local_840);
          auStack_830 = auVar42._16_16_;
          auVar307 = vpcmpgtd_avx(auVar189._0_16_,local_840);
          auVar171._16_16_ = auVar222;
          auVar171._0_16_ = auVar307;
          local_7a0 = vblendps_avx(ZEXT1632(auVar307),auVar171,0xf0);
          auVar189 = vandnps_avx(local_7a0,local_780);
          local_8c0._4_4_ = local_820._4_4_ + (float)local_920._4_4_;
          local_8c0._0_4_ = local_820._0_4_ + (float)local_920._0_4_;
          fStack_8b8 = local_820._8_4_ + fStack_918;
          fStack_8b4 = local_820._12_4_ + fStack_914;
          fStack_8b0 = local_820._16_4_ + fStack_910;
          fStack_8ac = local_820._20_4_ + fStack_90c;
          fStack_8a8 = local_820._24_4_ + fStack_908;
          fStack_8a4 = local_820._28_4_ + fStack_904;
          while( true ) {
            local_4e0 = auVar189;
            local_cd0._0_4_ = auVar38._0_4_;
            local_cd0._4_4_ = auVar38._4_4_;
            fStack_cc8 = auVar38._8_4_;
            fStack_cc4 = auVar38._12_4_;
            local_cf0 = auVar37._0_4_;
            fStack_cec = auVar37._4_4_;
            fStack_ce8 = auVar37._8_4_;
            fStack_ce4 = auVar37._12_4_;
            if ((((((((auVar189 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                     (auVar189 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                    (auVar189 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                   SUB321(auVar189 >> 0x7f,0) == '\0') &&
                  (auVar189 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                 SUB321(auVar189 >> 0xbf,0) == '\0') &&
                (auVar189 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                -1 < auVar189[0x1f]) break;
            auVar172._8_4_ = 0x7f800000;
            auVar172._0_8_ = 0x7f8000007f800000;
            auVar172._12_4_ = 0x7f800000;
            auVar172._16_4_ = 0x7f800000;
            auVar172._20_4_ = 0x7f800000;
            auVar172._24_4_ = 0x7f800000;
            auVar172._28_4_ = 0x7f800000;
            auVar130 = vblendvps_avx(auVar172,local_820,auVar189);
            auVar26 = vshufps_avx(auVar130,auVar130,0xb1);
            auVar26 = vminps_avx(auVar130,auVar26);
            auVar27 = vshufpd_avx(auVar26,auVar26,5);
            auVar26 = vminps_avx(auVar26,auVar27);
            auVar27 = vperm2f128_avx(auVar26,auVar26,1);
            auVar26 = vminps_avx(auVar26,auVar27);
            auVar130 = vcmpps_avx(auVar130,auVar26,0);
            auVar26 = auVar189 & auVar130;
            if ((((((((auVar26 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                     (auVar26 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                    (auVar26 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                   SUB321(auVar26 >> 0x7f,0) != '\0') ||
                  (auVar26 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                 SUB321(auVar26 >> 0xbf,0) != '\0') ||
                (auVar26 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                auVar26[0x1f] < '\0') {
              auVar189 = vandps_avx(auVar130,auVar189);
            }
            uVar96 = vmovmskps_avx(auVar189);
            uVar105 = 0;
            if (uVar96 != 0) {
              for (; (uVar96 >> uVar105 & 1) == 0; uVar105 = uVar105 + 1) {
              }
            }
            uVar99 = (ulong)uVar105;
            *(undefined4 *)(local_4e0 + uVar99 * 4) = 0;
            fVar302 = local_1a0[uVar99];
            uVar105 = *(uint *)(local_4c0 + uVar99 * 4);
            fVar238 = auVar152._0_4_;
            if ((float)local_a80._0_4_ < 0.0) {
              fVar238 = sqrtf((float)local_a80._0_4_);
            }
            auVar307 = vminps_avx(auVar38,_local_9c0);
            auVar222 = vmaxps_avx(auVar38,_local_9c0);
            auVar39 = vminps_avx(auVar37,_local_9e0);
            auVar114 = vminps_avx(auVar307,auVar39);
            auVar307 = vmaxps_avx(auVar37,_local_9e0);
            auVar39 = vmaxps_avx(auVar222,auVar307);
            auVar217._8_4_ = 0x7fffffff;
            auVar217._0_8_ = 0x7fffffff7fffffff;
            auVar217._12_4_ = 0x7fffffff;
            auVar222 = vandps_avx(auVar114,auVar217);
            auVar307 = vandps_avx(auVar39,auVar217);
            auVar222 = vmaxps_avx(auVar222,auVar307);
            auVar307 = vmovshdup_avx(auVar222);
            auVar307 = vmaxss_avx(auVar307,auVar222);
            auVar222 = vshufpd_avx(auVar222,auVar222,1);
            auVar222 = vmaxss_avx(auVar222,auVar307);
            local_b80._0_4_ = auVar222._0_4_ * 1.9073486e-06;
            local_b20._0_4_ = fVar238 * 1.9073486e-06;
            local_880._0_16_ = vshufps_avx(auVar39,auVar39,0xff);
            auVar222 = vinsertps_avx(ZEXT416(uVar105),ZEXT416((uint)fVar302),0x10);
            auVar316 = ZEXT1664(auVar222);
            lVar101 = 5;
            do {
              do {
                bVar106 = lVar101 == 0;
                lVar101 = lVar101 + -1;
                if (bVar106) goto LAB_00b08777;
                auVar307 = auVar316._0_16_;
                auVar222 = vmovshdup_avx(auVar307);
                fVar267 = auVar222._0_4_;
                fVar203 = 1.0 - fVar267;
                auVar222 = vshufps_avx(auVar307,auVar307,0x55);
                fVar302 = auVar222._0_4_;
                fVar238 = auVar222._4_4_;
                fVar109 = auVar222._8_4_;
                fVar239 = auVar222._12_4_;
                auVar222 = vshufps_avx(ZEXT416((uint)fVar203),ZEXT416((uint)fVar203),0);
                fVar240 = auVar222._0_4_;
                fVar201 = auVar222._4_4_;
                fVar241 = auVar222._8_4_;
                fVar242 = auVar222._12_4_;
                fVar243 = local_cf0 * fVar302 + (float)local_9c0._0_4_ * fVar240;
                fVar245 = fStack_cec * fVar238 + (float)local_9c0._4_4_ * fVar201;
                fVar244 = fStack_ce8 * fVar109 + fStack_9b8 * fVar241;
                fVar266 = fStack_ce4 * fVar239 + fStack_9b4 * fVar242;
                auVar273._0_4_ =
                     fVar240 * ((float)local_9c0._0_4_ * fVar302 + fVar240 * (float)local_cd0._0_4_)
                     + fVar302 * fVar243;
                auVar273._4_4_ =
                     fVar201 * ((float)local_9c0._4_4_ * fVar238 + fVar201 * (float)local_cd0._4_4_)
                     + fVar238 * fVar245;
                auVar273._8_4_ =
                     fVar241 * (fStack_9b8 * fVar109 + fVar241 * fStack_cc8) + fVar109 * fVar244;
                auVar273._12_4_ =
                     fVar242 * (fStack_9b4 * fVar239 + fVar242 * fStack_cc4) + fVar239 * fVar266;
                auVar218._0_4_ =
                     fVar240 * fVar243 +
                     fVar302 * (fVar302 * (float)local_9e0._0_4_ + local_cf0 * fVar240);
                auVar218._4_4_ =
                     fVar201 * fVar245 +
                     fVar238 * (fVar238 * (float)local_9e0._4_4_ + fStack_cec * fVar201);
                auVar218._8_4_ =
                     fVar241 * fVar244 + fVar109 * (fVar109 * fStack_9d8 + fStack_ce8 * fVar241);
                auVar218._12_4_ =
                     fVar242 * fVar266 + fVar239 * (fVar239 * fStack_9d4 + fStack_ce4 * fVar242);
                auVar222 = vshufps_avx(auVar307,auVar307,0);
                auVar154._0_4_ = auVar222._0_4_ * (float)local_a70._0_4_ + 0.0;
                auVar154._4_4_ = auVar222._4_4_ * (float)local_a70._4_4_ + 0.0;
                auVar154._8_4_ = auVar222._8_4_ * fStack_a68 + 0.0;
                auVar154._12_4_ = auVar222._12_4_ * fStack_a64 + 0.0;
                auVar113._0_4_ = fVar240 * auVar273._0_4_ + fVar302 * auVar218._0_4_;
                auVar113._4_4_ = fVar201 * auVar273._4_4_ + fVar238 * auVar218._4_4_;
                auVar113._8_4_ = fVar241 * auVar273._8_4_ + fVar109 * auVar218._8_4_;
                auVar113._12_4_ = fVar242 * auVar273._12_4_ + fVar239 * auVar218._12_4_;
                local_a00._0_16_ = auVar113;
                auVar222 = vsubps_avx(auVar154,auVar113);
                _local_ba0 = auVar222;
                auVar222 = vdpps_avx(auVar222,auVar222,0x7f);
                fVar302 = auVar222._0_4_;
                if (fVar302 < 0.0) {
                  local_b40._0_16_ = auVar218;
                  fVar238 = sqrtf(fVar302);
                  auVar316 = ZEXT1664(auVar307);
                  auVar218 = local_b40._0_16_;
                }
                else {
                  auVar39 = vsqrtss_avx(auVar222,auVar222);
                  fVar238 = auVar39._0_4_;
                }
                auVar39 = vsubps_avx(auVar218,auVar273);
                auVar336._0_4_ = auVar39._0_4_ * 3.0;
                auVar336._4_4_ = auVar39._4_4_ * 3.0;
                auVar336._8_4_ = auVar39._8_4_ * 3.0;
                auVar336._12_4_ = auVar39._12_4_ * 3.0;
                auVar39 = vshufps_avx(ZEXT416((uint)(fVar267 * 6.0)),ZEXT416((uint)(fVar267 * 6.0)),
                                      0);
                auVar114 = ZEXT416((uint)((fVar203 - (fVar267 + fVar267)) * 6.0));
                auVar184 = vshufps_avx(auVar114,auVar114,0);
                auVar114 = ZEXT416((uint)((fVar267 - (fVar203 + fVar203)) * 6.0));
                auVar219 = vshufps_avx(auVar114,auVar114,0);
                auVar40 = vshufps_avx(ZEXT416((uint)(fVar203 * 6.0)),ZEXT416((uint)(fVar203 * 6.0)),
                                      0);
                auVar114 = vdpps_avx(auVar336,auVar336,0x7f);
                auVar155._0_4_ =
                     auVar40._0_4_ * (float)local_cd0._0_4_ +
                     auVar219._0_4_ * (float)local_9c0._0_4_ +
                     auVar39._0_4_ * (float)local_9e0._0_4_ + auVar184._0_4_ * local_cf0;
                auVar155._4_4_ =
                     auVar40._4_4_ * (float)local_cd0._4_4_ +
                     auVar219._4_4_ * (float)local_9c0._4_4_ +
                     auVar39._4_4_ * (float)local_9e0._4_4_ + auVar184._4_4_ * fStack_cec;
                auVar155._8_4_ =
                     auVar40._8_4_ * fStack_cc8 +
                     auVar219._8_4_ * fStack_9b8 +
                     auVar39._8_4_ * fStack_9d8 + auVar184._8_4_ * fStack_ce8;
                auVar155._12_4_ =
                     auVar40._12_4_ * fStack_cc4 +
                     auVar219._12_4_ * fStack_9b4 +
                     auVar39._12_4_ * fStack_9d4 + auVar184._12_4_ * fStack_ce4;
                auVar39 = vblendps_avx(auVar114,_DAT_01f45a50,0xe);
                auVar184 = vrsqrtss_avx(auVar39,auVar39);
                fVar239 = auVar184._0_4_;
                fVar109 = auVar114._0_4_;
                auVar184 = vdpps_avx(auVar336,auVar155,0x7f);
                auVar219 = vshufps_avx(auVar114,auVar114,0);
                auVar156._0_4_ = auVar155._0_4_ * auVar219._0_4_;
                auVar156._4_4_ = auVar155._4_4_ * auVar219._4_4_;
                auVar156._8_4_ = auVar155._8_4_ * auVar219._8_4_;
                auVar156._12_4_ = auVar155._12_4_ * auVar219._12_4_;
                auVar184 = vshufps_avx(auVar184,auVar184,0);
                auVar248._0_4_ = auVar336._0_4_ * auVar184._0_4_;
                auVar248._4_4_ = auVar336._4_4_ * auVar184._4_4_;
                auVar248._8_4_ = auVar336._8_4_ * auVar184._8_4_;
                auVar248._12_4_ = auVar336._12_4_ * auVar184._12_4_;
                auVar40 = vsubps_avx(auVar156,auVar248);
                auVar184 = vrcpss_avx(auVar39,auVar39);
                auVar39 = vmaxss_avx(ZEXT416((uint)local_b80._0_4_),
                                     ZEXT416((uint)(auVar316._0_4_ * (float)local_b20._0_4_)));
                auVar184 = ZEXT416((uint)(auVar184._0_4_ * (2.0 - fVar109 * auVar184._0_4_)));
                auVar184 = vshufps_avx(auVar184,auVar184,0);
                uVar99 = CONCAT44(auVar336._4_4_,auVar336._0_4_);
                auVar274._0_8_ = uVar99 ^ 0x8000000080000000;
                auVar274._8_4_ = -auVar336._8_4_;
                auVar274._12_4_ = -auVar336._12_4_;
                auVar219 = ZEXT416((uint)(fVar239 * 1.5 +
                                         fVar109 * -0.5 * fVar239 * fVar239 * fVar239));
                auVar219 = vshufps_avx(auVar219,auVar219,0);
                auVar220._0_4_ = auVar219._0_4_ * auVar40._0_4_ * auVar184._0_4_;
                auVar220._4_4_ = auVar219._4_4_ * auVar40._4_4_ * auVar184._4_4_;
                auVar220._8_4_ = auVar219._8_4_ * auVar40._8_4_ * auVar184._8_4_;
                auVar220._12_4_ = auVar219._12_4_ * auVar40._12_4_ * auVar184._12_4_;
                auVar308._0_4_ = auVar336._0_4_ * auVar219._0_4_;
                auVar308._4_4_ = auVar336._4_4_ * auVar219._4_4_;
                auVar308._8_4_ = auVar336._8_4_ * auVar219._8_4_;
                auVar308._12_4_ = auVar336._12_4_ * auVar219._12_4_;
                if (fVar109 < 0.0) {
                  local_b40._0_16_ = auVar274;
                  local_980._0_16_ = auVar308;
                  local_ac0._0_16_ = auVar220;
                  fVar109 = sqrtf(fVar109);
                  auVar220 = local_ac0._0_16_;
                  auVar274 = local_b40._0_16_;
                  auVar308 = local_980._0_16_;
                }
                else {
                  auVar114 = vsqrtss_avx(auVar114,auVar114);
                  fVar109 = auVar114._0_4_;
                }
                auVar114 = vdpps_avx(_local_ba0,auVar308,0x7f);
                fVar238 = ((float)local_b80._0_4_ / fVar109) * (fVar238 + 1.0) +
                          auVar39._0_4_ + fVar238 * (float)local_b80._0_4_;
                auVar184 = vdpps_avx(auVar274,auVar308,0x7f);
                auVar219 = vdpps_avx(_local_ba0,auVar220,0x7f);
                auVar40 = vdpps_avx(_local_a70,auVar308,0x7f);
                auVar41 = vdpps_avx(_local_ba0,auVar274,0x7f);
                fVar109 = auVar184._0_4_ + auVar219._0_4_;
                fVar239 = auVar114._0_4_;
                auVar115._0_4_ = fVar239 * fVar239;
                auVar115._4_4_ = auVar114._4_4_ * auVar114._4_4_;
                auVar115._8_4_ = auVar114._8_4_ * auVar114._8_4_;
                auVar115._12_4_ = auVar114._12_4_ * auVar114._12_4_;
                auVar219 = vsubps_avx(auVar222,auVar115);
                auVar184 = vdpps_avx(_local_ba0,_local_a70,0x7f);
                fVar203 = auVar41._0_4_ - fVar239 * fVar109;
                fVar240 = auVar184._0_4_ - fVar239 * auVar40._0_4_;
                auVar184 = vrsqrtss_avx(auVar219,auVar219);
                fVar201 = auVar219._0_4_;
                fVar239 = auVar184._0_4_;
                fVar239 = fVar239 * 1.5 + fVar201 * -0.5 * fVar239 * fVar239 * fVar239;
                if (fVar201 < 0.0) {
                  local_b40._0_4_ = fVar238;
                  local_980._0_16_ = auVar40;
                  local_ac0._0_16_ = ZEXT416((uint)fVar109);
                  local_a40._0_4_ = fVar203;
                  local_a60._0_4_ = fVar240;
                  local_860._0_4_ = fVar239;
                  fVar201 = sqrtf(fVar201);
                  fVar239 = (float)local_860._0_4_;
                  fVar203 = (float)local_a40._0_4_;
                  fVar240 = (float)local_a60._0_4_;
                  auVar40 = local_980._0_16_;
                  fVar238 = (float)local_b40._0_4_;
                  auVar184 = local_ac0._0_16_;
                }
                else {
                  auVar184 = vsqrtss_avx(auVar219,auVar219);
                  fVar201 = auVar184._0_4_;
                  auVar184 = ZEXT416((uint)fVar109);
                }
                auVar41 = vpermilps_avx(local_a00._0_16_,0xff);
                auVar119 = vshufps_avx(auVar336,auVar336,0xff);
                fVar109 = fVar203 * fVar239 - auVar119._0_4_;
                auVar249._0_8_ = auVar40._0_8_ ^ 0x8000000080000000;
                auVar249._8_4_ = auVar40._8_4_ ^ 0x80000000;
                auVar249._12_4_ = auVar40._12_4_ ^ 0x80000000;
                auVar275._0_4_ = -fVar109;
                auVar275._4_4_ = 0x80000000;
                auVar275._8_4_ = 0x80000000;
                auVar275._12_4_ = 0x80000000;
                auVar219 = vinsertps_avx(auVar275,ZEXT416((uint)(fVar240 * fVar239)),0x1c);
                auVar40 = vmovsldup_avx(ZEXT416((uint)(auVar184._0_4_ * fVar240 * fVar239 -
                                                      auVar40._0_4_ * fVar109)));
                auVar219 = vdivps_avx(auVar219,auVar40);
                auVar184 = vinsertps_avx(auVar184,auVar249,0x10);
                auVar184 = vdivps_avx(auVar184,auVar40);
                auVar40 = vmovsldup_avx(auVar114);
                auVar116 = ZEXT416((uint)(fVar201 - auVar41._0_4_));
                auVar41 = vmovsldup_avx(auVar116);
                auVar185._0_4_ = auVar40._0_4_ * auVar219._0_4_ + auVar41._0_4_ * auVar184._0_4_;
                auVar185._4_4_ = auVar40._4_4_ * auVar219._4_4_ + auVar41._4_4_ * auVar184._4_4_;
                auVar185._8_4_ = auVar40._8_4_ * auVar219._8_4_ + auVar41._8_4_ * auVar184._8_4_;
                auVar185._12_4_ =
                     auVar40._12_4_ * auVar219._12_4_ + auVar41._12_4_ * auVar184._12_4_;
                auVar184 = vsubps_avx(auVar307,auVar185);
                auVar316 = ZEXT1664(auVar184);
                auVar186._8_4_ = 0x7fffffff;
                auVar186._0_8_ = 0x7fffffff7fffffff;
                auVar186._12_4_ = 0x7fffffff;
                auVar307 = vandps_avx(auVar114,auVar186);
              } while (fVar238 <= auVar307._0_4_);
              auVar221._8_4_ = 0x7fffffff;
              auVar221._0_8_ = 0x7fffffff7fffffff;
              auVar221._12_4_ = 0x7fffffff;
              auVar307 = vandps_avx(auVar116,auVar221);
            } while ((float)local_880._0_4_ * 1.9073486e-06 + auVar39._0_4_ + fVar238 <=
                     auVar307._0_4_);
            fVar238 = auVar184._0_4_ + (float)local_960._0_4_;
            if ((fVar214 <= fVar238) &&
               (fVar109 = *(float *)(ray + k * 4 + 0x100), fVar238 <= fVar109)) {
              auVar307 = vmovshdup_avx(auVar184);
              fVar239 = auVar307._0_4_;
              if ((0.0 <= fVar239) && (fVar239 <= 1.0)) {
                auVar222 = vrsqrtss_avx(auVar222,auVar222);
                fVar203 = auVar222._0_4_;
                pGVar19 = (context->scene->geometries).items[uVar102].ptr;
                if ((pGVar19->mask & *(uint *)(ray + k * 4 + 0x120)) != 0) {
                  auVar222 = ZEXT416((uint)(fVar203 * 1.5 +
                                           fVar302 * -0.5 * fVar203 * fVar203 * fVar203));
                  auVar222 = vshufps_avx(auVar222,auVar222,0);
                  auVar223._0_4_ = auVar222._0_4_ * (float)local_ba0._0_4_;
                  auVar223._4_4_ = auVar222._4_4_ * (float)local_ba0._4_4_;
                  auVar223._8_4_ = auVar222._8_4_ * fStack_b98;
                  auVar223._12_4_ = auVar222._12_4_ * fStack_b94;
                  auVar157._0_4_ = auVar336._0_4_ + auVar119._0_4_ * auVar223._0_4_;
                  auVar157._4_4_ = auVar336._4_4_ + auVar119._4_4_ * auVar223._4_4_;
                  auVar157._8_4_ = auVar336._8_4_ + auVar119._8_4_ * auVar223._8_4_;
                  auVar157._12_4_ = auVar336._12_4_ + auVar119._12_4_ * auVar223._12_4_;
                  auVar222 = vshufps_avx(auVar223,auVar223,0xc9);
                  auVar307 = vshufps_avx(auVar336,auVar336,0xc9);
                  auVar224._0_4_ = auVar307._0_4_ * auVar223._0_4_;
                  auVar224._4_4_ = auVar307._4_4_ * auVar223._4_4_;
                  auVar224._8_4_ = auVar307._8_4_ * auVar223._8_4_;
                  auVar224._12_4_ = auVar307._12_4_ * auVar223._12_4_;
                  auVar250._0_4_ = auVar336._0_4_ * auVar222._0_4_;
                  auVar250._4_4_ = auVar336._4_4_ * auVar222._4_4_;
                  auVar250._8_4_ = auVar336._8_4_ * auVar222._8_4_;
                  auVar250._12_4_ = auVar336._12_4_ * auVar222._12_4_;
                  auVar39 = vsubps_avx(auVar250,auVar224);
                  auVar222 = vshufps_avx(auVar39,auVar39,0xc9);
                  auVar307 = vshufps_avx(auVar157,auVar157,0xc9);
                  auVar251._0_4_ = auVar307._0_4_ * auVar222._0_4_;
                  auVar251._4_4_ = auVar307._4_4_ * auVar222._4_4_;
                  auVar251._8_4_ = auVar307._8_4_ * auVar222._8_4_;
                  auVar251._12_4_ = auVar307._12_4_ * auVar222._12_4_;
                  auVar222 = vshufps_avx(auVar39,auVar39,0xd2);
                  auVar158._0_4_ = auVar157._0_4_ * auVar222._0_4_;
                  auVar158._4_4_ = auVar157._4_4_ * auVar222._4_4_;
                  auVar158._8_4_ = auVar157._8_4_ * auVar222._8_4_;
                  auVar158._12_4_ = auVar157._12_4_ * auVar222._12_4_;
                  auVar222 = vsubps_avx(auVar251,auVar158);
                  if ((context->args->filter == (RTCFilterFunctionN)0x0) &&
                     (pGVar19->intersectionFilterN == (RTCFilterFunctionN)0x0)) {
                    *(float *)(ray + k * 4 + 0x100) = fVar238;
                    uVar104 = vextractps_avx(auVar222,1);
                    *(undefined4 *)(ray + k * 4 + 0x180) = uVar104;
                    uVar104 = vextractps_avx(auVar222,2);
                    *(undefined4 *)(ray + k * 4 + 0x1a0) = uVar104;
                    *(int *)(ray + k * 4 + 0x1c0) = auVar222._0_4_;
                    *(float *)(ray + k * 4 + 0x1e0) = fVar239;
                    *(undefined4 *)(ray + k * 4 + 0x200) = 0;
                    *(int *)(ray + k * 4 + 0x220) = (int)local_940;
                    *(uint *)(ray + k * 4 + 0x240) = uVar102;
                    *(uint *)(ray + k * 4 + 0x260) = context->user->instID[0];
                    *(uint *)(ray + k * 4 + 0x280) = context->user->instPrimID[0];
                  }
                  else {
                    pRVar25 = context->user;
                    auStack_6d0 = vshufps_avx(auVar184,auVar184,0x55);
                    auStack_730 = vshufps_avx(auVar222,auVar222,0x55);
                    auStack_710 = vshufps_avx(auVar222,auVar222,0xaa);
                    auStack_6f0 = vshufps_avx(auVar222,auVar222,0);
                    local_740 = (RTCHitN  [16])auStack_730;
                    local_720 = auStack_710;
                    local_700 = auStack_6f0;
                    local_6e0 = auStack_6d0;
                    local_6c0 = ZEXT832(0) << 0x20;
                    local_6a0 = local_5e0._0_8_;
                    uStack_698 = local_5e0._8_8_;
                    uStack_690 = local_5e0._16_8_;
                    uStack_688 = local_5e0._24_8_;
                    local_680 = local_5c0;
                    auVar189 = vcmpps_avx(local_5c0,local_5c0,0xf);
                    local_ae8[1] = auVar189;
                    *local_ae8 = auVar189;
                    local_660 = pRVar25->instID[0];
                    uStack_65c = local_660;
                    uStack_658 = local_660;
                    uStack_654 = local_660;
                    uStack_650 = local_660;
                    uStack_64c = local_660;
                    uStack_648 = local_660;
                    uStack_644 = local_660;
                    local_640 = pRVar25->instPrimID[0];
                    uStack_63c = local_640;
                    uStack_638 = local_640;
                    uStack_634 = local_640;
                    uStack_630 = local_640;
                    uStack_62c = local_640;
                    uStack_628 = local_640;
                    uStack_624 = local_640;
                    *(float *)(ray + k * 4 + 0x100) = fVar238;
                    local_c00 = *local_af0;
                    local_bf0 = *local_af8;
                    local_bd0.valid = (int *)local_c00;
                    local_bd0.geometryUserPtr = pGVar19->userPtr;
                    local_bd0.context = context->user;
                    local_bd0.hit = local_740;
                    local_bd0.N = 8;
                    local_bd0.ray = (RTCRayN *)ray;
                    if (pGVar19->intersectionFilterN != (RTCFilterFunctionN)0x0) {
                      (*pGVar19->intersectionFilterN)(&local_bd0);
                    }
                    auVar222 = vpcmpeqd_avx(local_c00,ZEXT816(0) << 0x40);
                    auVar307 = vpcmpeqd_avx(local_bf0,ZEXT816(0) << 0x40);
                    auVar197._16_16_ = auVar307;
                    auVar197._0_16_ = auVar222;
                    auVar189 = _DAT_01f7b020 & ~auVar197;
                    if ((((((((auVar189 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                             (auVar189 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                            (auVar189 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                           SUB321(auVar189 >> 0x7f,0) != '\0') ||
                          (auVar189 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                         SUB321(auVar189 >> 0xbf,0) != '\0') ||
                        (auVar189 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                        auVar189[0x1f] < '\0') {
                      p_Var24 = context->args->filter;
                      if ((p_Var24 != (RTCFilterFunctionN)0x0) &&
                         (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                           RTC_RAY_QUERY_FLAG_INCOHERENT ||
                          (((pGVar19->field_8).field_0x2 & 0x40) != 0)))) {
                        (*p_Var24)(&local_bd0);
                      }
                      auVar222 = vpcmpeqd_avx(local_c00,ZEXT816(0) << 0x40);
                      auVar307 = vpcmpeqd_avx(local_bf0,ZEXT816(0) << 0x40);
                      auVar133._16_16_ = auVar307;
                      auVar133._0_16_ = auVar222;
                      auVar189 = _DAT_01f7b020 & ~auVar133;
                      if ((((((((auVar189 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0
                               || (auVar189 >> 0x3f & (undefined1  [32])0x1) !=
                                  (undefined1  [32])0x0) ||
                              (auVar189 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0)
                             || SUB321(auVar189 >> 0x7f,0) != '\0') ||
                            (auVar189 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                           SUB321(auVar189 >> 0xbf,0) != '\0') ||
                          (auVar189 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                          auVar189[0x1f] < '\0') {
                        auVar134._0_8_ = auVar222._0_8_ ^ 0xffffffffffffffff;
                        auVar134._8_4_ = auVar222._8_4_ ^ 0xffffffff;
                        auVar134._12_4_ = auVar222._12_4_ ^ 0xffffffff;
                        auVar134._16_4_ = auVar307._0_4_ ^ 0xffffffff;
                        auVar134._20_4_ = auVar307._4_4_ ^ 0xffffffff;
                        auVar134._24_4_ = auVar307._8_4_ ^ 0xffffffff;
                        auVar134._28_4_ = auVar307._12_4_ ^ 0xffffffff;
                        auVar189 = vmaskmovps_avx(auVar134,*(undefined1 (*) [32])local_bd0.hit);
                        *(undefined1 (*) [32])(local_bd0.ray + 0x180) = auVar189;
                        auVar189 = vmaskmovps_avx(auVar134,*(undefined1 (*) [32])
                                                            (local_bd0.hit + 0x20));
                        *(undefined1 (*) [32])(local_bd0.ray + 0x1a0) = auVar189;
                        auVar189 = vmaskmovps_avx(auVar134,*(undefined1 (*) [32])
                                                            (local_bd0.hit + 0x40));
                        *(undefined1 (*) [32])(local_bd0.ray + 0x1c0) = auVar189;
                        auVar189 = vmaskmovps_avx(auVar134,*(undefined1 (*) [32])
                                                            (local_bd0.hit + 0x60));
                        *(undefined1 (*) [32])(local_bd0.ray + 0x1e0) = auVar189;
                        auVar189 = vmaskmovps_avx(auVar134,*(undefined1 (*) [32])
                                                            (local_bd0.hit + 0x80));
                        *(undefined1 (*) [32])(local_bd0.ray + 0x200) = auVar189;
                        auVar189 = vmaskmovps_avx(auVar134,*(undefined1 (*) [32])
                                                            (local_bd0.hit + 0xa0));
                        *(undefined1 (*) [32])(local_bd0.ray + 0x220) = auVar189;
                        auVar189 = vmaskmovps_avx(auVar134,*(undefined1 (*) [32])
                                                            (local_bd0.hit + 0xc0));
                        *(undefined1 (*) [32])(local_bd0.ray + 0x240) = auVar189;
                        auVar189 = vmaskmovps_avx(auVar134,*(undefined1 (*) [32])
                                                            (local_bd0.hit + 0xe0));
                        *(undefined1 (*) [32])(local_bd0.ray + 0x260) = auVar189;
                        auVar189 = vmaskmovps_avx(auVar134,*(undefined1 (*) [32])
                                                            (local_bd0.hit + 0x100));
                        *(undefined1 (*) [32])(local_bd0.ray + 0x280) = auVar189;
                        goto LAB_00b08777;
                      }
                    }
                    *(float *)(ray + k * 4 + 0x100) = fVar109;
                  }
                }
              }
            }
LAB_00b08777:
            uVar104 = *(undefined4 *)(ray + k * 4 + 0x100);
            auVar353._4_4_ = uVar104;
            auVar353._0_4_ = uVar104;
            auVar353._8_4_ = uVar104;
            auVar353._12_4_ = uVar104;
            auVar353._16_4_ = uVar104;
            auVar353._20_4_ = uVar104;
            auVar353._24_4_ = uVar104;
            auVar353._28_4_ = uVar104;
            auVar344 = ZEXT3264(auVar353);
            auVar189 = vcmpps_avx(_local_8c0,auVar353,2);
            auVar189 = vandps_avx(auVar189,local_4e0);
          }
          auVar135._0_4_ = (float)local_920._0_4_ + (float)local_8a0._0_4_;
          auVar135._4_4_ = (float)local_920._4_4_ + (float)local_8a0._4_4_;
          auVar135._8_4_ = fStack_918 + fStack_898;
          auVar135._12_4_ = fStack_914 + fStack_894;
          auVar135._16_4_ = fStack_910 + fStack_890;
          auVar135._20_4_ = fStack_90c + fStack_88c;
          auVar135._24_4_ = fStack_908 + fStack_888;
          auVar135._28_4_ = fStack_904 + fStack_884;
          auVar222 = vshufps_avx(auVar344._0_16_,auVar344._0_16_,0);
          auVar173._16_16_ = auVar222;
          auVar173._0_16_ = auVar222;
          auVar189 = vcmpps_avx(auVar135,auVar173,2);
          _local_8c0 = vandps_avx(auVar189,local_900);
          auVar136._8_4_ = 3;
          auVar136._0_8_ = 0x300000003;
          auVar136._12_4_ = 3;
          auVar136._16_4_ = 3;
          auVar136._20_4_ = 3;
          auVar136._24_4_ = 3;
          auVar136._28_4_ = 3;
          auVar174._8_4_ = 2;
          auVar174._0_8_ = 0x200000002;
          auVar174._12_4_ = 2;
          auVar174._16_4_ = 2;
          auVar174._20_4_ = 2;
          auVar174._24_4_ = 2;
          auVar174._28_4_ = 2;
          auVar189 = vblendvps_avx(auVar174,auVar136,local_7c0);
          auVar222 = vpcmpgtd_avx(auVar189._16_16_,local_840);
          auVar307 = vpshufd_avx(local_7e0._0_16_,0);
          auVar307 = vpcmpgtd_avx(auVar189._0_16_,auVar307);
          auVar175._16_16_ = auVar222;
          auVar175._0_16_ = auVar307;
          local_900 = vblendps_avx(ZEXT1632(auVar307),auVar175,0xf0);
          auVar189 = vandnps_avx(local_900,_local_8c0);
          local_820 = _local_480;
          local_8a0._4_4_ = (float)local_920._4_4_ + (float)local_480._4_4_;
          local_8a0._0_4_ = (float)local_920._0_4_ + (float)local_480._0_4_;
          fStack_898 = fStack_918 + fStack_478;
          fStack_894 = fStack_914 + fStack_474;
          fStack_890 = fStack_910 + fStack_470;
          fStack_88c = fStack_90c + fStack_46c;
          fStack_888 = fStack_908 + fStack_468;
          fStack_884 = fStack_904 + fStack_464;
          auVar373 = ZEXT3264(local_aa0);
          auVar405 = ZEXT3264(local_b60);
          auVar316 = ZEXT3264(local_a20);
          while( true ) {
            local_500 = auVar189;
            if ((((((((auVar189 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                     (auVar189 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                    (auVar189 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                   SUB321(auVar189 >> 0x7f,0) == '\0') &&
                  (auVar189 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                 SUB321(auVar189 >> 0xbf,0) == '\0') &&
                (auVar189 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                -1 < auVar189[0x1f]) break;
            auVar176._8_4_ = 0x7f800000;
            auVar176._0_8_ = 0x7f8000007f800000;
            auVar176._12_4_ = 0x7f800000;
            auVar176._16_4_ = 0x7f800000;
            auVar176._20_4_ = 0x7f800000;
            auVar176._24_4_ = 0x7f800000;
            auVar176._28_4_ = 0x7f800000;
            auVar130 = vblendvps_avx(auVar176,local_820,auVar189);
            auVar26 = vshufps_avx(auVar130,auVar130,0xb1);
            auVar26 = vminps_avx(auVar130,auVar26);
            auVar27 = vshufpd_avx(auVar26,auVar26,5);
            auVar26 = vminps_avx(auVar26,auVar27);
            auVar27 = vperm2f128_avx(auVar26,auVar26,1);
            auVar26 = vminps_avx(auVar26,auVar27);
            auVar130 = vcmpps_avx(auVar130,auVar26,0);
            auVar26 = auVar189 & auVar130;
            if ((((((((auVar26 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                     (auVar26 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                    (auVar26 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                   SUB321(auVar26 >> 0x7f,0) != '\0') ||
                  (auVar26 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                 SUB321(auVar26 >> 0xbf,0) != '\0') ||
                (auVar26 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                auVar26[0x1f] < '\0') {
              auVar189 = vandps_avx(auVar130,auVar189);
            }
            uVar96 = vmovmskps_avx(auVar189);
            uVar105 = 0;
            if (uVar96 != 0) {
              for (; (uVar96 >> uVar105 & 1) == 0; uVar105 = uVar105 + 1) {
              }
            }
            uVar99 = (ulong)uVar105;
            *(undefined4 *)(local_500 + uVar99 * 4) = 0;
            fVar302 = local_1c0[uVar99];
            uVar105 = *(uint *)(local_460 + uVar99 * 4);
            fVar238 = auVar36._0_4_;
            if ((float)local_a80._0_4_ < 0.0) {
              fVar238 = sqrtf((float)local_a80._0_4_);
              auVar316 = ZEXT3264(local_a20);
              auVar405 = ZEXT3264(local_b60);
              auVar373 = ZEXT3264(local_aa0);
            }
            auVar307 = vminps_avx(auVar38,_local_9c0);
            auVar222 = vmaxps_avx(auVar38,_local_9c0);
            auVar39 = vminps_avx(auVar37,_local_9e0);
            auVar114 = vminps_avx(auVar307,auVar39);
            auVar307 = vmaxps_avx(auVar37,_local_9e0);
            auVar39 = vmaxps_avx(auVar222,auVar307);
            auVar225._8_4_ = 0x7fffffff;
            auVar225._0_8_ = 0x7fffffff7fffffff;
            auVar225._12_4_ = 0x7fffffff;
            auVar222 = vandps_avx(auVar114,auVar225);
            auVar307 = vandps_avx(auVar39,auVar225);
            auVar222 = vmaxps_avx(auVar222,auVar307);
            auVar307 = vmovshdup_avx(auVar222);
            auVar307 = vmaxss_avx(auVar307,auVar222);
            auVar222 = vshufpd_avx(auVar222,auVar222,1);
            auVar222 = vmaxss_avx(auVar222,auVar307);
            local_b80._0_4_ = auVar222._0_4_ * 1.9073486e-06;
            local_980._0_4_ = fVar238 * 1.9073486e-06;
            local_880._0_16_ = vshufps_avx(auVar39,auVar39,0xff);
            auVar222 = vinsertps_avx(ZEXT416(uVar105),ZEXT416((uint)fVar302),0x10);
            auVar344 = ZEXT1664(auVar222);
            lVar101 = 5;
            do {
              do {
                bVar106 = lVar101 == 0;
                lVar101 = lVar101 + -1;
                if (bVar106) goto LAB_00b09345;
                auVar307 = auVar344._0_16_;
                auVar222 = vmovshdup_avx(auVar307);
                fVar267 = auVar222._0_4_;
                fVar203 = 1.0 - fVar267;
                auVar222 = vshufps_avx(auVar307,auVar307,0x55);
                fVar302 = auVar222._0_4_;
                fVar238 = auVar222._4_4_;
                fVar109 = auVar222._8_4_;
                fVar239 = auVar222._12_4_;
                auVar222 = vshufps_avx(ZEXT416((uint)fVar203),ZEXT416((uint)fVar203),0);
                fVar240 = auVar222._0_4_;
                fVar201 = auVar222._4_4_;
                fVar241 = auVar222._8_4_;
                fVar242 = auVar222._12_4_;
                fVar243 = local_cf0 * fVar302 + (float)local_9c0._0_4_ * fVar240;
                fVar245 = fStack_cec * fVar238 + (float)local_9c0._4_4_ * fVar201;
                fVar244 = fStack_ce8 * fVar109 + fStack_9b8 * fVar241;
                fVar266 = fStack_ce4 * fVar239 + fStack_9b4 * fVar242;
                auVar276._0_4_ =
                     fVar240 * ((float)local_9c0._0_4_ * fVar302 + fVar240 * (float)local_cd0._0_4_)
                     + fVar302 * fVar243;
                auVar276._4_4_ =
                     fVar201 * ((float)local_9c0._4_4_ * fVar238 + fVar201 * (float)local_cd0._4_4_)
                     + fVar238 * fVar245;
                auVar276._8_4_ =
                     fVar241 * (fStack_9b8 * fVar109 + fVar241 * fStack_cc8) + fVar109 * fVar244;
                auVar276._12_4_ =
                     fVar242 * (fStack_9b4 * fVar239 + fVar242 * fStack_cc4) + fVar239 * fVar266;
                auVar226._0_4_ =
                     fVar240 * fVar243 +
                     fVar302 * (fVar302 * (float)local_9e0._0_4_ + local_cf0 * fVar240);
                auVar226._4_4_ =
                     fVar201 * fVar245 +
                     fVar238 * (fVar238 * (float)local_9e0._4_4_ + fStack_cec * fVar201);
                auVar226._8_4_ =
                     fVar241 * fVar244 + fVar109 * (fVar109 * fStack_9d8 + fStack_ce8 * fVar241);
                auVar226._12_4_ =
                     fVar242 * fVar266 + fVar239 * (fVar239 * fStack_9d4 + fStack_ce4 * fVar242);
                auVar222 = vshufps_avx(auVar307,auVar307,0);
                auVar159._0_4_ = auVar222._0_4_ * (float)local_a70._0_4_ + 0.0;
                auVar159._4_4_ = auVar222._4_4_ * (float)local_a70._4_4_ + 0.0;
                auVar159._8_4_ = auVar222._8_4_ * fStack_a68 + 0.0;
                auVar159._12_4_ = auVar222._12_4_ * fStack_a64 + 0.0;
                auVar117._0_4_ = fVar240 * auVar276._0_4_ + fVar302 * auVar226._0_4_;
                auVar117._4_4_ = fVar201 * auVar276._4_4_ + fVar238 * auVar226._4_4_;
                auVar117._8_4_ = fVar241 * auVar276._8_4_ + fVar109 * auVar226._8_4_;
                auVar117._12_4_ = fVar242 * auVar276._12_4_ + fVar239 * auVar226._12_4_;
                local_a00._0_16_ = auVar117;
                auVar222 = vsubps_avx(auVar159,auVar117);
                _local_ba0 = auVar222;
                auVar222 = vdpps_avx(auVar222,auVar222,0x7f);
                fVar302 = auVar222._0_4_;
                if (fVar302 < 0.0) {
                  local_b20._0_16_ = auVar276;
                  fVar238 = sqrtf(fVar302);
                  auVar344 = ZEXT1664(auVar307);
                  auVar276 = local_b20._0_16_;
                }
                else {
                  auVar39 = vsqrtss_avx(auVar222,auVar222);
                  fVar238 = auVar39._0_4_;
                }
                auVar39 = vsubps_avx(auVar226,auVar276);
                auVar309._0_4_ = auVar39._0_4_ * 3.0;
                auVar309._4_4_ = auVar39._4_4_ * 3.0;
                auVar309._8_4_ = auVar39._8_4_ * 3.0;
                auVar309._12_4_ = auVar39._12_4_ * 3.0;
                auVar39 = vshufps_avx(ZEXT416((uint)(fVar267 * 6.0)),ZEXT416((uint)(fVar267 * 6.0)),
                                      0);
                auVar114 = ZEXT416((uint)((fVar203 - (fVar267 + fVar267)) * 6.0));
                auVar184 = vshufps_avx(auVar114,auVar114,0);
                auVar114 = ZEXT416((uint)((fVar267 - (fVar203 + fVar203)) * 6.0));
                auVar219 = vshufps_avx(auVar114,auVar114,0);
                auVar40 = vshufps_avx(ZEXT416((uint)(fVar203 * 6.0)),ZEXT416((uint)(fVar203 * 6.0)),
                                      0);
                auVar114 = vdpps_avx(auVar309,auVar309,0x7f);
                auVar160._0_4_ =
                     auVar40._0_4_ * (float)local_cd0._0_4_ +
                     auVar219._0_4_ * (float)local_9c0._0_4_ +
                     auVar39._0_4_ * (float)local_9e0._0_4_ + auVar184._0_4_ * local_cf0;
                auVar160._4_4_ =
                     auVar40._4_4_ * (float)local_cd0._4_4_ +
                     auVar219._4_4_ * (float)local_9c0._4_4_ +
                     auVar39._4_4_ * (float)local_9e0._4_4_ + auVar184._4_4_ * fStack_cec;
                auVar160._8_4_ =
                     auVar40._8_4_ * fStack_cc8 +
                     auVar219._8_4_ * fStack_9b8 +
                     auVar39._8_4_ * fStack_9d8 + auVar184._8_4_ * fStack_ce8;
                auVar160._12_4_ =
                     auVar40._12_4_ * fStack_cc4 +
                     auVar219._12_4_ * fStack_9b4 +
                     auVar39._12_4_ * fStack_9d4 + auVar184._12_4_ * fStack_ce4;
                auVar39 = vblendps_avx(auVar114,_DAT_01f45a50,0xe);
                auVar184 = vrsqrtss_avx(auVar39,auVar39);
                fVar239 = auVar184._0_4_;
                fVar109 = auVar114._0_4_;
                auVar184 = vdpps_avx(auVar309,auVar160,0x7f);
                auVar219 = vshufps_avx(auVar114,auVar114,0);
                auVar161._0_4_ = auVar160._0_4_ * auVar219._0_4_;
                auVar161._4_4_ = auVar160._4_4_ * auVar219._4_4_;
                auVar161._8_4_ = auVar160._8_4_ * auVar219._8_4_;
                auVar161._12_4_ = auVar160._12_4_ * auVar219._12_4_;
                auVar184 = vshufps_avx(auVar184,auVar184,0);
                auVar252._0_4_ = auVar309._0_4_ * auVar184._0_4_;
                auVar252._4_4_ = auVar309._4_4_ * auVar184._4_4_;
                auVar252._8_4_ = auVar309._8_4_ * auVar184._8_4_;
                auVar252._12_4_ = auVar309._12_4_ * auVar184._12_4_;
                auVar40 = vsubps_avx(auVar161,auVar252);
                auVar184 = vrcpss_avx(auVar39,auVar39);
                auVar39 = vmaxss_avx(ZEXT416((uint)local_b80._0_4_),
                                     ZEXT416((uint)(auVar344._0_4_ * (float)local_980._0_4_)));
                auVar184 = ZEXT416((uint)(auVar184._0_4_ * (2.0 - fVar109 * auVar184._0_4_)));
                auVar184 = vshufps_avx(auVar184,auVar184,0);
                uVar99 = CONCAT44(auVar309._4_4_,auVar309._0_4_);
                auVar345._0_8_ = uVar99 ^ 0x8000000080000000;
                auVar345._8_4_ = -auVar309._8_4_;
                auVar345._12_4_ = -auVar309._12_4_;
                auVar219 = ZEXT416((uint)(fVar239 * 1.5 +
                                         fVar109 * -0.5 * fVar239 * fVar239 * fVar239));
                auVar219 = vshufps_avx(auVar219,auVar219,0);
                auVar227._0_4_ = auVar219._0_4_ * auVar40._0_4_ * auVar184._0_4_;
                auVar227._4_4_ = auVar219._4_4_ * auVar40._4_4_ * auVar184._4_4_;
                auVar227._8_4_ = auVar219._8_4_ * auVar40._8_4_ * auVar184._8_4_;
                auVar227._12_4_ = auVar219._12_4_ * auVar40._12_4_ * auVar184._12_4_;
                local_b40._0_4_ = auVar309._0_4_ * auVar219._0_4_;
                local_b40._4_4_ = auVar309._4_4_ * auVar219._4_4_;
                local_b40._8_4_ = auVar309._8_4_ * auVar219._8_4_;
                local_b40._12_4_ = auVar309._12_4_ * auVar219._12_4_;
                if (fVar109 < 0.0) {
                  local_b20._0_4_ = fVar238;
                  local_ac0._0_16_ = auVar227;
                  fVar109 = sqrtf(fVar109);
                  auVar227 = local_ac0._0_16_;
                }
                else {
                  auVar114 = vsqrtss_avx(auVar114,auVar114);
                  fVar109 = auVar114._0_4_;
                  local_b20._0_4_ = fVar238;
                }
                auVar114 = vdpps_avx(_local_ba0,local_b40._0_16_,0x7f);
                fVar238 = ((float)local_b80._0_4_ / fVar109) * ((float)local_b20._0_4_ + 1.0) +
                          auVar39._0_4_ + (float)local_b20._0_4_ * (float)local_b80._0_4_;
                auVar184 = vdpps_avx(auVar345,local_b40._0_16_,0x7f);
                auVar219 = vdpps_avx(_local_ba0,auVar227,0x7f);
                auVar40 = vdpps_avx(_local_a70,local_b40._0_16_,0x7f);
                auVar41 = vdpps_avx(_local_ba0,auVar345,0x7f);
                fVar109 = auVar184._0_4_ + auVar219._0_4_;
                fVar239 = auVar114._0_4_;
                auVar118._0_4_ = fVar239 * fVar239;
                auVar118._4_4_ = auVar114._4_4_ * auVar114._4_4_;
                auVar118._8_4_ = auVar114._8_4_ * auVar114._8_4_;
                auVar118._12_4_ = auVar114._12_4_ * auVar114._12_4_;
                auVar219 = vsubps_avx(auVar222,auVar118);
                local_b40._0_16_ = ZEXT416((uint)fVar109);
                auVar184 = vdpps_avx(_local_ba0,_local_a70,0x7f);
                fVar203 = auVar41._0_4_ - fVar239 * fVar109;
                local_b20._0_16_ = auVar114;
                fVar239 = auVar184._0_4_ - fVar239 * auVar40._0_4_;
                auVar114 = vrsqrtss_avx(auVar219,auVar219);
                fVar240 = auVar219._0_4_;
                fVar109 = auVar114._0_4_;
                fVar109 = fVar109 * 1.5 + fVar240 * -0.5 * fVar109 * fVar109 * fVar109;
                if (fVar240 < 0.0) {
                  local_ac0._0_16_ = auVar40;
                  local_a40._0_4_ = fVar203;
                  local_a60._0_4_ = fVar239;
                  local_860._0_4_ = fVar109;
                  fVar240 = sqrtf(fVar240);
                  fVar109 = (float)local_860._0_4_;
                  fVar203 = (float)local_a40._0_4_;
                  fVar239 = (float)local_a60._0_4_;
                  auVar40 = local_ac0._0_16_;
                }
                else {
                  auVar114 = vsqrtss_avx(auVar219,auVar219);
                  fVar240 = auVar114._0_4_;
                }
                auVar373 = ZEXT3264(local_aa0);
                auVar405 = ZEXT3264(local_b60);
                auVar119 = vpermilps_avx(local_a00._0_16_,0xff);
                auVar41 = vshufps_avx(auVar309,auVar309,0xff);
                fVar203 = fVar203 * fVar109 - auVar41._0_4_;
                auVar253._0_8_ = auVar40._0_8_ ^ 0x8000000080000000;
                auVar253._8_4_ = auVar40._8_4_ ^ 0x80000000;
                auVar253._12_4_ = auVar40._12_4_ ^ 0x80000000;
                auVar277._0_4_ = -fVar203;
                auVar277._4_4_ = 0x80000000;
                auVar277._8_4_ = 0x80000000;
                auVar277._12_4_ = 0x80000000;
                auVar114 = vinsertps_avx(auVar277,ZEXT416((uint)(fVar239 * fVar109)),0x1c);
                auVar219 = vmovsldup_avx(ZEXT416((uint)(local_b40._0_4_ * fVar239 * fVar109 -
                                                       auVar40._0_4_ * fVar203)));
                auVar114 = vdivps_avx(auVar114,auVar219);
                auVar184 = vinsertps_avx(local_b40._0_16_,auVar253,0x10);
                auVar184 = vdivps_avx(auVar184,auVar219);
                auVar219 = vmovsldup_avx(local_b20._0_16_);
                auVar119 = ZEXT416((uint)(fVar240 - auVar119._0_4_));
                auVar40 = vmovsldup_avx(auVar119);
                auVar187._0_4_ = auVar219._0_4_ * auVar114._0_4_ + auVar40._0_4_ * auVar184._0_4_;
                auVar187._4_4_ = auVar219._4_4_ * auVar114._4_4_ + auVar40._4_4_ * auVar184._4_4_;
                auVar187._8_4_ = auVar219._8_4_ * auVar114._8_4_ + auVar40._8_4_ * auVar184._8_4_;
                auVar187._12_4_ =
                     auVar219._12_4_ * auVar114._12_4_ + auVar40._12_4_ * auVar184._12_4_;
                auVar114 = vsubps_avx(auVar307,auVar187);
                auVar344 = ZEXT1664(auVar114);
                auVar188._8_4_ = 0x7fffffff;
                auVar188._0_8_ = 0x7fffffff7fffffff;
                auVar188._12_4_ = 0x7fffffff;
                auVar307 = vandps_avx(local_b20._0_16_,auVar188);
                auVar316 = ZEXT3264(local_a20);
              } while (fVar238 <= auVar307._0_4_);
              auVar228._8_4_ = 0x7fffffff;
              auVar228._0_8_ = 0x7fffffff7fffffff;
              auVar228._12_4_ = 0x7fffffff;
              auVar307 = vandps_avx(auVar119,auVar228);
            } while ((float)local_880._0_4_ * 1.9073486e-06 + auVar39._0_4_ + fVar238 <=
                     auVar307._0_4_);
            fVar238 = auVar114._0_4_ + (float)local_960._0_4_;
            if ((fVar214 <= fVar238) &&
               (fVar109 = *(float *)(ray + k * 4 + 0x100), fVar238 <= fVar109)) {
              auVar307 = vmovshdup_avx(auVar114);
              fVar239 = auVar307._0_4_;
              if ((0.0 <= fVar239) && (fVar239 <= 1.0)) {
                auVar222 = vrsqrtss_avx(auVar222,auVar222);
                fVar203 = auVar222._0_4_;
                pGVar19 = (context->scene->geometries).items[uVar102].ptr;
                if ((pGVar19->mask & *(uint *)(ray + k * 4 + 0x120)) != 0) {
                  auVar222 = ZEXT416((uint)(fVar203 * 1.5 +
                                           fVar302 * -0.5 * fVar203 * fVar203 * fVar203));
                  auVar222 = vshufps_avx(auVar222,auVar222,0);
                  auVar229._0_4_ = auVar222._0_4_ * (float)local_ba0._0_4_;
                  auVar229._4_4_ = auVar222._4_4_ * (float)local_ba0._4_4_;
                  auVar229._8_4_ = auVar222._8_4_ * fStack_b98;
                  auVar229._12_4_ = auVar222._12_4_ * fStack_b94;
                  auVar162._0_4_ = auVar309._0_4_ + auVar41._0_4_ * auVar229._0_4_;
                  auVar162._4_4_ = auVar309._4_4_ + auVar41._4_4_ * auVar229._4_4_;
                  auVar162._8_4_ = auVar309._8_4_ + auVar41._8_4_ * auVar229._8_4_;
                  auVar162._12_4_ = auVar309._12_4_ + auVar41._12_4_ * auVar229._12_4_;
                  auVar222 = vshufps_avx(auVar229,auVar229,0xc9);
                  auVar307 = vshufps_avx(auVar309,auVar309,0xc9);
                  auVar230._0_4_ = auVar307._0_4_ * auVar229._0_4_;
                  auVar230._4_4_ = auVar307._4_4_ * auVar229._4_4_;
                  auVar230._8_4_ = auVar307._8_4_ * auVar229._8_4_;
                  auVar230._12_4_ = auVar307._12_4_ * auVar229._12_4_;
                  auVar254._0_4_ = auVar309._0_4_ * auVar222._0_4_;
                  auVar254._4_4_ = auVar309._4_4_ * auVar222._4_4_;
                  auVar254._8_4_ = auVar309._8_4_ * auVar222._8_4_;
                  auVar254._12_4_ = auVar309._12_4_ * auVar222._12_4_;
                  auVar39 = vsubps_avx(auVar254,auVar230);
                  auVar222 = vshufps_avx(auVar39,auVar39,0xc9);
                  auVar307 = vshufps_avx(auVar162,auVar162,0xc9);
                  auVar255._0_4_ = auVar307._0_4_ * auVar222._0_4_;
                  auVar255._4_4_ = auVar307._4_4_ * auVar222._4_4_;
                  auVar255._8_4_ = auVar307._8_4_ * auVar222._8_4_;
                  auVar255._12_4_ = auVar307._12_4_ * auVar222._12_4_;
                  auVar222 = vshufps_avx(auVar39,auVar39,0xd2);
                  auVar163._0_4_ = auVar162._0_4_ * auVar222._0_4_;
                  auVar163._4_4_ = auVar162._4_4_ * auVar222._4_4_;
                  auVar163._8_4_ = auVar162._8_4_ * auVar222._8_4_;
                  auVar163._12_4_ = auVar162._12_4_ * auVar222._12_4_;
                  auVar222 = vsubps_avx(auVar255,auVar163);
                  if ((context->args->filter == (RTCFilterFunctionN)0x0) &&
                     (pGVar19->intersectionFilterN == (RTCFilterFunctionN)0x0)) {
                    *(float *)(ray + k * 4 + 0x100) = fVar238;
                    uVar104 = vextractps_avx(auVar222,1);
                    *(undefined4 *)(ray + k * 4 + 0x180) = uVar104;
                    uVar104 = vextractps_avx(auVar222,2);
                    *(undefined4 *)(ray + k * 4 + 0x1a0) = uVar104;
                    *(int *)(ray + k * 4 + 0x1c0) = auVar222._0_4_;
                    *(float *)(ray + k * 4 + 0x1e0) = fVar239;
                    *(undefined4 *)(ray + k * 4 + 0x200) = 0;
                    *(int *)(ray + k * 4 + 0x220) = (int)local_940;
                    *(uint *)(ray + k * 4 + 0x240) = uVar102;
                    *(uint *)(ray + k * 4 + 0x260) = context->user->instID[0];
                    *(uint *)(ray + k * 4 + 0x280) = context->user->instPrimID[0];
                  }
                  else {
                    pRVar25 = context->user;
                    auStack_6d0 = vshufps_avx(auVar114,auVar114,0x55);
                    auStack_730 = vshufps_avx(auVar222,auVar222,0x55);
                    auStack_710 = vshufps_avx(auVar222,auVar222,0xaa);
                    auStack_6f0 = vshufps_avx(auVar222,auVar222,0);
                    local_740 = (RTCHitN  [16])auStack_730;
                    local_720 = auStack_710;
                    local_700 = auStack_6f0;
                    local_6e0 = auStack_6d0;
                    local_6c0 = ZEXT832(0) << 0x20;
                    local_6a0 = local_5e0._0_8_;
                    uStack_698 = local_5e0._8_8_;
                    uStack_690 = local_5e0._16_8_;
                    uStack_688 = local_5e0._24_8_;
                    local_680 = local_5c0;
                    auVar189 = vcmpps_avx(local_5c0,local_5c0,0xf);
                    local_ae8[1] = auVar189;
                    *local_ae8 = auVar189;
                    local_660 = pRVar25->instID[0];
                    uStack_65c = local_660;
                    uStack_658 = local_660;
                    uStack_654 = local_660;
                    uStack_650 = local_660;
                    uStack_64c = local_660;
                    uStack_648 = local_660;
                    uStack_644 = local_660;
                    local_640 = pRVar25->instPrimID[0];
                    uStack_63c = local_640;
                    uStack_638 = local_640;
                    uStack_634 = local_640;
                    uStack_630 = local_640;
                    uStack_62c = local_640;
                    uStack_628 = local_640;
                    uStack_624 = local_640;
                    *(float *)(ray + k * 4 + 0x100) = fVar238;
                    local_c00 = *local_af0;
                    local_bf0 = *local_af8;
                    local_bd0.valid = (int *)local_c00;
                    local_bd0.geometryUserPtr = pGVar19->userPtr;
                    local_bd0.context = context->user;
                    local_bd0.hit = local_740;
                    local_bd0.N = 8;
                    local_bd0.ray = (RTCRayN *)ray;
                    if (pGVar19->intersectionFilterN != (RTCFilterFunctionN)0x0) {
                      (*pGVar19->intersectionFilterN)(&local_bd0);
                      auVar316 = ZEXT3264(local_a20);
                      auVar405 = ZEXT3264(local_b60);
                      auVar373 = ZEXT3264(local_aa0);
                    }
                    auVar222 = vpcmpeqd_avx(local_c00,ZEXT816(0) << 0x40);
                    auVar307 = vpcmpeqd_avx(local_bf0,ZEXT816(0) << 0x40);
                    auVar198._16_16_ = auVar307;
                    auVar198._0_16_ = auVar222;
                    auVar189 = _DAT_01f7b020 & ~auVar198;
                    if ((((((((auVar189 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                             (auVar189 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                            (auVar189 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                           SUB321(auVar189 >> 0x7f,0) != '\0') ||
                          (auVar189 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                         SUB321(auVar189 >> 0xbf,0) != '\0') ||
                        (auVar189 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                        auVar189[0x1f] < '\0') {
                      p_Var24 = context->args->filter;
                      if ((p_Var24 != (RTCFilterFunctionN)0x0) &&
                         (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                           RTC_RAY_QUERY_FLAG_INCOHERENT ||
                          (((pGVar19->field_8).field_0x2 & 0x40) != 0)))) {
                        (*p_Var24)(&local_bd0);
                        auVar316 = ZEXT3264(local_a20);
                        auVar405 = ZEXT3264(local_b60);
                        auVar373 = ZEXT3264(local_aa0);
                      }
                      auVar222 = vpcmpeqd_avx(local_c00,ZEXT816(0) << 0x40);
                      auVar307 = vpcmpeqd_avx(local_bf0,ZEXT816(0) << 0x40);
                      auVar137._16_16_ = auVar307;
                      auVar137._0_16_ = auVar222;
                      auVar189 = _DAT_01f7b020 & ~auVar137;
                      if ((((((((auVar189 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0
                               || (auVar189 >> 0x3f & (undefined1  [32])0x1) !=
                                  (undefined1  [32])0x0) ||
                              (auVar189 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0)
                             || SUB321(auVar189 >> 0x7f,0) != '\0') ||
                            (auVar189 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                           SUB321(auVar189 >> 0xbf,0) != '\0') ||
                          (auVar189 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                          auVar189[0x1f] < '\0') {
                        auVar138._0_8_ = auVar222._0_8_ ^ 0xffffffffffffffff;
                        auVar138._8_4_ = auVar222._8_4_ ^ 0xffffffff;
                        auVar138._12_4_ = auVar222._12_4_ ^ 0xffffffff;
                        auVar138._16_4_ = auVar307._0_4_ ^ 0xffffffff;
                        auVar138._20_4_ = auVar307._4_4_ ^ 0xffffffff;
                        auVar138._24_4_ = auVar307._8_4_ ^ 0xffffffff;
                        auVar138._28_4_ = auVar307._12_4_ ^ 0xffffffff;
                        auVar189 = vmaskmovps_avx(auVar138,*(undefined1 (*) [32])local_bd0.hit);
                        *(undefined1 (*) [32])(local_bd0.ray + 0x180) = auVar189;
                        auVar189 = vmaskmovps_avx(auVar138,*(undefined1 (*) [32])
                                                            (local_bd0.hit + 0x20));
                        *(undefined1 (*) [32])(local_bd0.ray + 0x1a0) = auVar189;
                        auVar189 = vmaskmovps_avx(auVar138,*(undefined1 (*) [32])
                                                            (local_bd0.hit + 0x40));
                        *(undefined1 (*) [32])(local_bd0.ray + 0x1c0) = auVar189;
                        auVar189 = vmaskmovps_avx(auVar138,*(undefined1 (*) [32])
                                                            (local_bd0.hit + 0x60));
                        *(undefined1 (*) [32])(local_bd0.ray + 0x1e0) = auVar189;
                        auVar189 = vmaskmovps_avx(auVar138,*(undefined1 (*) [32])
                                                            (local_bd0.hit + 0x80));
                        *(undefined1 (*) [32])(local_bd0.ray + 0x200) = auVar189;
                        auVar189 = vmaskmovps_avx(auVar138,*(undefined1 (*) [32])
                                                            (local_bd0.hit + 0xa0));
                        *(undefined1 (*) [32])(local_bd0.ray + 0x220) = auVar189;
                        auVar189 = vmaskmovps_avx(auVar138,*(undefined1 (*) [32])
                                                            (local_bd0.hit + 0xc0));
                        *(undefined1 (*) [32])(local_bd0.ray + 0x240) = auVar189;
                        auVar189 = vmaskmovps_avx(auVar138,*(undefined1 (*) [32])
                                                            (local_bd0.hit + 0xe0));
                        *(undefined1 (*) [32])(local_bd0.ray + 0x260) = auVar189;
                        auVar189 = vmaskmovps_avx(auVar138,*(undefined1 (*) [32])
                                                            (local_bd0.hit + 0x100));
                        *(undefined1 (*) [32])(local_bd0.ray + 0x280) = auVar189;
                        goto LAB_00b09345;
                      }
                    }
                    *(float *)(ray + k * 4 + 0x100) = fVar109;
                  }
                }
              }
            }
LAB_00b09345:
            uVar104 = *(undefined4 *)(ray + k * 4 + 0x100);
            auVar354._4_4_ = uVar104;
            auVar354._0_4_ = uVar104;
            auVar354._8_4_ = uVar104;
            auVar354._12_4_ = uVar104;
            auVar354._16_4_ = uVar104;
            auVar354._20_4_ = uVar104;
            auVar354._24_4_ = uVar104;
            auVar354._28_4_ = uVar104;
            auVar344 = ZEXT3264(auVar354);
            auVar189 = vcmpps_avx(_local_8a0,auVar354,2);
            auVar189 = vandps_avx(auVar189,local_500);
          }
          auVar189 = vandps_avx(local_7a0,local_780);
          auVar130 = vandps_avx(local_900,_local_8c0);
          auVar199._0_4_ = (float)local_920._0_4_ + local_4c0._0_4_;
          auVar199._4_4_ = (float)local_920._4_4_ + local_4c0._4_4_;
          auVar199._8_4_ = fStack_918 + local_4c0._8_4_;
          auVar199._12_4_ = fStack_914 + local_4c0._12_4_;
          auVar199._16_4_ = fStack_910 + local_4c0._16_4_;
          auVar199._20_4_ = fStack_90c + local_4c0._20_4_;
          auVar199._24_4_ = fStack_908 + local_4c0._24_4_;
          auVar199._28_4_ = fStack_904 + local_4c0._28_4_;
          auVar222 = vshufps_avx(auVar344._0_16_,auVar344._0_16_,0);
          auVar265._16_16_ = auVar222;
          auVar265._0_16_ = auVar222;
          auVar26 = vcmpps_avx(auVar199,auVar265,2);
          auVar189 = vandps_avx(auVar26,auVar189);
          auVar288._0_4_ = (float)local_920._0_4_ + local_480._0_4_;
          auVar288._4_4_ = (float)local_920._4_4_ + local_480._4_4_;
          auVar288._8_4_ = fStack_918 + local_480._8_4_;
          auVar288._12_4_ = fStack_914 + local_480._12_4_;
          auVar288._16_4_ = fStack_910 + local_480._16_4_;
          auVar288._20_4_ = fStack_90c + local_480._20_4_;
          auVar288._24_4_ = fStack_908 + local_480._24_4_;
          auVar288._28_4_ = fStack_904 + local_480._28_4_;
          auVar26 = vcmpps_avx(auVar288,auVar265,2);
          auVar130 = vandps_avx(auVar26,auVar130);
          auVar130 = vorps_avx(auVar189,auVar130);
          if ((((((((auVar130 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                   (auVar130 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                  (auVar130 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                 SUB321(auVar130 >> 0x7f,0) != '\0') ||
                (auVar130 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
               SUB321(auVar130 >> 0xbf,0) != '\0') ||
              (auVar130 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
              auVar130[0x1f] < '\0') {
            *(undefined1 (*) [32])(auStack_180 + uVar98 * 0x60) = auVar130;
            auVar189 = vblendvps_avx(_local_480,_local_4c0,auVar189);
            *(undefined1 (*) [32])(auStack_160 + uVar98 * 0x60) = auVar189;
            uVar99 = vmovlps_avx(local_750);
            (&uStack_140)[uVar98 * 0xc] = uVar99;
            auStack_138[uVar98 * 0x18] = local_d24 + 1;
            uVar98 = (ulong)((int)uVar98 + 1);
          }
          auVar344 = ZEXT3264(auVar405._0_32_);
          auVar405 = ZEXT3264(local_8e0);
          fVar181 = (float)local_920._0_4_;
          fVar202 = (float)local_920._4_4_;
          fVar205 = fStack_918;
          fVar207 = fStack_914;
          fVar209 = fStack_910;
          fVar211 = fStack_90c;
          fVar213 = fStack_908;
          fVar305 = fStack_904;
          goto LAB_00b07d62;
        }
      }
      auVar405 = ZEXT3264(local_8e0);
      auVar373 = ZEXT3264(local_aa0);
      auVar344 = ZEXT3264(local_b60);
      auVar316 = ZEXT3264(local_a20);
    }
LAB_00b07d62:
    while( true ) {
      auVar311 = local_580;
      uVar105 = (uint)uVar98;
      if (uVar105 == 0) {
        uVar104 = *(undefined4 *)(ray + k * 4 + 0x100);
        auVar139._4_4_ = uVar104;
        auVar139._0_4_ = uVar104;
        auVar139._8_4_ = uVar104;
        auVar139._12_4_ = uVar104;
        auVar139._16_4_ = uVar104;
        auVar139._20_4_ = uVar104;
        auVar139._24_4_ = uVar104;
        auVar139._28_4_ = uVar104;
        auVar189 = vcmpps_avx(local_3e0,auVar139,2);
        uVar102 = vmovmskps_avx(auVar189);
        uVar97 = (ulong)((uint)uVar97 - 1 & (uint)uVar97 & uVar102);
        goto LAB_00b06b92;
      }
      uVar98 = (ulong)(uVar105 - 1);
      lVar101 = uVar98 * 0x60;
      auVar189 = *(undefined1 (*) [32])(auStack_160 + lVar101);
      auVar129._0_4_ = fVar181 + auVar189._0_4_;
      auVar129._4_4_ = fVar202 + auVar189._4_4_;
      auVar129._8_4_ = fVar205 + auVar189._8_4_;
      auVar129._12_4_ = fVar207 + auVar189._12_4_;
      auVar129._16_4_ = fVar209 + auVar189._16_4_;
      auVar129._20_4_ = fVar211 + auVar189._20_4_;
      auVar129._24_4_ = fVar213 + auVar189._24_4_;
      auVar129._28_4_ = fVar305 + auVar189._28_4_;
      uVar104 = *(undefined4 *)(ray + k * 4 + 0x100);
      auVar236._4_4_ = uVar104;
      auVar236._0_4_ = uVar104;
      auVar236._8_4_ = uVar104;
      auVar236._12_4_ = uVar104;
      auVar236._16_4_ = uVar104;
      auVar236._20_4_ = uVar104;
      auVar236._24_4_ = uVar104;
      auVar236._28_4_ = uVar104;
      auVar26 = vcmpps_avx(auVar129,auVar236,2);
      auVar130 = vandps_avx(auVar26,*(undefined1 (*) [32])(auStack_180 + lVar101));
      _local_740 = auVar130;
      auVar26 = *(undefined1 (*) [32])(auStack_180 + lVar101) & auVar26;
      if ((((((((auVar26 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
               (auVar26 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
              (auVar26 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
             SUB321(auVar26 >> 0x7f,0) != '\0') ||
            (auVar26 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
           SUB321(auVar26 >> 0xbf,0) != '\0') ||
          (auVar26 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
          auVar26[0x1f] < '\0') break;
      uVar98 = (ulong)(uVar105 - 1);
    }
    auVar195._8_4_ = 0x7f800000;
    auVar195._0_8_ = 0x7f8000007f800000;
    auVar195._12_4_ = 0x7f800000;
    auVar195._16_4_ = 0x7f800000;
    auVar195._20_4_ = 0x7f800000;
    auVar195._24_4_ = 0x7f800000;
    auVar195._28_4_ = 0x7f800000;
    auVar189 = vblendvps_avx(auVar195,auVar189,auVar130);
    auVar26 = vshufps_avx(auVar189,auVar189,0xb1);
    auVar26 = vminps_avx(auVar189,auVar26);
    auVar27 = vshufpd_avx(auVar26,auVar26,5);
    auVar26 = vminps_avx(auVar26,auVar27);
    auVar27 = vperm2f128_avx(auVar26,auVar26,1);
    auVar26 = vminps_avx(auVar26,auVar27);
    auVar189 = vcmpps_avx(auVar189,auVar26,0);
    auVar26 = auVar130 & auVar189;
    if ((((((((auVar26 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
             (auVar26 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
            (auVar26 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
           SUB321(auVar26 >> 0x7f,0) != '\0') ||
          (auVar26 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
         SUB321(auVar26 >> 0xbf,0) != '\0') ||
        (auVar26 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) || auVar26[0x1f] < '\0')
    {
      auVar130 = vandps_avx(auVar189,auVar130);
    }
    auVar153._8_8_ = 0;
    auVar153._0_8_ = (&uStack_140)[uVar98 * 0xc];
    local_d24 = auStack_138[uVar98 * 0x18];
    uVar100 = vmovmskps_avx(auVar130);
    uVar96 = 0;
    if (uVar100 != 0) {
      for (; (uVar100 >> uVar96 & 1) == 0; uVar96 = uVar96 + 1) {
      }
    }
    *(undefined4 *)(local_740 + (ulong)uVar96 * 4) = 0;
    *(undefined1 (*) [32])(auStack_180 + lVar101) = _local_740;
    uVar100 = uVar105 - 1;
    if ((((((((_local_740 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
             (_local_740 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
            (_local_740 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
           SUB321(_local_740 >> 0x7f,0) != '\0') ||
          (_local_740 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
         SUB321(_local_740 >> 0xbf,0) != '\0') ||
        (_local_740 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
        local_740[0x1f] < '\0') {
      uVar100 = uVar105;
    }
    auVar222 = vshufps_avx(auVar153,auVar153,0);
    auVar307 = vshufps_avx(auVar153,auVar153,0x55);
    auVar307 = vsubps_avx(auVar307,auVar222);
    local_4c0._4_4_ = auVar222._4_4_ + auVar307._4_4_ * 0.14285715;
    local_4c0._0_4_ = auVar222._0_4_ + auVar307._0_4_ * 0.0;
    fStack_4b8 = auVar222._8_4_ + auVar307._8_4_ * 0.2857143;
    fStack_4b4 = auVar222._12_4_ + auVar307._12_4_ * 0.42857146;
    fStack_4b0 = auVar222._0_4_ + auVar307._0_4_ * 0.5714286;
    fStack_4ac = auVar222._4_4_ + auVar307._4_4_ * 0.71428573;
    fStack_4a8 = auVar222._8_4_ + auVar307._8_4_ * 0.8571429;
    fStack_4a4 = auVar222._12_4_ + auVar307._12_4_;
    local_750._8_8_ = 0;
    local_750._0_8_ = *(ulong *)(local_4c0 + (ulong)uVar96 * 4);
    uVar98 = (ulong)uVar100;
  } while( true );
}

Assistant:

static __forceinline void intersect_h(Precalculations& pre, RayHitK<K>& ray, const size_t k, RayQueryContext* context, const Primitive& prim)
      {
        
        vfloat<M> tNear;
        vbool<M> valid = intersect(ray,k,prim,tNear);

        const size_t N = prim.N;
        size_t mask = movemask(valid);
        while (mask)
        {
          const size_t i = bscf(mask);
          STAT3(normal.trav_prims,1,1,1);
          const unsigned int geomID = prim.geomID(N);
          const unsigned int primID = prim.primID(N)[i];
          const CurveGeometry* geom = context->scene->get<CurveGeometry>(geomID);
          Vec3ff p0,t0,p1,t1; geom->gather_hermite(p0,t0,p1,t1,geom->curve(primID),ray.time()[k]);
          Intersector().intersect(pre,ray,k,context,geom,primID,p0,t0,p1,t1,Epilog(ray,k,context,geomID,primID));
          mask &= movemask(tNear <= vfloat<M>(ray.tfar[k]));
        }
      }